

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  uint uVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  long lVar6;
  long lVar7;
  RTCRayQueryContext *pRVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined8 uVar25;
  ulong uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  int iVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [60];
  undefined1 auVar61 [60];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  byte bVar84;
  byte bVar85;
  byte bVar86;
  uint uVar87;
  byte bVar88;
  byte bVar89;
  ulong uVar90;
  int iVar91;
  long lVar92;
  byte bVar93;
  long lVar94;
  ulong uVar95;
  uint uVar96;
  uint uVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  uint uVar165;
  uint uVar169;
  undefined1 auVar153 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  uint uVar163;
  uint uVar164;
  uint uVar166;
  uint uVar167;
  uint uVar168;
  undefined1 in_ZmmResult [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  float fVar170;
  float fVar191;
  vint4 bi_2;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar181 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar192;
  vint4 bi_1;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar211 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar210 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  vint4 bi;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar234;
  float fVar252;
  float fVar253;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar254;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar265;
  float fVar266;
  vint4 ai_2;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar267;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar268;
  undefined1 auVar264 [32];
  vint4 ai_1;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  vint4 ai;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar284 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  float fVar287;
  float fVar291;
  float fVar292;
  undefined1 auVar288 [16];
  float fVar293;
  float fVar294;
  undefined1 auVar289 [64];
  undefined1 auVar295 [64];
  undefined1 auVar296 [64];
  undefined1 auVar297 [64];
  float s;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b90;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 (*local_a28) [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [16];
  Primitive *local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [32];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar154 [32];
  undefined1 auVar290 [64];
  
  PVar2 = prim[1];
  uVar95 = (ulong)(byte)PVar2;
  lVar94 = uVar95 * 0x25;
  fVar170 = *(float *)(prim + lVar94 + 0x12);
  auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar102 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar101 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar102 = vsubps_avx(auVar102,*(undefined1 (*) [16])(prim + lVar94 + 6));
  auVar235._0_4_ = fVar170 * auVar102._0_4_;
  auVar235._4_4_ = fVar170 * auVar102._4_4_;
  auVar235._8_4_ = fVar170 * auVar102._8_4_;
  auVar235._12_4_ = fVar170 * auVar102._12_4_;
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 4 + 6)));
  auVar171._0_4_ = fVar170 * auVar101._0_4_;
  auVar171._4_4_ = fVar170 * auVar101._4_4_;
  auVar171._8_4_ = fVar170 * auVar101._8_4_;
  auVar171._12_4_ = fVar170 * auVar101._12_4_;
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 5 + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 6 + 6)));
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0xf + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar95 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0x1a + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0x1b + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0x1c + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar269._4_4_ = auVar171._0_4_;
  auVar269._0_4_ = auVar171._0_4_;
  auVar269._8_4_ = auVar171._0_4_;
  auVar269._12_4_ = auVar171._0_4_;
  auVar109 = vshufps_avx(auVar171,auVar171,0x55);
  auVar110 = vshufps_avx(auVar171,auVar171,0xaa);
  fVar170 = auVar110._0_4_;
  auVar216._0_4_ = fVar170 * auVar104._0_4_;
  fVar191 = auVar110._4_4_;
  auVar216._4_4_ = fVar191 * auVar104._4_4_;
  fVar234 = auVar110._8_4_;
  auVar216._8_4_ = fVar234 * auVar104._8_4_;
  fVar252 = auVar110._12_4_;
  auVar216._12_4_ = fVar252 * auVar104._12_4_;
  auVar193._0_4_ = auVar106._0_4_ * fVar170;
  auVar193._4_4_ = auVar106._4_4_ * fVar191;
  auVar193._8_4_ = auVar106._8_4_ * fVar234;
  auVar193._12_4_ = auVar106._12_4_ * fVar252;
  auVar172._0_4_ = auVar108._0_4_ * fVar170;
  auVar172._4_4_ = auVar108._4_4_ * fVar191;
  auVar172._8_4_ = auVar108._8_4_ * fVar234;
  auVar172._12_4_ = auVar108._12_4_ * fVar252;
  auVar110 = vfmadd231ps_fma(auVar216,auVar109,auVar101);
  auVar31 = vfmadd231ps_fma(auVar193,auVar109,auVar24);
  auVar109 = vfmadd231ps_fma(auVar172,auVar107,auVar109);
  auVar32 = vfmadd231ps_fma(auVar110,auVar269,auVar102);
  auVar31 = vfmadd231ps_fma(auVar31,auVar269,auVar105);
  auVar111 = vfmadd231ps_fma(auVar109,auVar103,auVar269);
  auVar302._4_4_ = auVar235._0_4_;
  auVar302._0_4_ = auVar235._0_4_;
  auVar302._8_4_ = auVar235._0_4_;
  auVar302._12_4_ = auVar235._0_4_;
  auVar109 = vshufps_avx(auVar235,auVar235,0x55);
  auVar110 = vshufps_avx(auVar235,auVar235,0xaa);
  fVar170 = auVar110._0_4_;
  auVar270._0_4_ = fVar170 * auVar104._0_4_;
  fVar191 = auVar110._4_4_;
  auVar270._4_4_ = fVar191 * auVar104._4_4_;
  fVar234 = auVar110._8_4_;
  auVar270._8_4_ = fVar234 * auVar104._8_4_;
  fVar252 = auVar110._12_4_;
  auVar270._12_4_ = fVar252 * auVar104._12_4_;
  auVar259._0_4_ = auVar106._0_4_ * fVar170;
  auVar259._4_4_ = auVar106._4_4_ * fVar191;
  auVar259._8_4_ = auVar106._8_4_ * fVar234;
  auVar259._12_4_ = auVar106._12_4_ * fVar252;
  auVar236._0_4_ = auVar108._0_4_ * fVar170;
  auVar236._4_4_ = auVar108._4_4_ * fVar191;
  auVar236._8_4_ = auVar108._8_4_ * fVar234;
  auVar236._12_4_ = auVar108._12_4_ * fVar252;
  auVar101 = vfmadd231ps_fma(auVar270,auVar109,auVar101);
  auVar104 = vfmadd231ps_fma(auVar259,auVar109,auVar24);
  auVar24 = vfmadd231ps_fma(auVar236,auVar109,auVar107);
  auVar33 = vfmadd231ps_fma(auVar101,auVar302,auVar102);
  auVar171 = vfmadd231ps_fma(auVar104,auVar302,auVar105);
  auVar288._8_4_ = 0x7fffffff;
  auVar288._0_8_ = 0x7fffffff7fffffff;
  auVar288._12_4_ = 0x7fffffff;
  auVar172 = vfmadd231ps_fma(auVar24,auVar302,auVar103);
  auVar102 = vandps_avx(auVar288,auVar32);
  auVar278._8_4_ = 0x219392ef;
  auVar278._0_8_ = 0x219392ef219392ef;
  auVar278._12_4_ = 0x219392ef;
  uVar90 = vcmpps_avx512vl(auVar102,auVar278,1);
  auVar159._16_48_ = in_ZmmResult._16_48_;
  bVar10 = (bool)((byte)uVar90 & 1);
  auVar98._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar32._0_4_;
  bVar10 = (bool)((byte)(uVar90 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar32._4_4_;
  bVar10 = (bool)((byte)(uVar90 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar32._8_4_;
  bVar10 = (bool)((byte)(uVar90 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar32._12_4_;
  auVar102 = vandps_avx(auVar288,auVar31);
  uVar90 = vcmpps_avx512vl(auVar102,auVar278,1);
  bVar10 = (bool)((byte)uVar90 & 1);
  auVar99._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar31._0_4_;
  bVar10 = (bool)((byte)(uVar90 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar31._4_4_;
  bVar10 = (bool)((byte)(uVar90 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar31._8_4_;
  bVar10 = (bool)((byte)(uVar90 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar31._12_4_;
  auVar102 = vandps_avx(auVar288,auVar111);
  uVar90 = vcmpps_avx512vl(auVar102,auVar278,1);
  bVar10 = (bool)((byte)uVar90 & 1);
  auVar100._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar111._0_4_;
  bVar10 = (bool)((byte)(uVar90 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar111._4_4_;
  bVar10 = (bool)((byte)(uVar90 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar111._8_4_;
  bVar10 = (bool)((byte)(uVar90 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar111._12_4_;
  auVar101 = vrcp14ps_avx512vl(auVar98);
  auVar279._8_4_ = 0x3f800000;
  auVar279._0_8_ = 0x3f8000003f800000;
  auVar279._12_4_ = 0x3f800000;
  auVar102 = vfnmadd213ps_fma(auVar98,auVar101,auVar279);
  auVar32 = vfmadd132ps_fma(auVar102,auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar99);
  auVar102 = vfnmadd213ps_fma(auVar99,auVar101,auVar279);
  auVar111 = vfmadd132ps_fma(auVar102,auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar100);
  auVar102 = vfnmadd213ps_fma(auVar100,auVar101,auVar279);
  auVar30 = vfmadd132ps_fma(auVar102,auVar101,auVar101);
  fVar170 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar94 + 0x16)) *
            *(float *)(prim + lVar94 + 0x1a);
  auVar274._4_4_ = fVar170;
  auVar274._0_4_ = fVar170;
  auVar274._8_4_ = fVar170;
  auVar274._12_4_ = fVar170;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar95 * 7 + 6);
  auVar102 = vpmovsxwd_avx(auVar102);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar95 * 0xb + 6);
  auVar101 = vpmovsxwd_avx(auVar101);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar105 = vsubps_avx(auVar101,auVar102);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar95 * 9 + 6);
  auVar101 = vpmovsxwd_avx(auVar104);
  auVar104 = vfmadd213ps_fma(auVar105,auVar274,auVar102);
  auVar102 = vcvtdq2ps_avx(auVar101);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar95 * 0xd + 6);
  auVar101 = vpmovsxwd_avx(auVar105);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar102);
  auVar105 = vfmadd213ps_fma(auVar101,auVar274,auVar102);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar95 * 0x12 + 6);
  auVar102 = vpmovsxwd_avx(auVar24);
  auVar102 = vcvtdq2ps_avx(auVar102);
  uVar90 = (ulong)(uint)((int)(uVar95 * 5) << 2);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar95 * 2 + uVar90 + 6);
  auVar101 = vpmovsxwd_avx(auVar106);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar102);
  auVar24 = vfmadd213ps_fma(auVar101,auVar274,auVar102);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar90 + 6);
  auVar102 = vpmovsxwd_avx(auVar103);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar95 * 0x18 + 6);
  auVar101 = vpmovsxwd_avx(auVar107);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar102);
  auVar106 = vfmadd213ps_fma(auVar101,auVar274,auVar102);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar95 * 0x1d + 6);
  auVar102 = vpmovsxwd_avx(auVar108);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar95 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar101 = vpmovsxwd_avx(auVar109);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar102);
  auVar103 = vfmadd213ps_fma(auVar101,auVar274,auVar102);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar95) + 6);
  auVar102 = vpmovsxwd_avx(auVar110);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar95 * 0x23 + 6);
  auVar101 = vpmovsxwd_avx(auVar31);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar102);
  auVar101 = vfmadd213ps_fma(auVar101,auVar274,auVar102);
  auVar102 = vsubps_avx(auVar104,auVar33);
  auVar275._0_4_ = auVar32._0_4_ * auVar102._0_4_;
  auVar275._4_4_ = auVar32._4_4_ * auVar102._4_4_;
  auVar275._8_4_ = auVar32._8_4_ * auVar102._8_4_;
  auVar275._12_4_ = auVar32._12_4_ * auVar102._12_4_;
  auVar102 = vsubps_avx(auVar105,auVar33);
  auVar217._0_4_ = auVar32._0_4_ * auVar102._0_4_;
  auVar217._4_4_ = auVar32._4_4_ * auVar102._4_4_;
  auVar217._8_4_ = auVar32._8_4_ * auVar102._8_4_;
  auVar217._12_4_ = auVar32._12_4_ * auVar102._12_4_;
  auVar102 = vsubps_avx(auVar24,auVar171);
  auVar271._0_4_ = auVar111._0_4_ * auVar102._0_4_;
  auVar271._4_4_ = auVar111._4_4_ * auVar102._4_4_;
  auVar271._8_4_ = auVar111._8_4_ * auVar102._8_4_;
  auVar271._12_4_ = auVar111._12_4_ * auVar102._12_4_;
  auVar102 = vsubps_avx(auVar106,auVar171);
  auVar194._0_4_ = auVar111._0_4_ * auVar102._0_4_;
  auVar194._4_4_ = auVar111._4_4_ * auVar102._4_4_;
  auVar194._8_4_ = auVar111._8_4_ * auVar102._8_4_;
  auVar194._12_4_ = auVar111._12_4_ * auVar102._12_4_;
  auVar102 = vsubps_avx(auVar103,auVar172);
  auVar260._0_4_ = auVar30._0_4_ * auVar102._0_4_;
  auVar260._4_4_ = auVar30._4_4_ * auVar102._4_4_;
  auVar260._8_4_ = auVar30._8_4_ * auVar102._8_4_;
  auVar260._12_4_ = auVar30._12_4_ * auVar102._12_4_;
  auVar102 = vsubps_avx(auVar101,auVar172);
  auVar173._0_4_ = auVar30._0_4_ * auVar102._0_4_;
  auVar173._4_4_ = auVar30._4_4_ * auVar102._4_4_;
  auVar173._8_4_ = auVar30._8_4_ * auVar102._8_4_;
  auVar173._12_4_ = auVar30._12_4_ * auVar102._12_4_;
  auVar102 = vpminsd_avx(auVar275,auVar217);
  auVar101 = vpminsd_avx(auVar271,auVar194);
  auVar102 = vmaxps_avx(auVar102,auVar101);
  auVar101 = vpminsd_avx(auVar260,auVar173);
  uVar192 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar32._4_4_ = uVar192;
  auVar32._0_4_ = uVar192;
  auVar32._8_4_ = uVar192;
  auVar32._12_4_ = uVar192;
  auVar101 = vmaxps_avx512vl(auVar101,auVar32);
  auVar102 = vmaxps_avx(auVar102,auVar101);
  auVar111._8_4_ = 0x3f7ffffa;
  auVar111._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar111._12_4_ = 0x3f7ffffa;
  local_700 = vmulps_avx512vl(auVar102,auVar111);
  auVar102 = vpmaxsd_avx(auVar275,auVar217);
  auVar101 = vpmaxsd_avx(auVar271,auVar194);
  auVar102 = vminps_avx(auVar102,auVar101);
  auVar101 = vpmaxsd_avx(auVar260,auVar173);
  uVar192 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar30._4_4_ = uVar192;
  auVar30._0_4_ = uVar192;
  auVar30._8_4_ = uVar192;
  auVar30._12_4_ = uVar192;
  auVar101 = vminps_avx512vl(auVar101,auVar30);
  auVar102 = vminps_avx(auVar102,auVar101);
  auVar33._8_4_ = 0x3f800003;
  auVar33._0_8_ = 0x3f8000033f800003;
  auVar33._12_4_ = 0x3f800003;
  auVar102 = vmulps_avx512vl(auVar102,auVar33);
  auVar159._0_16_ = vpbroadcastd_avx512vl();
  uVar25 = vcmpps_avx512vl(local_700,auVar102,2);
  local_8c8 = vpcmpgtd_avx512vl(auVar159._0_16_,_DAT_01f7fcf0);
  local_8c8 = ((byte)uVar25 & 0xf) & local_8c8;
  if ((char)local_8c8 == '\0') {
    return;
  }
  local_a28 = (undefined1 (*) [32])local_240;
  auVar190 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar190);
  local_8d0 = prim;
LAB_01c1b606:
  lVar94 = 0;
  for (uVar90 = local_8c8; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
    lVar94 = lVar94 + 1;
  }
  uVar87 = *(uint *)(local_8d0 + 2);
  uVar3 = *(uint *)(local_8d0 + lVar94 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar87].ptr;
  uVar90 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)uVar3 *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar170 = (pGVar4->time_range).lower;
  fVar170 = pGVar4->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar170) / ((pGVar4->time_range).upper - fVar170));
  auVar102 = vroundss_avx(ZEXT416((uint)fVar170),ZEXT416((uint)fVar170),9);
  auVar102 = vminss_avx(auVar102,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar102 = vmaxss_avx(ZEXT816(0) << 0x20,auVar102);
  fVar170 = fVar170 - auVar102._0_4_;
  _Var5 = pGVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar92 = (long)(int)auVar102._0_4_ * 0x38;
  lVar94 = *(long *)(_Var5 + 0x10 + lVar92);
  lVar6 = *(long *)(_Var5 + 0x38 + lVar92);
  lVar7 = *(long *)(_Var5 + 0x48 + lVar92);
  pfVar1 = (float *)(lVar6 + uVar90 * lVar7);
  auVar218._0_4_ = fVar170 * *pfVar1;
  auVar218._4_4_ = fVar170 * pfVar1[1];
  auVar218._8_4_ = fVar170 * pfVar1[2];
  auVar218._12_4_ = fVar170 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar90 + 1) * lVar7);
  auVar237._0_4_ = fVar170 * *pfVar1;
  auVar237._4_4_ = fVar170 * pfVar1[1];
  auVar237._8_4_ = fVar170 * pfVar1[2];
  auVar237._12_4_ = fVar170 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar90 + 2) * lVar7);
  auVar261._0_4_ = fVar170 * *pfVar1;
  auVar261._4_4_ = fVar170 * pfVar1[1];
  auVar261._8_4_ = fVar170 * pfVar1[2];
  auVar261._12_4_ = fVar170 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + lVar7 * (uVar90 + 3));
  auVar195._0_4_ = fVar170 * *pfVar1;
  auVar195._4_4_ = fVar170 * pfVar1[1];
  auVar195._8_4_ = fVar170 * pfVar1[2];
  auVar195._12_4_ = fVar170 * pfVar1[3];
  lVar6 = *(long *)(_Var5 + lVar92);
  fVar170 = 1.0 - fVar170;
  auVar174._4_4_ = fVar170;
  auVar174._0_4_ = fVar170;
  auVar174._8_4_ = fVar170;
  auVar174._12_4_ = fVar170;
  auVar104 = vfmadd231ps_fma(auVar218,auVar174,*(undefined1 (*) [16])(lVar6 + lVar94 * uVar90));
  auVar105 = vfmadd231ps_fma(auVar237,auVar174,*(undefined1 (*) [16])(lVar6 + lVar94 * (uVar90 + 1))
                            );
  auVar24 = vfmadd231ps_fma(auVar261,auVar174,*(undefined1 (*) [16])(lVar6 + lVar94 * (uVar90 + 2)))
  ;
  auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x1c);
  auVar101 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar192 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar301._4_4_ = uVar192;
  auVar301._0_4_ = uVar192;
  auVar301._8_4_ = uVar192;
  auVar301._12_4_ = uVar192;
  fStack_7d0 = (float)uVar192;
  _local_7e0 = auVar301;
  fStack_7cc = (float)uVar192;
  fStack_7c8 = (float)uVar192;
  register0x0000155c = uVar192;
  uVar192 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar303._4_4_ = uVar192;
  auVar303._0_4_ = uVar192;
  auVar303._8_4_ = uVar192;
  auVar303._12_4_ = uVar192;
  local_800._16_4_ = uVar192;
  local_800._0_16_ = auVar303;
  local_800._20_4_ = uVar192;
  local_800._24_4_ = uVar192;
  local_800._28_4_ = uVar192;
  auVar102 = vunpcklps_avx(auVar301,auVar303);
  auVar190._32_32_ = auVar159._32_32_;
  auVar190._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar107 = auVar190._0_16_;
  local_9d0 = vinsertps_avx512f(auVar102,auVar107,0x28);
  auVar295 = ZEXT1664(local_9d0);
  fVar170 = *(float *)(ray + k * 4 + 0xc0);
  auVar297 = ZEXT464((uint)fVar170);
  auVar276._0_4_ = auVar104._0_4_ + auVar105._0_4_;
  auVar276._4_4_ = auVar104._4_4_ + auVar105._4_4_;
  auVar276._8_4_ = auVar104._8_4_ + auVar105._8_4_;
  auVar276._12_4_ = auVar104._12_4_ + auVar105._12_4_;
  auVar34._8_4_ = 0x3f000000;
  auVar34._0_8_ = 0x3f0000003f000000;
  auVar34._12_4_ = 0x3f000000;
  auVar102 = vmulps_avx512vl(auVar276,auVar34);
  auVar102 = vsubps_avx(auVar102,auVar101);
  auVar102 = vdpps_avx(auVar102,local_9d0,0x7f);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar280._4_12_ = ZEXT812(0) << 0x20;
  auVar280._0_4_ = local_9e0._0_4_;
  auVar103 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar280);
  auVar106 = vfnmadd213ss_fma(auVar103,local_9e0,ZEXT416(0x40000000));
  local_640 = auVar102._0_4_ * auVar106._0_4_ * auVar103._0_4_;
  auVar281._4_4_ = local_640;
  auVar281._0_4_ = local_640;
  auVar281._8_4_ = local_640;
  auVar281._12_4_ = local_640;
  fStack_9b0 = local_640;
  _local_9c0 = auVar281;
  fStack_9ac = local_640;
  fStack_9a8 = local_640;
  fStack_9a4 = local_640;
  auVar102 = vfmadd231ps_fma(auVar101,local_9d0,auVar281);
  auVar102 = vblendps_avx(auVar102,ZEXT816(0) << 0x40,8);
  auVar101 = vsubps_avx(auVar104,auVar102);
  auVar285 = ZEXT1664(auVar101);
  auVar104 = vsubps_avx(auVar24,auVar102);
  auVar24 = vfmadd231ps_fma(auVar195,auVar174,*(undefined1 (*) [16])(lVar6 + lVar94 * (uVar90 + 3)))
  ;
  auVar105 = vsubps_avx(auVar105,auVar102);
  auVar102 = vsubps_avx(auVar24,auVar102);
  auVar289 = ZEXT3264(CONCAT428(0x80000000,
                                CONCAT424(0x80000000,
                                          CONCAT420(0x80000000,
                                                    CONCAT416(0x80000000,
                                                              CONCAT412(0x80000000,
                                                                        CONCAT48(0x80000000,
                                                                                 0x8000000080000000)
                                                                       ))))));
  auVar112 = vbroadcastss_avx512vl(auVar101);
  auVar116._8_4_ = 1;
  auVar116._0_8_ = 0x100000001;
  auVar116._12_4_ = 1;
  auVar116._16_4_ = 1;
  auVar116._20_4_ = 1;
  auVar116._24_4_ = 1;
  auVar116._28_4_ = 1;
  local_940 = ZEXT1632(auVar101);
  local_ac0 = vpermps_avx512vl(auVar116,local_940);
  auVar304 = ZEXT3264(local_ac0);
  auVar117._8_4_ = 2;
  auVar117._0_8_ = 0x200000002;
  auVar117._12_4_ = 2;
  auVar117._16_4_ = 2;
  auVar117._20_4_ = 2;
  auVar117._24_4_ = 2;
  auVar117._28_4_ = 2;
  local_ae0 = vpermps_avx512vl(auVar117,local_940);
  auVar305 = ZEXT3264(local_ae0);
  auVar118._8_4_ = 3;
  auVar118._0_8_ = 0x300000003;
  auVar118._12_4_ = 3;
  auVar118._16_4_ = 3;
  auVar118._20_4_ = 3;
  auVar118._24_4_ = 3;
  auVar118._28_4_ = 3;
  auVar113 = vpermps_avx512vl(auVar118,local_940);
  local_b00 = vbroadcastss_avx512vl(auVar105);
  auVar306 = ZEXT3264(local_b00);
  local_980 = ZEXT1632(auVar105);
  auVar114 = vpermps_avx512vl(auVar116,local_980);
  auVar115 = vpermps_avx512vl(auVar117,local_980);
  local_b20 = vpermps_avx512vl(auVar118,local_980);
  auVar307 = ZEXT3264(local_b20);
  local_b40 = vbroadcastss_avx512vl(auVar104);
  auVar308 = ZEXT3264(local_b40);
  local_960 = ZEXT1632(auVar104);
  local_b60 = vpermps_avx512vl(auVar116,local_960);
  auVar309 = ZEXT3264(local_b60);
  local_5a0 = vpermps_avx512vl(auVar117,local_960);
  local_5c0 = vpermps_avx512vl(auVar118,local_960);
  local_5e0 = vbroadcastss_avx512vl(auVar102);
  _local_9a0 = ZEXT1632(auVar102);
  local_600 = vpermps_avx2(auVar116,_local_9a0);
  local_620 = vpermps_avx2(auVar117,_local_9a0);
  auVar116 = vpermps_avx512vl(auVar118,_local_9a0);
  auVar215._16_48_ = auVar190._16_48_;
  auVar215._0_16_ = vmulss_avx512f(auVar107,auVar107);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar215._0_16_),local_800,local_800);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),_local_7e0,_local_7e0);
  local_560._0_4_ = auVar102._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar153._8_4_ = 0x7fffffff;
  auVar153._0_8_ = 0x7fffffff7fffffff;
  auVar153._12_4_ = 0x7fffffff;
  auVar153._16_4_ = 0x7fffffff;
  auVar153._20_4_ = 0x7fffffff;
  auVar153._24_4_ = 0x7fffffff;
  auVar153._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar153);
  local_580 = auVar215._0_32_;
  local_910 = ZEXT416((uint)local_640);
  local_640 = fVar170 - local_640;
  fStack_63c = local_640;
  fStack_638 = local_640;
  fStack_634 = local_640;
  fStack_630 = local_640;
  fStack_62c = local_640;
  fStack_628 = local_640;
  fStack_624 = local_640;
  auVar159 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar159);
  uVar90 = 0;
  iVar91 = 1;
  auVar159 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar159);
  auVar102 = vsqrtss_avx(local_9e0,local_9e0);
  auVar101 = vsqrtss_avx(local_9e0,local_9e0);
  auVar215 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar153 = auVar159._32_32_;
  local_a60 = auVar116;
  _local_820 = auVar190._0_32_;
  do {
    local_6f0 = auVar215._0_16_;
    auVar104 = vmovshdup_avx(local_6f0);
    auVar104 = vsubps_avx(auVar104,local_6f0);
    auVar181._0_4_ = auVar104._0_4_;
    fVar191 = auVar181._0_4_ * 0.04761905;
    uVar192 = auVar215._0_4_;
    auVar264._4_4_ = uVar192;
    auVar264._0_4_ = uVar192;
    auVar264._8_4_ = uVar192;
    auVar264._12_4_ = uVar192;
    auVar264._16_4_ = uVar192;
    auVar264._20_4_ = uVar192;
    auVar264._24_4_ = uVar192;
    auVar264._28_4_ = uVar192;
    auVar181._4_4_ = auVar181._0_4_;
    auVar181._8_4_ = auVar181._0_4_;
    auVar181._12_4_ = auVar181._0_4_;
    auVar181._16_4_ = auVar181._0_4_;
    auVar181._20_4_ = auVar181._0_4_;
    auVar181._24_4_ = auVar181._0_4_;
    auVar181._28_4_ = auVar181._0_4_;
    auVar104 = vfmadd231ps_fma(auVar264,auVar181,_DAT_01faff20);
    auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar117 = vsubps_avx512vl(auVar117,ZEXT1632(auVar104));
    fVar234 = auVar104._0_4_;
    fVar252 = auVar104._4_4_;
    fVar253 = auVar104._8_4_;
    fVar254 = auVar104._12_4_;
    fVar294 = auVar289._28_4_;
    fVar256 = auVar117._0_4_;
    fVar257 = auVar117._4_4_;
    fVar258 = auVar117._8_4_;
    fVar265 = auVar117._12_4_;
    fVar266 = auVar117._16_4_;
    fVar267 = auVar117._20_4_;
    fVar268 = auVar117._24_4_;
    auVar123._4_4_ = fVar257 * fVar257 * (float)(auVar289._4_4_ ^ (uint)fVar252);
    auVar123._0_4_ = fVar256 * fVar256 * (float)(auVar289._0_4_ ^ (uint)fVar234);
    auVar123._8_4_ = fVar258 * fVar258 * (float)(auVar289._8_4_ ^ (uint)fVar253);
    auVar123._12_4_ = fVar265 * fVar265 * (float)(auVar289._12_4_ ^ (uint)fVar254);
    auVar123._16_4_ = fVar266 * fVar266 * auVar289._16_4_;
    auVar123._20_4_ = fVar267 * fVar267 * auVar289._20_4_;
    auVar123._24_4_ = fVar268 * fVar268 * auVar289._24_4_;
    auVar123._28_4_ = fVar294;
    auVar286._28_36_ = auVar285._28_36_;
    auVar286._0_28_ =
         ZEXT1628(CONCAT412(fVar254 * fVar254,
                            CONCAT48(fVar253 * fVar253,CONCAT44(fVar252 * fVar252,fVar234 * fVar234)
                                    )));
    fVar287 = fVar234 * 3.0;
    fVar291 = fVar252 * 3.0;
    fVar292 = fVar253 * 3.0;
    fVar293 = fVar254 * 3.0;
    auVar290._28_36_ = auVar289._28_36_;
    auVar290._0_28_ = ZEXT1628(CONCAT412(fVar293,CONCAT48(fVar292,CONCAT44(fVar291,fVar287))));
    auVar285._0_4_ = (fVar287 + -5.0) * fVar234 * fVar234;
    auVar285._4_4_ = (fVar291 + -5.0) * fVar252 * fVar252;
    auVar285._8_4_ = (fVar292 + -5.0) * fVar253 * fVar253;
    auVar285._12_4_ = (fVar293 + -5.0) * fVar254 * fVar254;
    auVar285._16_4_ = 0x80000000;
    auVar285._20_4_ = 0x80000000;
    auVar285._28_36_ = auVar215._28_36_;
    auVar285._24_4_ = 0x80000000;
    auVar118 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar119 = vaddps_avx512vl(auVar285._0_32_,auVar118);
    auVar296._0_4_ = fVar256 * fVar256;
    auVar296._4_4_ = fVar257 * fVar257;
    auVar296._8_4_ = fVar258 * fVar258;
    auVar296._12_4_ = fVar265 * fVar265;
    auVar296._16_4_ = fVar266 * fVar266;
    auVar296._20_4_ = fVar267 * fVar267;
    auVar296._28_36_ = auVar295._28_36_;
    auVar296._24_4_ = fVar268 * fVar268;
    auVar120._4_4_ = auVar296._4_4_ * (fVar257 * 3.0 + -5.0);
    auVar120._0_4_ = auVar296._0_4_ * (fVar256 * 3.0 + -5.0);
    auVar120._8_4_ = auVar296._8_4_ * (fVar258 * 3.0 + -5.0);
    auVar120._12_4_ = auVar296._12_4_ * (fVar265 * 3.0 + -5.0);
    auVar120._16_4_ = auVar296._16_4_ * (fVar266 * 3.0 + -5.0);
    auVar120._20_4_ = auVar296._20_4_ * (fVar267 * 3.0 + -5.0);
    auVar120._24_4_ = auVar296._24_4_ * (fVar268 * 3.0 + -5.0);
    auVar120._28_4_ = auVar297._28_4_ + -5.0;
    auVar120 = vaddps_avx512vl(auVar120,auVar118);
    fVar255 = auVar117._28_4_;
    auVar124._4_4_ = fVar252 * fVar252 * (float)(auVar289._4_4_ ^ (uint)fVar257);
    auVar124._0_4_ = fVar234 * fVar234 * (float)(auVar289._0_4_ ^ (uint)fVar256);
    auVar124._8_4_ = fVar253 * fVar253 * (float)(auVar289._8_4_ ^ (uint)fVar258);
    auVar124._12_4_ = fVar254 * fVar254 * (float)(auVar289._12_4_ ^ (uint)fVar265);
    auVar124._16_4_ = (float)((uint)auVar289._16_4_ ^ (uint)fVar266) * 0.0 * 0.0;
    auVar124._20_4_ = (float)((uint)auVar289._20_4_ ^ (uint)fVar267) * 0.0 * 0.0;
    auVar124._24_4_ = (float)((uint)auVar289._24_4_ ^ (uint)fVar268) * 0.0 * 0.0;
    auVar124._28_4_ = (uint)fVar294 ^ (uint)fVar255;
    auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar117 = vmulps_avx512vl(auVar123,auVar121);
    auVar122 = vmulps_avx512vl(auVar119,auVar121);
    auVar123 = vmulps_avx512vl(auVar120,auVar121);
    auVar120 = vmulps_avx512vl(auVar124,auVar121);
    auVar124 = vmulps_avx512vl(local_5e0,auVar120);
    auVar126._4_4_ = local_600._4_4_ * auVar120._4_4_;
    auVar126._0_4_ = local_600._0_4_ * auVar120._0_4_;
    auVar126._8_4_ = local_600._8_4_ * auVar120._8_4_;
    auVar126._12_4_ = local_600._12_4_ * auVar120._12_4_;
    auVar126._16_4_ = local_600._16_4_ * auVar120._16_4_;
    auVar126._20_4_ = local_600._20_4_ * auVar120._20_4_;
    auVar126._24_4_ = local_600._24_4_ * auVar120._24_4_;
    auVar126._28_4_ = auVar119._28_4_;
    auVar127._4_4_ = local_620._4_4_ * auVar120._4_4_;
    auVar127._0_4_ = local_620._0_4_ * auVar120._0_4_;
    auVar127._8_4_ = local_620._8_4_ * auVar120._8_4_;
    auVar127._12_4_ = local_620._12_4_ * auVar120._12_4_;
    auVar127._16_4_ = local_620._16_4_ * auVar120._16_4_;
    auVar127._20_4_ = local_620._20_4_ * auVar120._20_4_;
    auVar127._24_4_ = local_620._24_4_ * auVar120._24_4_;
    auVar127._28_4_ = fVar294;
    auVar120 = vmulps_avx512vl(auVar116,auVar120);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar123,auVar308._0_32_);
    auVar119 = vfmadd231ps_avx512vl(auVar126,auVar123,auVar309._0_32_);
    auVar125 = vfmadd231ps_avx512vl(auVar127,auVar123,local_5a0);
    auVar123 = vfmadd231ps_avx512vl(auVar120,local_5c0,auVar123);
    auVar120 = vfmadd231ps_avx512vl(auVar124,auVar122,auVar306._0_32_);
    auVar124 = vfmadd231ps_avx512vl(auVar119,auVar122,auVar114);
    auVar119 = vfmadd231ps_avx512vl(auVar125,auVar122,auVar115);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar307._0_32_,auVar122);
    auVar126 = vfmadd231ps_avx512vl(auVar120,auVar117,auVar112);
    auVar127 = vfmadd231ps_avx512vl(auVar124,auVar117,auVar304._0_32_);
    auVar128 = vfmadd231ps_avx512vl(auVar119,auVar117,auVar305._0_32_);
    auVar120 = vfmadd231ps_avx512vl(auVar123,auVar113,auVar117);
    auVar129._4_4_ = (fVar257 + fVar257) * fVar252;
    auVar129._0_4_ = (fVar256 + fVar256) * fVar234;
    auVar129._8_4_ = (fVar258 + fVar258) * fVar253;
    auVar129._12_4_ = (fVar265 + fVar265) * fVar254;
    auVar129._16_4_ = (fVar266 + fVar266) * 0.0;
    auVar129._20_4_ = (fVar267 + fVar267) * 0.0;
    auVar129._24_4_ = (fVar268 + fVar268) * 0.0;
    auVar129._28_4_ = auVar122._28_4_;
    auVar117 = vsubps_avx(auVar129,auVar296._0_32_);
    auVar134._0_28_ =
         ZEXT1628(CONCAT412((fVar254 + fVar254) * (fVar293 + -5.0) + fVar293 * fVar254,
                            CONCAT48((fVar253 + fVar253) * (fVar292 + -5.0) + fVar292 * fVar253,
                                     CONCAT44((fVar252 + fVar252) * (fVar291 + -5.0) +
                                              fVar291 * fVar252,
                                              (fVar234 + fVar234) * (fVar287 + -5.0) +
                                              fVar287 * fVar234))));
    auVar134._28_4_ = fVar294 + -5.0 + 0.0;
    auVar118 = vaddps_avx512vl(auVar290._0_32_,auVar118);
    auVar130._4_4_ = (fVar257 + fVar257) * auVar118._4_4_;
    auVar130._0_4_ = (fVar256 + fVar256) * auVar118._0_4_;
    auVar130._8_4_ = (fVar258 + fVar258) * auVar118._8_4_;
    auVar130._12_4_ = (fVar265 + fVar265) * auVar118._12_4_;
    auVar130._16_4_ = (fVar266 + fVar266) * auVar118._16_4_;
    auVar130._20_4_ = (fVar267 + fVar267) * auVar118._20_4_;
    auVar130._24_4_ = (fVar268 + fVar268) * auVar118._24_4_;
    auVar130._28_4_ = auVar118._28_4_;
    auVar131._4_4_ = fVar257 * 3.0 * fVar257;
    auVar131._0_4_ = fVar256 * 3.0 * fVar256;
    auVar131._8_4_ = fVar258 * 3.0 * fVar258;
    auVar131._12_4_ = fVar265 * 3.0 * fVar265;
    auVar131._16_4_ = fVar266 * 3.0 * fVar266;
    auVar131._20_4_ = fVar267 * 3.0 * fVar267;
    auVar131._24_4_ = fVar268 * 3.0 * fVar268;
    auVar131._28_4_ = fVar255;
    auVar118 = vsubps_avx(auVar130,auVar131);
    auVar123 = vsubps_avx(auVar286._0_32_,auVar129);
    auVar124 = vmulps_avx512vl(auVar117,auVar121);
    auVar119 = vmulps_avx512vl(auVar134,auVar121);
    auVar118 = vmulps_avx512vl(auVar118,auVar121);
    auVar123 = vmulps_avx512vl(auVar123,auVar121);
    auVar121 = vmulps_avx512vl(local_5e0,auVar123);
    auVar132._4_4_ = local_600._4_4_ * auVar123._4_4_;
    auVar132._0_4_ = local_600._0_4_ * auVar123._0_4_;
    auVar132._8_4_ = local_600._8_4_ * auVar123._8_4_;
    auVar132._12_4_ = local_600._12_4_ * auVar123._12_4_;
    auVar132._16_4_ = local_600._16_4_ * auVar123._16_4_;
    auVar132._20_4_ = local_600._20_4_ * auVar123._20_4_;
    auVar132._24_4_ = local_600._24_4_ * auVar123._24_4_;
    auVar132._28_4_ = auVar117._28_4_;
    auVar133._4_4_ = local_620._4_4_ * auVar123._4_4_;
    auVar133._0_4_ = local_620._0_4_ * auVar123._0_4_;
    auVar133._8_4_ = local_620._8_4_ * auVar123._8_4_;
    auVar133._12_4_ = local_620._12_4_ * auVar123._12_4_;
    auVar133._16_4_ = local_620._16_4_ * auVar123._16_4_;
    auVar133._20_4_ = local_620._20_4_ * auVar123._20_4_;
    auVar133._24_4_ = local_620._24_4_ * auVar123._24_4_;
    auVar133._28_4_ = auVar297._28_4_;
    auVar117 = vmulps_avx512vl(auVar116,auVar123);
    auVar123 = vfmadd231ps_avx512vl(auVar121,auVar118,auVar308._0_32_);
    auVar121 = vfmadd231ps_avx512vl(auVar132,auVar118,auVar309._0_32_);
    auVar125 = vfmadd231ps_avx512vl(auVar133,auVar118,local_5a0);
    auVar117 = vfmadd231ps_avx512vl(auVar117,local_5c0,auVar118);
    auVar118 = vfmadd231ps_avx512vl(auVar123,auVar119,auVar306._0_32_);
    auVar123 = vfmadd231ps_avx512vl(auVar121,auVar119,auVar114);
    auVar121 = vfmadd231ps_avx512vl(auVar125,auVar119,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar307._0_32_,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar124,auVar112);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar124,auVar304._0_32_);
    auVar119 = vfmadd231ps_avx512vl(auVar121,auVar124,auVar305._0_32_);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,auVar124);
    auVar146._4_4_ = auVar118._4_4_ * fVar191;
    auVar146._0_4_ = auVar118._0_4_ * fVar191;
    auVar146._8_4_ = auVar118._8_4_ * fVar191;
    auVar146._12_4_ = auVar118._12_4_ * fVar191;
    auVar146._16_4_ = auVar118._16_4_ * fVar191;
    auVar146._20_4_ = auVar118._20_4_ * fVar191;
    auVar146._24_4_ = auVar118._24_4_ * fVar191;
    auVar146._28_4_ = fVar255 + fVar255;
    auVar147._4_4_ = auVar123._4_4_ * fVar191;
    auVar147._0_4_ = auVar123._0_4_ * fVar191;
    auVar147._8_4_ = auVar123._8_4_ * fVar191;
    auVar147._12_4_ = auVar123._12_4_ * fVar191;
    auVar147._16_4_ = auVar123._16_4_ * fVar191;
    auVar147._20_4_ = auVar123._20_4_ * fVar191;
    auVar147._24_4_ = auVar123._24_4_ * fVar191;
    auVar147._28_4_ = auVar122._28_4_;
    auVar148._4_4_ = auVar119._4_4_ * fVar191;
    auVar148._0_4_ = auVar119._0_4_ * fVar191;
    auVar148._8_4_ = auVar119._8_4_ * fVar191;
    auVar148._12_4_ = auVar119._12_4_ * fVar191;
    auVar148._16_4_ = auVar119._16_4_ * fVar191;
    auVar148._20_4_ = auVar119._20_4_ * fVar191;
    auVar148._24_4_ = auVar119._24_4_ * fVar191;
    auVar148._28_4_ = 0;
    fVar234 = fVar191 * auVar117._0_4_;
    fVar252 = fVar191 * auVar117._4_4_;
    auVar137._4_4_ = fVar252;
    auVar137._0_4_ = fVar234;
    fVar253 = fVar191 * auVar117._8_4_;
    auVar137._8_4_ = fVar253;
    fVar254 = fVar191 * auVar117._12_4_;
    auVar137._12_4_ = fVar254;
    fVar255 = fVar191 * auVar117._16_4_;
    auVar137._16_4_ = fVar255;
    fVar256 = fVar191 * auVar117._20_4_;
    auVar137._20_4_ = fVar256;
    fVar257 = fVar191 * auVar117._24_4_;
    auVar137._24_4_ = fVar257;
    auVar137._28_4_ = fVar191;
    auVar104 = vxorps_avx512vl(auVar307._0_16_,auVar307._0_16_);
    auVar129 = vpermt2ps_avx512vl(auVar126,_DAT_01feed00,ZEXT1632(auVar104));
    auVar130 = vpermt2ps_avx512vl(auVar127,_DAT_01feed00,ZEXT1632(auVar104));
    auVar295 = ZEXT3264(auVar130);
    auVar123 = ZEXT1632(auVar104);
    auVar131 = vpermt2ps_avx512vl(auVar128,_DAT_01feed00,auVar123);
    auVar297 = ZEXT3264(auVar131);
    auVar139._0_4_ = auVar120._0_4_ + fVar234;
    auVar139._4_4_ = auVar120._4_4_ + fVar252;
    auVar139._8_4_ = auVar120._8_4_ + fVar253;
    auVar139._12_4_ = auVar120._12_4_ + fVar254;
    auVar139._16_4_ = auVar120._16_4_ + fVar255;
    auVar139._20_4_ = auVar120._20_4_ + fVar256;
    auVar139._24_4_ = auVar120._24_4_ + fVar257;
    auVar139._28_4_ = auVar120._28_4_ + fVar191;
    auVar117 = vmaxps_avx(auVar120,auVar139);
    auVar118 = vminps_avx(auVar120,auVar139);
    auVar121 = vpermt2ps_avx512vl(auVar120,_DAT_01feed00,auVar123);
    auVar132 = vpermt2ps_avx512vl(auVar146,_DAT_01feed00,auVar123);
    auVar133 = vpermt2ps_avx512vl(auVar147,_DAT_01feed00,auVar123);
    auVar142 = ZEXT1632(auVar104);
    auVar134 = vpermt2ps_avx512vl(auVar148,_DAT_01feed00,auVar142);
    auVar123 = vpermt2ps_avx512vl(auVar137,_DAT_01feed00,auVar142);
    auVar122 = vsubps_avx512vl(auVar121,auVar123);
    auVar123 = vsubps_avx(auVar129,auVar126);
    auVar285 = ZEXT3264(auVar123);
    auVar120 = vsubps_avx(auVar130,auVar127);
    auVar124 = vsubps_avx(auVar131,auVar128);
    auVar119 = vmulps_avx512vl(auVar120,auVar148);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar147,auVar124);
    auVar125 = vmulps_avx512vl(auVar124,auVar146);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar148,auVar123);
    auVar135 = vmulps_avx512vl(auVar123,auVar147);
    auVar135 = vfmsub231ps_avx512vl(auVar135,auVar146,auVar120);
    auVar135 = vmulps_avx512vl(auVar135,auVar135);
    auVar125 = vfmadd231ps_avx512vl(auVar135,auVar125,auVar125);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar119,auVar119);
    auVar119 = vmulps_avx512vl(auVar124,auVar124);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar120,auVar120);
    auVar135 = vfmadd231ps_avx512vl(auVar119,auVar123,auVar123);
    auVar136 = vrcp14ps_avx512vl(auVar135);
    auVar119._8_4_ = 0x3f800000;
    auVar119._0_8_ = 0x3f8000003f800000;
    auVar119._12_4_ = 0x3f800000;
    auVar119._16_4_ = 0x3f800000;
    auVar119._20_4_ = 0x3f800000;
    auVar119._24_4_ = 0x3f800000;
    auVar119._28_4_ = 0x3f800000;
    auVar119 = vfnmadd213ps_avx512vl(auVar136,auVar135,auVar119);
    auVar119 = vfmadd132ps_avx512vl(auVar119,auVar136,auVar136);
    auVar125 = vmulps_avx512vl(auVar125,auVar119);
    auVar136 = vmulps_avx512vl(auVar120,auVar134);
    auVar136 = vfmsub231ps_avx512vl(auVar136,auVar133,auVar124);
    auVar137 = vmulps_avx512vl(auVar124,auVar132);
    auVar137 = vfmsub231ps_avx512vl(auVar137,auVar134,auVar123);
    auVar138 = vmulps_avx512vl(auVar123,auVar133);
    auVar138 = vfmsub231ps_avx512vl(auVar138,auVar132,auVar120);
    auVar138 = vmulps_avx512vl(auVar138,auVar138);
    auVar137 = vfmadd231ps_avx512vl(auVar138,auVar137,auVar137);
    auVar136 = vfmadd231ps_avx512vl(auVar137,auVar136,auVar136);
    auVar119 = vmulps_avx512vl(auVar136,auVar119);
    auVar119 = vmaxps_avx512vl(auVar125,auVar119);
    auVar119 = vsqrtps_avx512vl(auVar119);
    auVar125 = vmaxps_avx512vl(auVar122,auVar121);
    auVar117 = vmaxps_avx512vl(auVar117,auVar125);
    auVar136 = vaddps_avx512vl(auVar119,auVar117);
    auVar117 = vminps_avx512vl(auVar122,auVar121);
    auVar117 = vminps_avx(auVar118,auVar117);
    auVar117 = vsubps_avx512vl(auVar117,auVar119);
    auVar121._8_4_ = 0x3f800002;
    auVar121._0_8_ = 0x3f8000023f800002;
    auVar121._12_4_ = 0x3f800002;
    auVar121._16_4_ = 0x3f800002;
    auVar121._20_4_ = 0x3f800002;
    auVar121._24_4_ = 0x3f800002;
    auVar121._28_4_ = 0x3f800002;
    auVar118 = vmulps_avx512vl(auVar136,auVar121);
    auVar122._8_4_ = 0x3f7ffffc;
    auVar122._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar122._12_4_ = 0x3f7ffffc;
    auVar122._16_4_ = 0x3f7ffffc;
    auVar122._20_4_ = 0x3f7ffffc;
    auVar122._24_4_ = 0x3f7ffffc;
    auVar122._28_4_ = 0x3f7ffffc;
    auVar117 = vmulps_avx512vl(auVar117,auVar122);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar119 = vrsqrt14ps_avx512vl(auVar135);
    auVar125._8_4_ = 0xbf000000;
    auVar125._0_8_ = 0xbf000000bf000000;
    auVar125._12_4_ = 0xbf000000;
    auVar125._16_4_ = 0xbf000000;
    auVar125._20_4_ = 0xbf000000;
    auVar125._24_4_ = 0xbf000000;
    auVar125._28_4_ = 0xbf000000;
    auVar121 = vmulps_avx512vl(auVar135,auVar125);
    fVar191 = auVar119._0_4_;
    fVar234 = auVar119._4_4_;
    fVar252 = auVar119._8_4_;
    fVar253 = auVar119._12_4_;
    fVar254 = auVar119._16_4_;
    fVar255 = auVar119._20_4_;
    fVar256 = auVar119._24_4_;
    auVar138._4_4_ = fVar234 * fVar234 * fVar234 * auVar121._4_4_;
    auVar138._0_4_ = fVar191 * fVar191 * fVar191 * auVar121._0_4_;
    auVar138._8_4_ = fVar252 * fVar252 * fVar252 * auVar121._8_4_;
    auVar138._12_4_ = fVar253 * fVar253 * fVar253 * auVar121._12_4_;
    auVar138._16_4_ = fVar254 * fVar254 * fVar254 * auVar121._16_4_;
    auVar138._20_4_ = fVar255 * fVar255 * fVar255 * auVar121._20_4_;
    auVar138._24_4_ = fVar256 * fVar256 * fVar256 * auVar121._24_4_;
    auVar138._28_4_ = auVar136._28_4_;
    auVar135._8_4_ = 0x3fc00000;
    auVar135._0_8_ = 0x3fc000003fc00000;
    auVar135._12_4_ = 0x3fc00000;
    auVar135._16_4_ = 0x3fc00000;
    auVar135._20_4_ = 0x3fc00000;
    auVar135._24_4_ = 0x3fc00000;
    auVar135._28_4_ = 0x3fc00000;
    auVar119 = vfmadd231ps_avx512vl(auVar138,auVar119,auVar135);
    auVar121 = vmulps_avx512vl(auVar123,auVar119);
    auVar122 = vmulps_avx512vl(auVar120,auVar119);
    auVar125 = vmulps_avx512vl(auVar124,auVar119);
    auVar135 = vsubps_avx512vl(auVar142,auVar126);
    auVar137 = vsubps_avx512vl(auVar142,auVar127);
    auVar138 = vsubps_avx512vl(auVar142,auVar128);
    auVar136 = vmulps_avx512vl(_local_820,auVar138);
    auVar136 = vfmadd231ps_avx512vl(auVar136,local_800,auVar137);
    auVar136 = vfmadd231ps_avx512vl(auVar136,_local_7e0,auVar135);
    auVar139 = vmulps_avx512vl(auVar138,auVar138);
    auVar139 = vfmadd231ps_avx512vl(auVar139,auVar137,auVar137);
    auVar139 = vfmadd231ps_avx512vl(auVar139,auVar135,auVar135);
    auVar140 = vmulps_avx512vl(_local_820,auVar125);
    auVar140 = vfmadd231ps_avx512vl(auVar140,auVar122,local_800);
    auVar140 = vfmadd231ps_avx512vl(auVar140,auVar121,_local_7e0);
    auVar125 = vmulps_avx512vl(auVar138,auVar125);
    auVar122 = vfmadd231ps_avx512vl(auVar125,auVar137,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar135,auVar121);
    auVar122 = vmulps_avx512vl(auVar140,auVar140);
    auVar125 = vsubps_avx512vl(local_560,auVar122);
    auVar141 = vmulps_avx512vl(auVar140,auVar121);
    auVar136 = vsubps_avx512vl(auVar136,auVar141);
    auVar141 = vaddps_avx512vl(auVar136,auVar136);
    auVar136 = vmulps_avx512vl(auVar121,auVar121);
    auVar139 = vsubps_avx512vl(auVar139,auVar136);
    auVar118 = vsubps_avx512vl(auVar139,auVar118);
    local_a80 = vmulps_avx512vl(auVar141,auVar141);
    auVar136._8_4_ = 0x40800000;
    auVar136._0_8_ = 0x4080000040800000;
    auVar136._12_4_ = 0x40800000;
    auVar136._16_4_ = 0x40800000;
    auVar136._20_4_ = 0x40800000;
    auVar136._24_4_ = 0x40800000;
    auVar136._28_4_ = 0x40800000;
    _local_840 = vmulps_avx512vl(auVar125,auVar136);
    auVar136 = vmulps_avx512vl(_local_840,auVar118);
    auVar136 = vsubps_avx512vl(local_a80,auVar136);
    uVar95 = vcmpps_avx512vl(auVar136,auVar142,5);
    bVar84 = (byte)uVar95;
    fVar191 = (float)local_9c0._0_4_;
    fVar234 = (float)local_9c0._4_4_;
    fVar252 = fStack_9b8;
    fVar253 = fStack_9b4;
    fVar254 = fStack_9b0;
    fVar255 = fStack_9ac;
    fVar256 = fStack_9a8;
    fVar257 = fStack_9a4;
    if (bVar84 == 0) {
      auVar190 = ZEXT3264(auVar116);
      auVar289 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar304 = ZEXT3264(local_ac0);
      auVar305 = ZEXT3264(local_ae0);
      auVar306 = ZEXT3264(local_b00);
      auVar307 = ZEXT3264(local_b20);
      auVar308 = ZEXT3264(local_b40);
      auVar159._32_32_ = auVar153;
      auVar159._0_32_ = local_b60;
      auVar309 = ZEXT3264(local_b60);
    }
    else {
      local_7c0._0_32_ = auVar139;
      auVar116 = vsqrtps_avx512vl(auVar136);
      auVar136 = vaddps_avx512vl(auVar125,auVar125);
      local_a20 = vrcp14ps_avx512vl(auVar136);
      auVar142._8_4_ = 0x3f800000;
      auVar142._0_8_ = 0x3f8000003f800000;
      auVar142._12_4_ = 0x3f800000;
      auVar142._16_4_ = 0x3f800000;
      auVar142._20_4_ = 0x3f800000;
      auVar142._24_4_ = 0x3f800000;
      auVar142._28_4_ = 0x3f800000;
      auVar142 = vfnmadd213ps_avx512vl(local_a20,auVar136,auVar142);
      auVar142 = vfmadd132ps_avx512vl(auVar142,local_a20,local_a20);
      auVar143._8_4_ = 0x80000000;
      auVar143._0_8_ = 0x8000000080000000;
      auVar143._12_4_ = 0x80000000;
      auVar143._16_4_ = 0x80000000;
      auVar143._20_4_ = 0x80000000;
      auVar143._24_4_ = 0x80000000;
      auVar143._28_4_ = 0x80000000;
      local_860 = vxorps_avx512vl(auVar141,auVar143);
      auVar143 = vsubps_avx512vl(local_860,auVar116);
      local_aa0 = vmulps_avx512vl(auVar143,auVar142);
      auVar116 = vsubps_avx512vl(auVar116,auVar141);
      local_880 = vmulps_avx512vl(auVar116,auVar142);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar142 = vblendmps_avx512vl(auVar116,local_aa0);
      auVar144._0_4_ =
           (uint)(bVar84 & 1) * auVar142._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar116._0_4_;
      bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
      auVar144._4_4_ = (uint)bVar10 * auVar142._4_4_ | (uint)!bVar10 * auVar116._4_4_;
      bVar10 = (bool)((byte)(uVar95 >> 2) & 1);
      auVar144._8_4_ = (uint)bVar10 * auVar142._8_4_ | (uint)!bVar10 * auVar116._8_4_;
      bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
      auVar144._12_4_ = (uint)bVar10 * auVar142._12_4_ | (uint)!bVar10 * auVar116._12_4_;
      bVar10 = (bool)((byte)(uVar95 >> 4) & 1);
      auVar144._16_4_ = (uint)bVar10 * auVar142._16_4_ | (uint)!bVar10 * auVar116._16_4_;
      bVar10 = (bool)((byte)(uVar95 >> 5) & 1);
      auVar144._20_4_ = (uint)bVar10 * auVar142._20_4_ | (uint)!bVar10 * auVar116._20_4_;
      bVar10 = (bool)((byte)(uVar95 >> 6) & 1);
      auVar144._24_4_ = (uint)bVar10 * auVar142._24_4_ | (uint)!bVar10 * auVar116._24_4_;
      bVar10 = SUB81(uVar95 >> 7,0);
      auVar144._28_4_ = (uint)bVar10 * auVar142._28_4_ | (uint)!bVar10 * auVar116._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar142 = vblendmps_avx512vl(auVar116,local_880);
      auVar145._0_4_ =
           (uint)(bVar84 & 1) * auVar142._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar116._0_4_;
      bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
      auVar145._4_4_ = (uint)bVar10 * auVar142._4_4_ | (uint)!bVar10 * auVar116._4_4_;
      bVar10 = (bool)((byte)(uVar95 >> 2) & 1);
      auVar145._8_4_ = (uint)bVar10 * auVar142._8_4_ | (uint)!bVar10 * auVar116._8_4_;
      bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
      auVar145._12_4_ = (uint)bVar10 * auVar142._12_4_ | (uint)!bVar10 * auVar116._12_4_;
      bVar10 = (bool)((byte)(uVar95 >> 4) & 1);
      auVar145._16_4_ = (uint)bVar10 * auVar142._16_4_ | (uint)!bVar10 * auVar116._16_4_;
      bVar10 = (bool)((byte)(uVar95 >> 5) & 1);
      auVar145._20_4_ = (uint)bVar10 * auVar142._20_4_ | (uint)!bVar10 * auVar116._20_4_;
      bVar10 = (bool)((byte)(uVar95 >> 6) & 1);
      auVar145._24_4_ = (uint)bVar10 * auVar142._24_4_ | (uint)!bVar10 * auVar116._24_4_;
      bVar10 = SUB81(uVar95 >> 7,0);
      auVar145._28_4_ = (uint)bVar10 * auVar142._28_4_ | (uint)!bVar10 * auVar116._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar122,auVar116);
      local_8a0 = vmaxps_avx512vl(local_580,auVar116);
      auVar44._8_4_ = 0x36000000;
      auVar44._0_8_ = 0x3600000036000000;
      auVar44._12_4_ = 0x36000000;
      auVar44._16_4_ = 0x36000000;
      auVar44._20_4_ = 0x36000000;
      auVar44._24_4_ = 0x36000000;
      auVar44._28_4_ = 0x36000000;
      local_a00 = vmulps_avx512vl(local_8a0,auVar44);
      vandps_avx512vl(auVar125,auVar116);
      uVar26 = vcmpps_avx512vl(local_a00,local_a00,1);
      uVar95 = uVar95 & uVar26;
      bVar88 = (byte)uVar95;
      if (bVar88 != 0) {
        uVar26 = vcmpps_avx512vl(auVar118,_DAT_01faff00,2);
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar122 = vblendmps_avx512vl(auVar116,auVar118);
        bVar89 = (byte)uVar26;
        uVar97 = (uint)(bVar89 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar89 & 1) * local_a00._0_4_;
        bVar10 = (bool)((byte)(uVar26 >> 1) & 1);
        uVar96 = (uint)bVar10 * auVar122._4_4_ | (uint)!bVar10 * local_a00._4_4_;
        bVar10 = (bool)((byte)(uVar26 >> 2) & 1);
        uVar163 = (uint)bVar10 * auVar122._8_4_ | (uint)!bVar10 * local_a00._8_4_;
        bVar10 = (bool)((byte)(uVar26 >> 3) & 1);
        uVar164 = (uint)bVar10 * auVar122._12_4_ | (uint)!bVar10 * local_a00._12_4_;
        bVar10 = (bool)((byte)(uVar26 >> 4) & 1);
        uVar165 = (uint)bVar10 * auVar122._16_4_ | (uint)!bVar10 * local_a00._16_4_;
        bVar10 = (bool)((byte)(uVar26 >> 5) & 1);
        uVar166 = (uint)bVar10 * auVar122._20_4_ | (uint)!bVar10 * local_a00._20_4_;
        bVar10 = (bool)((byte)(uVar26 >> 6) & 1);
        uVar167 = (uint)bVar10 * auVar122._24_4_ | (uint)!bVar10 * local_a00._24_4_;
        bVar10 = SUB81(uVar26 >> 7,0);
        uVar168 = (uint)bVar10 * auVar122._28_4_ | (uint)!bVar10 * local_a00._28_4_;
        auVar144._0_4_ = (bVar88 & 1) * uVar97 | !(bool)(bVar88 & 1) * auVar144._0_4_;
        bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar144._4_4_ = bVar10 * uVar96 | !bVar10 * auVar144._4_4_;
        bVar10 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar144._8_4_ = bVar10 * uVar163 | !bVar10 * auVar144._8_4_;
        bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar144._12_4_ = bVar10 * uVar164 | !bVar10 * auVar144._12_4_;
        bVar10 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar144._16_4_ = bVar10 * uVar165 | !bVar10 * auVar144._16_4_;
        bVar10 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar144._20_4_ = bVar10 * uVar166 | !bVar10 * auVar144._20_4_;
        bVar10 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar144._24_4_ = bVar10 * uVar167 | !bVar10 * auVar144._24_4_;
        bVar10 = SUB81(uVar95 >> 7,0);
        auVar144._28_4_ = bVar10 * uVar168 | !bVar10 * auVar144._28_4_;
        auVar116 = vblendmps_avx512vl(auVar118,auVar116);
        bVar10 = (bool)((byte)(uVar26 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar26 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar26 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar26 >> 4) & 1);
        bVar15 = (bool)((byte)(uVar26 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar26 >> 6) & 1);
        bVar17 = SUB81(uVar26 >> 7,0);
        auVar145._0_4_ =
             (uint)(bVar88 & 1) *
             ((uint)(bVar89 & 1) * auVar116._0_4_ | !(bool)(bVar89 & 1) * uVar97) |
             !(bool)(bVar88 & 1) * auVar145._0_4_;
        bVar11 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar145._4_4_ =
             (uint)bVar11 * ((uint)bVar10 * auVar116._4_4_ | !bVar10 * uVar96) |
             !bVar11 * auVar145._4_4_;
        bVar10 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar145._8_4_ =
             (uint)bVar10 * ((uint)bVar12 * auVar116._8_4_ | !bVar12 * uVar163) |
             !bVar10 * auVar145._8_4_;
        bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar145._12_4_ =
             (uint)bVar10 * ((uint)bVar13 * auVar116._12_4_ | !bVar13 * uVar164) |
             !bVar10 * auVar145._12_4_;
        bVar10 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar145._16_4_ =
             (uint)bVar10 * ((uint)bVar14 * auVar116._16_4_ | !bVar14 * uVar165) |
             !bVar10 * auVar145._16_4_;
        bVar10 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar145._20_4_ =
             (uint)bVar10 * ((uint)bVar15 * auVar116._20_4_ | !bVar15 * uVar166) |
             !bVar10 * auVar145._20_4_;
        bVar10 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar145._24_4_ =
             (uint)bVar10 * ((uint)bVar16 * auVar116._24_4_ | !bVar16 * uVar167) |
             !bVar10 * auVar145._24_4_;
        bVar10 = SUB81(uVar95 >> 7,0);
        auVar145._28_4_ =
             (uint)bVar10 * ((uint)bVar17 * auVar116._28_4_ | !bVar17 * uVar168) |
             !bVar10 * auVar145._28_4_;
        bVar84 = (~bVar88 | bVar89) & bVar84;
      }
      if ((bVar84 & 0x7f) != 0) {
        auVar125 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar134 = vxorps_avx512vl(auVar134,auVar125);
        auVar132 = vxorps_avx512vl(auVar132,auVar125);
        uVar97 = *(uint *)(ray + k * 4 + 0x200);
        auVar133 = vxorps_avx512vl(auVar133,auVar125);
        local_a40 = ZEXT416(uVar97);
        auVar104 = vsubss_avx512f(local_a40,ZEXT416((uint)local_910._0_4_));
        auVar116 = vbroadcastss_avx512vl(auVar104);
        auVar142 = vminps_avx512vl(auVar116,auVar145);
        auVar83._4_4_ = fStack_63c;
        auVar83._0_4_ = local_640;
        auVar83._8_4_ = fStack_638;
        auVar83._12_4_ = fStack_634;
        auVar83._16_4_ = fStack_630;
        auVar83._20_4_ = fStack_62c;
        auVar83._24_4_ = fStack_628;
        auVar83._28_4_ = fStack_624;
        auVar116 = vmaxps_avx512vl(auVar83,auVar144);
        auVar118 = vmulps_avx512vl(auVar138,auVar148);
        auVar118 = vfmadd213ps_avx512vl(auVar137,auVar147,auVar118);
        auVar104 = vfmadd213ps_fma(auVar135,auVar146,auVar118);
        auVar118 = vmulps_avx512vl(_local_820,auVar148);
        auVar118 = vfmadd231ps_avx512vl(auVar118,local_800,auVar147);
        auVar105 = vfmadd231ps_fma(auVar118,_local_7e0,auVar146);
        auVar135 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar105),auVar135);
        auVar146 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar25 = vcmpps_avx512vl(auVar135,auVar146,1);
        auVar118 = vxorps_avx512vl(ZEXT1632(auVar104),auVar125);
        auVar122 = vrcp14ps_avx512vl(ZEXT1632(auVar105));
        auVar143 = ZEXT1632(auVar105);
        auVar147 = vxorps_avx512vl(auVar143,auVar125);
        auVar148 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar137 = vfnmadd213ps_avx512vl(auVar122,auVar143,auVar148);
        auVar104 = vfmadd132ps_fma(auVar137,auVar122,auVar122);
        fVar258 = auVar104._0_4_ * auVar118._0_4_;
        fVar265 = auVar104._4_4_ * auVar118._4_4_;
        auVar48._4_4_ = fVar265;
        auVar48._0_4_ = fVar258;
        fVar266 = auVar104._8_4_ * auVar118._8_4_;
        auVar48._8_4_ = fVar266;
        fVar267 = auVar104._12_4_ * auVar118._12_4_;
        auVar48._12_4_ = fVar267;
        fVar268 = auVar118._16_4_ * 0.0;
        auVar48._16_4_ = fVar268;
        fVar287 = auVar118._20_4_ * 0.0;
        auVar48._20_4_ = fVar287;
        fVar291 = auVar118._24_4_ * 0.0;
        auVar48._24_4_ = fVar291;
        auVar48._28_4_ = auVar118._28_4_;
        uVar27 = vcmpps_avx512vl(auVar143,auVar147,1);
        bVar88 = (byte)uVar25 | (byte)uVar27;
        auVar137 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar138 = vblendmps_avx512vl(auVar48,auVar137);
        auVar149._0_4_ =
             (uint)(bVar88 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar122._0_4_;
        bVar10 = (bool)(bVar88 >> 1 & 1);
        auVar149._4_4_ = (uint)bVar10 * auVar138._4_4_ | (uint)!bVar10 * auVar122._4_4_;
        bVar10 = (bool)(bVar88 >> 2 & 1);
        auVar149._8_4_ = (uint)bVar10 * auVar138._8_4_ | (uint)!bVar10 * auVar122._8_4_;
        bVar10 = (bool)(bVar88 >> 3 & 1);
        auVar149._12_4_ = (uint)bVar10 * auVar138._12_4_ | (uint)!bVar10 * auVar122._12_4_;
        bVar10 = (bool)(bVar88 >> 4 & 1);
        auVar149._16_4_ = (uint)bVar10 * auVar138._16_4_ | (uint)!bVar10 * auVar122._16_4_;
        bVar10 = (bool)(bVar88 >> 5 & 1);
        auVar149._20_4_ = (uint)bVar10 * auVar138._20_4_ | (uint)!bVar10 * auVar122._20_4_;
        bVar10 = (bool)(bVar88 >> 6 & 1);
        auVar149._24_4_ = (uint)bVar10 * auVar138._24_4_ | (uint)!bVar10 * auVar122._24_4_;
        auVar149._28_4_ =
             (uint)(bVar88 >> 7) * auVar138._28_4_ | (uint)!(bool)(bVar88 >> 7) * auVar122._28_4_;
        auVar138 = vmaxps_avx512vl(auVar116,auVar149);
        uVar27 = vcmpps_avx512vl(auVar143,auVar147,6);
        bVar88 = (byte)uVar25 | (byte)uVar27;
        auVar147 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar150._0_4_ =
             (uint)(bVar88 & 1) * auVar147._0_4_ | (uint)!(bool)(bVar88 & 1) * (int)fVar258;
        bVar10 = (bool)(bVar88 >> 1 & 1);
        auVar150._4_4_ = (uint)bVar10 * auVar147._4_4_ | (uint)!bVar10 * (int)fVar265;
        bVar10 = (bool)(bVar88 >> 2 & 1);
        auVar150._8_4_ = (uint)bVar10 * auVar147._8_4_ | (uint)!bVar10 * (int)fVar266;
        bVar10 = (bool)(bVar88 >> 3 & 1);
        auVar150._12_4_ = (uint)bVar10 * auVar147._12_4_ | (uint)!bVar10 * (int)fVar267;
        bVar10 = (bool)(bVar88 >> 4 & 1);
        auVar150._16_4_ = (uint)bVar10 * auVar147._16_4_ | (uint)!bVar10 * (int)fVar268;
        bVar10 = (bool)(bVar88 >> 5 & 1);
        auVar150._20_4_ = (uint)bVar10 * auVar147._20_4_ | (uint)!bVar10 * (int)fVar287;
        bVar10 = (bool)(bVar88 >> 6 & 1);
        auVar150._24_4_ = (uint)bVar10 * auVar147._24_4_ | (uint)!bVar10 * (int)fVar291;
        auVar150._28_4_ =
             (uint)(bVar88 >> 7) * auVar147._28_4_ | (uint)!(bool)(bVar88 >> 7) * auVar118._28_4_;
        auVar143 = vminps_avx512vl(auVar142,auVar150);
        auVar116 = vsubps_avx(ZEXT832(0) << 0x20,auVar129);
        auVar118 = vsubps_avx(ZEXT832(0) << 0x20,auVar130);
        auVar129 = ZEXT832(0) << 0x20;
        auVar122 = vsubps_avx(auVar129,auVar131);
        auVar122 = vmulps_avx512vl(auVar122,auVar134);
        auVar118 = vfmadd231ps_avx512vl(auVar122,auVar133,auVar118);
        auVar116 = vfmadd231ps_avx512vl(auVar118,auVar132,auVar116);
        auVar118 = vmulps_avx512vl(_local_820,auVar134);
        auVar118 = vfmadd231ps_avx512vl(auVar118,local_800,auVar133);
        auVar118 = vfmadd231ps_avx512vl(auVar118,_local_7e0,auVar132);
        vandps_avx512vl(auVar118,auVar135);
        uVar25 = vcmpps_avx512vl(auVar118,auVar146,1);
        auVar116 = vxorps_avx512vl(auVar116,auVar125);
        auVar122 = vrcp14ps_avx512vl(auVar118);
        auVar125 = vxorps_avx512vl(auVar118,auVar125);
        auVar297 = ZEXT3264(auVar125);
        auVar135 = vfnmadd213ps_avx512vl(auVar122,auVar118,auVar148);
        auVar104 = vfmadd132ps_fma(auVar135,auVar122,auVar122);
        fVar258 = auVar104._0_4_ * auVar116._0_4_;
        fVar265 = auVar104._4_4_ * auVar116._4_4_;
        auVar49._4_4_ = fVar265;
        auVar49._0_4_ = fVar258;
        fVar266 = auVar104._8_4_ * auVar116._8_4_;
        auVar49._8_4_ = fVar266;
        fVar267 = auVar104._12_4_ * auVar116._12_4_;
        auVar49._12_4_ = fVar267;
        fVar268 = auVar116._16_4_ * 0.0;
        auVar49._16_4_ = fVar268;
        fVar287 = auVar116._20_4_ * 0.0;
        auVar49._20_4_ = fVar287;
        fVar291 = auVar116._24_4_ * 0.0;
        auVar49._24_4_ = fVar291;
        auVar49._28_4_ = auVar116._28_4_;
        uVar27 = vcmpps_avx512vl(auVar118,auVar125,1);
        bVar88 = (byte)uVar25 | (byte)uVar27;
        auVar135 = vblendmps_avx512vl(auVar49,auVar137);
        auVar151._0_4_ =
             (uint)(bVar88 & 1) * auVar135._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar122._0_4_;
        bVar10 = (bool)(bVar88 >> 1 & 1);
        auVar151._4_4_ = (uint)bVar10 * auVar135._4_4_ | (uint)!bVar10 * auVar122._4_4_;
        bVar10 = (bool)(bVar88 >> 2 & 1);
        auVar151._8_4_ = (uint)bVar10 * auVar135._8_4_ | (uint)!bVar10 * auVar122._8_4_;
        bVar10 = (bool)(bVar88 >> 3 & 1);
        auVar151._12_4_ = (uint)bVar10 * auVar135._12_4_ | (uint)!bVar10 * auVar122._12_4_;
        bVar10 = (bool)(bVar88 >> 4 & 1);
        auVar151._16_4_ = (uint)bVar10 * auVar135._16_4_ | (uint)!bVar10 * auVar122._16_4_;
        bVar10 = (bool)(bVar88 >> 5 & 1);
        auVar151._20_4_ = (uint)bVar10 * auVar135._20_4_ | (uint)!bVar10 * auVar122._20_4_;
        bVar10 = (bool)(bVar88 >> 6 & 1);
        auVar151._24_4_ = (uint)bVar10 * auVar135._24_4_ | (uint)!bVar10 * auVar122._24_4_;
        auVar151._28_4_ =
             (uint)(bVar88 >> 7) * auVar135._28_4_ | (uint)!(bool)(bVar88 >> 7) * auVar122._28_4_;
        auVar295 = ZEXT3264(auVar151);
        _local_8c0 = vmaxps_avx(auVar138,auVar151);
        uVar27 = vcmpps_avx512vl(auVar118,auVar125,6);
        bVar88 = (byte)uVar25 | (byte)uVar27;
        auVar152._0_4_ =
             (uint)(bVar88 & 1) * auVar147._0_4_ | (uint)!(bool)(bVar88 & 1) * (int)fVar258;
        bVar10 = (bool)(bVar88 >> 1 & 1);
        auVar152._4_4_ = (uint)bVar10 * auVar147._4_4_ | (uint)!bVar10 * (int)fVar265;
        bVar10 = (bool)(bVar88 >> 2 & 1);
        auVar152._8_4_ = (uint)bVar10 * auVar147._8_4_ | (uint)!bVar10 * (int)fVar266;
        bVar10 = (bool)(bVar88 >> 3 & 1);
        auVar152._12_4_ = (uint)bVar10 * auVar147._12_4_ | (uint)!bVar10 * (int)fVar267;
        bVar10 = (bool)(bVar88 >> 4 & 1);
        auVar152._16_4_ = (uint)bVar10 * auVar147._16_4_ | (uint)!bVar10 * (int)fVar268;
        bVar10 = (bool)(bVar88 >> 5 & 1);
        auVar152._20_4_ = (uint)bVar10 * auVar147._20_4_ | (uint)!bVar10 * (int)fVar287;
        bVar10 = (bool)(bVar88 >> 6 & 1);
        auVar152._24_4_ = (uint)bVar10 * auVar147._24_4_ | (uint)!bVar10 * (int)fVar291;
        auVar152._28_4_ =
             (uint)(bVar88 >> 7) * auVar147._28_4_ | (uint)!(bool)(bVar88 >> 7) * auVar116._28_4_;
        local_6a0 = vminps_avx(auVar143,auVar152);
        uVar25 = vcmpps_avx512vl(_local_8c0,local_6a0,2);
        bVar84 = bVar84 & 0x7f & (byte)uVar25;
        if (bVar84 != 0) {
          auVar116 = vmaxps_avx(auVar129,auVar117);
          auVar117 = vfmadd213ps_avx512vl(local_aa0,auVar140,auVar121);
          fVar258 = auVar119._0_4_;
          fVar265 = auVar119._4_4_;
          auVar50._4_4_ = fVar265 * auVar117._4_4_;
          auVar50._0_4_ = fVar258 * auVar117._0_4_;
          fVar266 = auVar119._8_4_;
          auVar50._8_4_ = fVar266 * auVar117._8_4_;
          fVar267 = auVar119._12_4_;
          auVar50._12_4_ = fVar267 * auVar117._12_4_;
          fVar268 = auVar119._16_4_;
          auVar50._16_4_ = fVar268 * auVar117._16_4_;
          fVar287 = auVar119._20_4_;
          auVar50._20_4_ = fVar287 * auVar117._20_4_;
          fVar291 = auVar119._24_4_;
          auVar50._24_4_ = fVar291 * auVar117._24_4_;
          auVar50._28_4_ = auVar117._28_4_;
          auVar117 = vfmadd213ps_avx512vl(local_880,auVar140,auVar121);
          auVar51._4_4_ = fVar265 * auVar117._4_4_;
          auVar51._0_4_ = fVar258 * auVar117._0_4_;
          auVar51._8_4_ = fVar266 * auVar117._8_4_;
          auVar51._12_4_ = fVar267 * auVar117._12_4_;
          auVar51._16_4_ = fVar268 * auVar117._16_4_;
          auVar51._20_4_ = fVar287 * auVar117._20_4_;
          auVar51._24_4_ = fVar291 * auVar117._24_4_;
          auVar51._28_4_ = auVar151._28_4_;
          auVar117 = vminps_avx512vl(auVar50,auVar148);
          auVar118 = ZEXT832(0) << 0x20;
          auVar117 = vmaxps_avx(auVar117,ZEXT832(0) << 0x20);
          auVar122 = vminps_avx512vl(auVar51,auVar148);
          auVar52._4_4_ = (auVar117._4_4_ + 1.0) * 0.125;
          auVar52._0_4_ = (auVar117._0_4_ + 0.0) * 0.125;
          auVar52._8_4_ = (auVar117._8_4_ + 2.0) * 0.125;
          auVar52._12_4_ = (auVar117._12_4_ + 3.0) * 0.125;
          auVar52._16_4_ = (auVar117._16_4_ + 4.0) * 0.125;
          auVar52._20_4_ = (auVar117._20_4_ + 5.0) * 0.125;
          auVar52._24_4_ = (auVar117._24_4_ + 6.0) * 0.125;
          auVar52._28_4_ = auVar117._28_4_ + 7.0;
          local_4e0 = vfmadd213ps_avx512vl(auVar52,auVar181,auVar264);
          auVar117 = vmaxps_avx(auVar122,ZEXT832(0) << 0x20);
          auVar53._4_4_ = (auVar117._4_4_ + 1.0) * 0.125;
          auVar53._0_4_ = (auVar117._0_4_ + 0.0) * 0.125;
          auVar53._8_4_ = (auVar117._8_4_ + 2.0) * 0.125;
          auVar53._12_4_ = (auVar117._12_4_ + 3.0) * 0.125;
          auVar53._16_4_ = (auVar117._16_4_ + 4.0) * 0.125;
          auVar53._20_4_ = (auVar117._20_4_ + 5.0) * 0.125;
          auVar53._24_4_ = (auVar117._24_4_ + 6.0) * 0.125;
          auVar53._28_4_ = auVar117._28_4_ + 7.0;
          local_500 = vfmadd213ps_avx512vl(auVar53,auVar181,auVar264);
          auVar54._4_4_ = auVar116._4_4_ * auVar116._4_4_;
          auVar54._0_4_ = auVar116._0_4_ * auVar116._0_4_;
          auVar54._8_4_ = auVar116._8_4_ * auVar116._8_4_;
          auVar54._12_4_ = auVar116._12_4_ * auVar116._12_4_;
          auVar54._16_4_ = auVar116._16_4_ * auVar116._16_4_;
          auVar54._20_4_ = auVar116._20_4_ * auVar116._20_4_;
          auVar54._24_4_ = auVar116._24_4_ * auVar116._24_4_;
          auVar54._28_4_ = auVar116._28_4_;
          auVar117 = vsubps_avx(auVar139,auVar54);
          auVar55._4_4_ = auVar117._4_4_ * (float)local_840._4_4_;
          auVar55._0_4_ = auVar117._0_4_ * (float)local_840._0_4_;
          auVar55._8_4_ = auVar117._8_4_ * fStack_838;
          auVar55._12_4_ = auVar117._12_4_ * fStack_834;
          auVar55._16_4_ = auVar117._16_4_ * fStack_830;
          auVar55._20_4_ = auVar117._20_4_ * fStack_82c;
          auVar55._24_4_ = auVar117._24_4_ * fStack_828;
          auVar55._28_4_ = auVar116._28_4_;
          auVar116 = vsubps_avx(local_a80,auVar55);
          uVar25 = vcmpps_avx512vl(auVar116,ZEXT832(0) << 0x20,5);
          bVar88 = (byte)uVar25;
          auVar307 = ZEXT3264(local_b20);
          auVar308 = ZEXT3264(local_b40);
          auVar309 = ZEXT3264(local_b60);
          auVar190 = ZEXT3264(local_a60);
          if (bVar88 == 0) {
            bVar88 = 0;
            auVar123 = ZEXT832(0) << 0x20;
            auVar159 = ZEXT864(0) << 0x20;
            auVar116 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar122 = SUB6432(ZEXT864(0),0) << 0x20;
            auVar295 = ZEXT864(0) << 0x20;
            auVar128._8_4_ = 0x7f800000;
            auVar128._0_8_ = 0x7f8000007f800000;
            auVar128._12_4_ = 0x7f800000;
            auVar128._16_4_ = 0x7f800000;
            auVar128._20_4_ = 0x7f800000;
            auVar128._24_4_ = 0x7f800000;
            auVar128._28_4_ = 0x7f800000;
            auVar140._8_4_ = 0xff800000;
            auVar140._0_8_ = 0xff800000ff800000;
            auVar140._12_4_ = 0xff800000;
            auVar140._16_4_ = 0xff800000;
            auVar140._20_4_ = 0xff800000;
            auVar140._24_4_ = 0xff800000;
            auVar140._28_4_ = 0xff800000;
          }
          else {
            auVar105 = vxorps_avx512vl(auVar142._0_16_,auVar142._0_16_);
            uVar95 = vcmpps_avx512vl(auVar116,auVar129,5);
            auVar116 = vsqrtps_avx(auVar116);
            auVar118 = vfnmadd213ps_avx512vl(auVar136,local_a20,auVar148);
            auVar125 = vfmadd132ps_avx512vl(auVar118,local_a20,local_a20);
            auVar118 = vsubps_avx(local_860,auVar116);
            auVar135 = vmulps_avx512vl(auVar118,auVar125);
            auVar116 = vsubps_avx512vl(auVar116,auVar141);
            auVar125 = vmulps_avx512vl(auVar116,auVar125);
            auVar116 = vfmadd213ps_avx512vl(auVar140,auVar135,auVar121);
            auVar56._4_4_ = fVar265 * auVar116._4_4_;
            auVar56._0_4_ = fVar258 * auVar116._0_4_;
            auVar56._8_4_ = fVar266 * auVar116._8_4_;
            auVar56._12_4_ = fVar267 * auVar116._12_4_;
            auVar56._16_4_ = fVar268 * auVar116._16_4_;
            auVar56._20_4_ = fVar287 * auVar116._20_4_;
            auVar56._24_4_ = fVar291 * auVar116._24_4_;
            auVar56._28_4_ = auVar122._28_4_;
            auVar57._4_4_ = (float)local_7e0._4_4_ * auVar135._4_4_;
            auVar57._0_4_ = (float)local_7e0._0_4_ * auVar135._0_4_;
            auVar57._8_4_ = fStack_7d8 * auVar135._8_4_;
            auVar57._12_4_ = fStack_7d4 * auVar135._12_4_;
            auVar57._16_4_ = fStack_7d0 * auVar135._16_4_;
            auVar57._20_4_ = fStack_7cc * auVar135._20_4_;
            auVar57._24_4_ = fStack_7c8 * auVar135._24_4_;
            auVar57._28_4_ = auVar116._28_4_;
            auVar118 = vmulps_avx512vl(local_800,auVar135);
            auVar136 = vmulps_avx512vl(_local_820,auVar135);
            auVar116 = vfmadd213ps_avx512vl(auVar123,auVar56,auVar126);
            auVar116 = vsubps_avx512vl(auVar57,auVar116);
            auVar122 = vfmadd213ps_avx512vl(auVar120,auVar56,auVar127);
            auVar122 = vsubps_avx512vl(auVar118,auVar122);
            auVar104 = vfmadd213ps_fma(auVar56,auVar124,auVar128);
            auVar118 = vsubps_avx(auVar136,ZEXT1632(auVar104));
            auVar295 = ZEXT3264(auVar118);
            auVar118 = vfmadd213ps_avx512vl(auVar140,auVar125,auVar121);
            auVar119 = vmulps_avx512vl(auVar119,auVar118);
            auVar58._4_4_ = (float)local_7e0._4_4_ * auVar125._4_4_;
            auVar58._0_4_ = (float)local_7e0._0_4_ * auVar125._0_4_;
            auVar58._8_4_ = fStack_7d8 * auVar125._8_4_;
            auVar58._12_4_ = fStack_7d4 * auVar125._12_4_;
            auVar58._16_4_ = fStack_7d0 * auVar125._16_4_;
            auVar58._20_4_ = fStack_7cc * auVar125._20_4_;
            auVar58._24_4_ = fStack_7c8 * auVar125._24_4_;
            auVar58._28_4_ = auVar136._28_4_;
            auVar121 = vmulps_avx512vl(local_800,auVar125);
            auVar136 = vmulps_avx512vl(_local_820,auVar125);
            auVar104 = vfmadd213ps_fma(auVar123,auVar119,auVar126);
            auVar118 = vsubps_avx(auVar58,ZEXT1632(auVar104));
            auVar104 = vfmadd213ps_fma(auVar120,auVar119,auVar127);
            auVar123 = vsubps_avx512vl(auVar121,ZEXT1632(auVar104));
            auVar104 = vfmadd213ps_fma(auVar124,auVar119,auVar128);
            auVar120 = vsubps_avx512vl(auVar136,ZEXT1632(auVar104));
            auVar159 = ZEXT3264(auVar120);
            auVar182._8_4_ = 0x7f800000;
            auVar182._0_8_ = 0x7f8000007f800000;
            auVar182._12_4_ = 0x7f800000;
            auVar182._16_4_ = 0x7f800000;
            auVar182._20_4_ = 0x7f800000;
            auVar182._24_4_ = 0x7f800000;
            auVar182._28_4_ = 0x7f800000;
            auVar120 = vblendmps_avx512vl(auVar182,auVar135);
            bVar10 = (bool)((byte)uVar95 & 1);
            auVar128._0_4_ = (uint)bVar10 * auVar120._0_4_ | (uint)!bVar10 * auVar126._0_4_;
            bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
            auVar128._4_4_ = (uint)bVar10 * auVar120._4_4_ | (uint)!bVar10 * auVar126._4_4_;
            bVar10 = (bool)((byte)(uVar95 >> 2) & 1);
            auVar128._8_4_ = (uint)bVar10 * auVar120._8_4_ | (uint)!bVar10 * auVar126._8_4_;
            bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar128._12_4_ = (uint)bVar10 * auVar120._12_4_ | (uint)!bVar10 * auVar126._12_4_;
            bVar10 = (bool)((byte)(uVar95 >> 4) & 1);
            auVar128._16_4_ = (uint)bVar10 * auVar120._16_4_ | (uint)!bVar10 * auVar126._16_4_;
            bVar10 = (bool)((byte)(uVar95 >> 5) & 1);
            auVar128._20_4_ = (uint)bVar10 * auVar120._20_4_ | (uint)!bVar10 * auVar126._20_4_;
            bVar10 = (bool)((byte)(uVar95 >> 6) & 1);
            auVar128._24_4_ = (uint)bVar10 * auVar120._24_4_ | (uint)!bVar10 * auVar126._24_4_;
            bVar10 = SUB81(uVar95 >> 7,0);
            auVar128._28_4_ = (uint)bVar10 * auVar120._28_4_ | (uint)!bVar10 * auVar126._28_4_;
            auVar183._8_4_ = 0xff800000;
            auVar183._0_8_ = 0xff800000ff800000;
            auVar183._12_4_ = 0xff800000;
            auVar183._16_4_ = 0xff800000;
            auVar183._20_4_ = 0xff800000;
            auVar183._24_4_ = 0xff800000;
            auVar183._28_4_ = 0xff800000;
            auVar120 = vblendmps_avx512vl(auVar183,auVar125);
            bVar10 = (bool)((byte)uVar95 & 1);
            auVar140._0_4_ = (uint)bVar10 * auVar120._0_4_ | (uint)!bVar10 * -0x800000;
            bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
            auVar140._4_4_ = (uint)bVar10 * auVar120._4_4_ | (uint)!bVar10 * -0x800000;
            bVar10 = (bool)((byte)(uVar95 >> 2) & 1);
            auVar140._8_4_ = (uint)bVar10 * auVar120._8_4_ | (uint)!bVar10 * -0x800000;
            bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar140._12_4_ = (uint)bVar10 * auVar120._12_4_ | (uint)!bVar10 * -0x800000;
            bVar10 = (bool)((byte)(uVar95 >> 4) & 1);
            auVar140._16_4_ = (uint)bVar10 * auVar120._16_4_ | (uint)!bVar10 * -0x800000;
            bVar10 = (bool)((byte)(uVar95 >> 5) & 1);
            auVar140._20_4_ = (uint)bVar10 * auVar120._20_4_ | (uint)!bVar10 * -0x800000;
            bVar10 = (bool)((byte)(uVar95 >> 6) & 1);
            auVar140._24_4_ = (uint)bVar10 * auVar120._24_4_ | (uint)!bVar10 * -0x800000;
            bVar10 = SUB81(uVar95 >> 7,0);
            auVar140._28_4_ = (uint)bVar10 * auVar120._28_4_ | (uint)!bVar10 * -0x800000;
            auVar141._8_4_ = 0x36000000;
            auVar141._0_8_ = 0x3600000036000000;
            auVar141._12_4_ = 0x36000000;
            auVar141._16_4_ = 0x36000000;
            auVar141._20_4_ = 0x36000000;
            auVar141._24_4_ = 0x36000000;
            auVar141._28_4_ = 0x36000000;
            auVar120 = vmulps_avx512vl(local_8a0,auVar141);
            uVar26 = vcmpps_avx512vl(auVar120,local_a00,0xe);
            uVar95 = uVar95 & uVar26;
            bVar89 = (byte)uVar95;
            if (bVar89 != 0) {
              uVar26 = vcmpps_avx512vl(auVar117,ZEXT1632(auVar105),2);
              auVar284._8_4_ = 0x7f800000;
              auVar284._0_8_ = 0x7f8000007f800000;
              auVar284._12_4_ = 0x7f800000;
              auVar284._16_4_ = 0x7f800000;
              auVar284._20_4_ = 0x7f800000;
              auVar284._24_4_ = 0x7f800000;
              auVar284._28_4_ = 0x7f800000;
              auVar300._8_4_ = 0xff800000;
              auVar300._0_8_ = 0xff800000ff800000;
              auVar300._12_4_ = 0xff800000;
              auVar300._16_4_ = 0xff800000;
              auVar300._20_4_ = 0xff800000;
              auVar300._24_4_ = 0xff800000;
              auVar300._28_4_ = 0xff800000;
              auVar117 = vblendmps_avx512vl(auVar284,auVar300);
              bVar93 = (byte)uVar26;
              uVar96 = (uint)(bVar93 & 1) * auVar117._0_4_ |
                       (uint)!(bool)(bVar93 & 1) * auVar120._0_4_;
              bVar10 = (bool)((byte)(uVar26 >> 1) & 1);
              uVar163 = (uint)bVar10 * auVar117._4_4_ | (uint)!bVar10 * auVar120._4_4_;
              bVar10 = (bool)((byte)(uVar26 >> 2) & 1);
              uVar164 = (uint)bVar10 * auVar117._8_4_ | (uint)!bVar10 * auVar120._8_4_;
              bVar10 = (bool)((byte)(uVar26 >> 3) & 1);
              uVar165 = (uint)bVar10 * auVar117._12_4_ | (uint)!bVar10 * auVar120._12_4_;
              bVar10 = (bool)((byte)(uVar26 >> 4) & 1);
              uVar166 = (uint)bVar10 * auVar117._16_4_ | (uint)!bVar10 * auVar120._16_4_;
              bVar10 = (bool)((byte)(uVar26 >> 5) & 1);
              uVar167 = (uint)bVar10 * auVar117._20_4_ | (uint)!bVar10 * auVar120._20_4_;
              bVar10 = (bool)((byte)(uVar26 >> 6) & 1);
              uVar168 = (uint)bVar10 * auVar117._24_4_ | (uint)!bVar10 * auVar120._24_4_;
              bVar10 = SUB81(uVar26 >> 7,0);
              uVar169 = (uint)bVar10 * auVar117._28_4_ | (uint)!bVar10 * auVar120._28_4_;
              auVar128._0_4_ = (bVar89 & 1) * uVar96 | !(bool)(bVar89 & 1) * auVar128._0_4_;
              bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
              auVar128._4_4_ = bVar10 * uVar163 | !bVar10 * auVar128._4_4_;
              bVar10 = (bool)((byte)(uVar95 >> 2) & 1);
              auVar128._8_4_ = bVar10 * uVar164 | !bVar10 * auVar128._8_4_;
              bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
              auVar128._12_4_ = bVar10 * uVar165 | !bVar10 * auVar128._12_4_;
              bVar10 = (bool)((byte)(uVar95 >> 4) & 1);
              auVar128._16_4_ = bVar10 * uVar166 | !bVar10 * auVar128._16_4_;
              bVar10 = (bool)((byte)(uVar95 >> 5) & 1);
              auVar128._20_4_ = bVar10 * uVar167 | !bVar10 * auVar128._20_4_;
              bVar10 = (bool)((byte)(uVar95 >> 6) & 1);
              auVar128._24_4_ = bVar10 * uVar168 | !bVar10 * auVar128._24_4_;
              bVar10 = SUB81(uVar95 >> 7,0);
              auVar128._28_4_ = bVar10 * uVar169 | !bVar10 * auVar128._28_4_;
              auVar117 = vblendmps_avx512vl(auVar300,auVar284);
              bVar10 = (bool)((byte)(uVar26 >> 1) & 1);
              bVar12 = (bool)((byte)(uVar26 >> 2) & 1);
              bVar13 = (bool)((byte)(uVar26 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar26 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar26 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar26 >> 6) & 1);
              bVar17 = SUB81(uVar26 >> 7,0);
              auVar140._0_4_ =
                   (uint)(bVar89 & 1) *
                   ((uint)(bVar93 & 1) * auVar117._0_4_ | !(bool)(bVar93 & 1) * uVar96) |
                   !(bool)(bVar89 & 1) * auVar140._0_4_;
              bVar11 = (bool)((byte)(uVar95 >> 1) & 1);
              auVar140._4_4_ =
                   (uint)bVar11 * ((uint)bVar10 * auVar117._4_4_ | !bVar10 * uVar163) |
                   !bVar11 * auVar140._4_4_;
              bVar10 = (bool)((byte)(uVar95 >> 2) & 1);
              auVar140._8_4_ =
                   (uint)bVar10 * ((uint)bVar12 * auVar117._8_4_ | !bVar12 * uVar164) |
                   !bVar10 * auVar140._8_4_;
              bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
              auVar140._12_4_ =
                   (uint)bVar10 * ((uint)bVar13 * auVar117._12_4_ | !bVar13 * uVar165) |
                   !bVar10 * auVar140._12_4_;
              bVar10 = (bool)((byte)(uVar95 >> 4) & 1);
              auVar140._16_4_ =
                   (uint)bVar10 * ((uint)bVar14 * auVar117._16_4_ | !bVar14 * uVar166) |
                   !bVar10 * auVar140._16_4_;
              bVar10 = (bool)((byte)(uVar95 >> 5) & 1);
              auVar140._20_4_ =
                   (uint)bVar10 * ((uint)bVar15 * auVar117._20_4_ | !bVar15 * uVar167) |
                   !bVar10 * auVar140._20_4_;
              bVar10 = (bool)((byte)(uVar95 >> 6) & 1);
              auVar140._24_4_ =
                   (uint)bVar10 * ((uint)bVar16 * auVar117._24_4_ | !bVar16 * uVar168) |
                   !bVar10 * auVar140._24_4_;
              bVar10 = SUB81(uVar95 >> 7,0);
              auVar140._28_4_ =
                   (uint)bVar10 * ((uint)bVar17 * auVar117._28_4_ | !bVar17 * uVar169) |
                   !bVar10 * auVar140._28_4_;
              bVar88 = (~bVar89 | bVar93) & bVar88;
            }
          }
          auVar289._0_4_ = (float)local_820._0_4_ * auVar159._0_4_;
          auVar289._4_4_ = (float)local_820._4_4_ * auVar159._4_4_;
          auVar289._8_4_ = fStack_818 * auVar159._8_4_;
          auVar289._12_4_ = fStack_814 * auVar159._12_4_;
          auVar289._16_4_ = fStack_810 * auVar159._16_4_;
          auVar289._20_4_ = fStack_80c * auVar159._20_4_;
          auVar289._28_36_ = auVar159._28_36_;
          auVar289._24_4_ = fStack_808 * auVar159._24_4_;
          auVar104 = vfmadd231ps_fma(auVar289._0_32_,local_800,auVar123);
          auVar285 = ZEXT3264(_local_7e0);
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),_local_7e0,auVar118);
          auVar297 = ZEXT3264(_local_8c0);
          _local_540 = _local_8c0;
          local_520 = vminps_avx(local_6a0,auVar128);
          auVar277._8_4_ = 0x7fffffff;
          auVar277._0_8_ = 0x7fffffff7fffffff;
          auVar277._12_4_ = 0x7fffffff;
          auVar277._16_4_ = 0x7fffffff;
          auVar277._20_4_ = 0x7fffffff;
          auVar277._24_4_ = 0x7fffffff;
          auVar277._28_4_ = 0x7fffffff;
          auVar117 = vandps_avx(ZEXT1632(auVar104),auVar277);
          local_6c0 = vmaxps_avx(_local_8c0,auVar140);
          auVar184._8_4_ = 0x3e99999a;
          auVar184._0_8_ = 0x3e99999a3e99999a;
          auVar184._12_4_ = 0x3e99999a;
          auVar184._16_4_ = 0x3e99999a;
          auVar184._20_4_ = 0x3e99999a;
          auVar184._24_4_ = 0x3e99999a;
          auVar184._28_4_ = 0x3e99999a;
          uVar25 = vcmpps_avx512vl(auVar117,auVar184,1);
          local_740._0_2_ = (short)uVar25;
          uVar25 = vcmpps_avx512vl(_local_8c0,local_520,2);
          bVar89 = (byte)uVar25 & bVar84;
          uVar27 = vcmpps_avx512vl(local_6c0,local_6a0,2);
          auVar304 = ZEXT3264(local_ac0);
          auVar305 = ZEXT3264(local_ae0);
          auVar159._32_32_ = auVar153;
          auVar159._0_32_ = local_b00;
          auVar306 = ZEXT3264(local_b00);
          if ((bVar84 & ((byte)uVar27 | (byte)uVar25)) == 0) {
            auVar289 = ZEXT3264(CONCAT428(0x80000000,
                                          CONCAT424(0x80000000,
                                                    CONCAT420(0x80000000,
                                                              CONCAT416(0x80000000,
                                                                        CONCAT412(0x80000000,
                                                                                  CONCAT48(
                                                  0x80000000,0x8000000080000000)))))));
          }
          else {
            auVar59._4_4_ = (float)local_820._4_4_ * auVar295._4_4_;
            auVar59._0_4_ = (float)local_820._0_4_ * auVar295._0_4_;
            auVar59._8_4_ = fStack_818 * auVar295._8_4_;
            auVar59._12_4_ = fStack_814 * auVar295._12_4_;
            auVar59._16_4_ = fStack_810 * auVar295._16_4_;
            auVar59._20_4_ = fStack_80c * auVar295._20_4_;
            auVar59._24_4_ = fStack_808 * auVar295._24_4_;
            auVar59._28_4_ = 0x3e99999a;
            auVar104 = vfmadd213ps_fma(auVar122,local_800,auVar59);
            auVar104 = vfmadd213ps_fma(auVar116,_local_7e0,ZEXT1632(auVar104));
            auVar116 = vandps_avx(ZEXT1632(auVar104),auVar277);
            uVar25 = vcmpps_avx512vl(auVar116,auVar184,1);
            bVar93 = (byte)uVar25 | ~bVar88;
            auVar185._8_4_ = 2;
            auVar185._0_8_ = 0x200000002;
            auVar185._12_4_ = 2;
            auVar185._16_4_ = 2;
            auVar185._20_4_ = 2;
            auVar185._24_4_ = 2;
            auVar185._28_4_ = 2;
            auVar45._8_4_ = 3;
            auVar45._0_8_ = 0x300000003;
            auVar45._12_4_ = 3;
            auVar45._16_4_ = 3;
            auVar45._20_4_ = 3;
            auVar45._24_4_ = 3;
            auVar45._28_4_ = 3;
            auVar116 = vpblendmd_avx512vl(auVar185,auVar45);
            local_660._0_4_ = (uint)(bVar93 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar93 & 1) * 2;
            bVar10 = (bool)(bVar93 >> 1 & 1);
            local_660._4_4_ = (uint)bVar10 * auVar116._4_4_ | (uint)!bVar10 * 2;
            bVar10 = (bool)(bVar93 >> 2 & 1);
            local_660._8_4_ = (uint)bVar10 * auVar116._8_4_ | (uint)!bVar10 * 2;
            bVar10 = (bool)(bVar93 >> 3 & 1);
            local_660._12_4_ = (uint)bVar10 * auVar116._12_4_ | (uint)!bVar10 * 2;
            bVar10 = (bool)(bVar93 >> 4 & 1);
            local_660._16_4_ = (uint)bVar10 * auVar116._16_4_ | (uint)!bVar10 * 2;
            bVar10 = (bool)(bVar93 >> 5 & 1);
            local_660._20_4_ = (uint)bVar10 * auVar116._20_4_ | (uint)!bVar10 * 2;
            bVar10 = (bool)(bVar93 >> 6 & 1);
            local_660._24_4_ = (uint)bVar10 * auVar116._24_4_ | (uint)!bVar10 * 2;
            local_660._28_4_ =
                 (uint)(bVar93 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar93 >> 7) * 2;
            local_6e0 = vpbroadcastd_avx512vl();
            uVar25 = vpcmpd_avx512vl(local_6e0,local_660,5);
            bVar93 = (byte)uVar25 & bVar89;
            if (bVar93 == 0) {
              auVar187._4_4_ = uVar97;
              auVar187._0_4_ = uVar97;
              auVar187._8_4_ = uVar97;
              auVar187._12_4_ = uVar97;
              auVar187._16_4_ = uVar97;
              auVar187._20_4_ = uVar97;
              auVar187._24_4_ = uVar97;
              auVar187._28_4_ = uVar97;
              auVar116 = local_6c0;
            }
            else {
              local_680 = local_6c0;
              auVar105 = vminps_avx(local_940._0_16_,local_980._0_16_);
              auVar104 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
              auVar24 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar106 = vminps_avx(auVar105,auVar24);
              auVar105 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar24 = vmaxps_avx(auVar104,auVar105);
              auVar219._8_4_ = 0x7fffffff;
              auVar219._0_8_ = 0x7fffffff7fffffff;
              auVar219._12_4_ = 0x7fffffff;
              auVar104 = vandps_avx(auVar106,auVar219);
              auVar105 = vandps_avx(auVar24,auVar219);
              auVar104 = vmaxps_avx(auVar104,auVar105);
              auVar105 = vmovshdup_avx(auVar104);
              auVar105 = vmaxss_avx(auVar105,auVar104);
              auVar104 = vshufpd_avx(auVar104,auVar104,1);
              auVar104 = vmaxss_avx(auVar104,auVar105);
              fVar191 = auVar104._0_4_ * 1.9073486e-06;
              local_900 = vshufps_avx(auVar24,auVar24,0xff);
              local_720 = (float)local_8c0._0_4_ + (float)local_9c0._0_4_;
              fStack_71c = (float)local_8c0._4_4_ + (float)local_9c0._4_4_;
              fStack_718 = fStack_8b8 + fStack_9b8;
              fStack_714 = fStack_8b4 + fStack_9b4;
              fStack_710 = fStack_8b0 + fStack_9b0;
              fStack_70c = fStack_8ac + fStack_9ac;
              fStack_708 = fStack_8a8 + fStack_9a8;
              fStack_704 = fStack_8a4 + fStack_9a4;
              do {
                auVar186._8_4_ = 0x7f800000;
                auVar186._0_8_ = 0x7f8000007f800000;
                auVar186._12_4_ = 0x7f800000;
                auVar186._16_4_ = 0x7f800000;
                auVar186._20_4_ = 0x7f800000;
                auVar186._24_4_ = 0x7f800000;
                auVar186._28_4_ = 0x7f800000;
                auVar153 = vblendmps_avx512vl(auVar186,_local_8c0);
                auVar154._0_4_ =
                     (uint)(bVar93 & 1) * auVar153._0_4_ | (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                bVar10 = (bool)(bVar93 >> 1 & 1);
                auVar154._4_4_ = (uint)bVar10 * auVar153._4_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(bVar93 >> 2 & 1);
                auVar154._8_4_ = (uint)bVar10 * auVar153._8_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(bVar93 >> 3 & 1);
                auVar154._12_4_ = (uint)bVar10 * auVar153._12_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(bVar93 >> 4 & 1);
                auVar154._16_4_ = (uint)bVar10 * auVar153._16_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(bVar93 >> 5 & 1);
                auVar154._20_4_ = (uint)bVar10 * auVar153._20_4_ | (uint)!bVar10 * 0x7f800000;
                auVar154._24_4_ =
                     (uint)(bVar93 >> 6) * auVar153._24_4_ | (uint)!(bool)(bVar93 >> 6) * 0x7f800000
                ;
                auVar154._28_4_ = 0x7f800000;
                auVar153 = vshufps_avx(auVar154,auVar154,0xb1);
                auVar153 = vminps_avx(auVar154,auVar153);
                auVar116 = vshufpd_avx(auVar153,auVar153,5);
                auVar153 = vminps_avx(auVar153,auVar116);
                auVar116 = vpermpd_avx2(auVar153,0x4e);
                auVar153 = vminps_avx(auVar153,auVar116);
                uVar25 = vcmpps_avx512vl(auVar154,auVar153,0);
                bVar85 = (byte)uVar25 & bVar93;
                bVar86 = bVar93;
                if (bVar85 != 0) {
                  bVar86 = bVar85;
                }
                iVar29 = 0;
                for (uVar97 = (uint)bVar86; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x80000000) {
                  iVar29 = iVar29 + 1;
                }
                uVar97 = *(uint *)(local_4e0 + (uint)(iVar29 << 2));
                uVar96 = *(uint *)(local_540 + (uint)(iVar29 << 2));
                fVar234 = auVar101._0_4_;
                if ((float)local_9e0._0_4_ < 0.0) {
                  fVar234 = sqrtf((float)local_9e0._0_4_);
                }
                auVar104 = vinsertps_avx(ZEXT416(uVar96),ZEXT416(uVar97),0x10);
                auVar159 = ZEXT1664(auVar104);
                lVar94 = 5;
                do {
                  uVar192 = auVar159._0_4_;
                  auVar175._4_4_ = uVar192;
                  auVar175._0_4_ = uVar192;
                  auVar175._8_4_ = uVar192;
                  auVar175._12_4_ = uVar192;
                  auVar104 = vfmadd132ps_fma(auVar175,ZEXT816(0) << 0x40,local_9d0);
                  auVar105 = vmovshdup_avx(auVar159._0_16_);
                  fVar258 = auVar105._0_4_;
                  fVar257 = 1.0 - fVar258;
                  fVar252 = fVar258 * fVar258;
                  auVar108 = SUB6416(ZEXT464(0x40400000),0);
                  auVar107 = SUB6416(ZEXT464(0xc0a00000),0);
                  auVar106 = vfmadd213ss_fma(auVar108,auVar105,auVar107);
                  auVar24 = vfmadd213ss_fma(auVar106,ZEXT416((uint)fVar252),
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar103 = vfmadd213ss_fma(auVar108,ZEXT416((uint)fVar257),auVar107);
                  auVar103 = vfmadd213ss_fma(auVar103,ZEXT416((uint)(fVar257 * fVar257)),
                                             SUB6416(ZEXT464(0x40000000),0));
                  fVar253 = fVar257 * fVar257 * -fVar258 * 0.5;
                  fVar254 = auVar24._0_4_ * 0.5;
                  fVar255 = auVar103._0_4_ * 0.5;
                  fVar256 = fVar258 * fVar258 * -fVar257 * 0.5;
                  auVar238._0_4_ = fVar256 * (float)local_9a0._0_4_;
                  auVar238._4_4_ = fVar256 * (float)local_9a0._4_4_;
                  auVar238._8_4_ = fVar256 * fStack_998;
                  auVar238._12_4_ = fVar256 * fStack_994;
                  auVar262._4_4_ = fVar255;
                  auVar262._0_4_ = fVar255;
                  auVar262._8_4_ = fVar255;
                  auVar262._12_4_ = fVar255;
                  auVar24 = vfmadd132ps_fma(auVar262,auVar238,local_960._0_16_);
                  auVar220._4_4_ = fVar254;
                  auVar220._0_4_ = fVar254;
                  auVar220._8_4_ = fVar254;
                  auVar220._12_4_ = fVar254;
                  auVar24 = vfmadd132ps_fma(auVar220,auVar24,local_980._0_16_);
                  auVar239._4_4_ = fVar253;
                  auVar239._0_4_ = fVar253;
                  auVar239._8_4_ = fVar253;
                  auVar239._12_4_ = fVar253;
                  auVar24 = vfmadd132ps_fma(auVar239,auVar24,local_940._0_16_);
                  auVar103 = vfmadd231ss_fma(auVar107,auVar105,ZEXT416(0x41100000));
                  local_860._0_16_ = auVar103;
                  auVar103 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar105,
                                             ZEXT416(0x40800000));
                  local_880._0_16_ = auVar103;
                  auVar103 = vfmadd213ss_fma(auVar108,auVar105,ZEXT416(0xbf800000));
                  local_8a0._0_16_ = auVar103;
                  _local_840 = auVar24;
                  auVar24 = vsubps_avx(auVar104,auVar24);
                  auVar104 = vdpps_avx(auVar24,auVar24,0x7f);
                  fVar253 = auVar104._0_4_;
                  local_7c0 = auVar159;
                  if (fVar253 < 0.0) {
                    local_a80._0_4_ = auVar106._0_4_;
                    local_aa0._0_16_ = ZEXT416((uint)fVar257);
                    local_a00._0_4_ = fVar252;
                    local_a20._0_4_ = fVar257 * -2.0;
                    auVar295._0_4_ = sqrtf(fVar253);
                    auVar295._4_60_ = extraout_var;
                    auVar106 = ZEXT416((uint)local_a80._0_4_);
                    auVar103 = auVar295._0_16_;
                    auVar107 = local_aa0._0_16_;
                  }
                  else {
                    auVar103 = vsqrtss_avx(auVar104,auVar104);
                    local_a20._0_4_ = fVar257 * -2.0;
                    local_a00._0_4_ = fVar252;
                    auVar107 = ZEXT416((uint)fVar257);
                  }
                  fVar252 = auVar107._0_4_;
                  auVar109 = vfnmadd231ss_fma(ZEXT416((uint)(fVar258 * (fVar252 + fVar252))),
                                              auVar107,auVar107);
                  auVar106 = vfmadd213ss_fma(auVar106,ZEXT416((uint)(fVar258 + fVar258)),
                                             ZEXT416((uint)(fVar258 * fVar258 * 3.0)));
                  auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar105,
                                             SUB6416(ZEXT464(0x40000000),0));
                  auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * fVar252 * -3.0)),
                                             ZEXT416((uint)(fVar252 + fVar252)),auVar107);
                  auVar107 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar105,
                                             ZEXT416((uint)local_a00._0_4_));
                  fVar252 = auVar109._0_4_ * 0.5;
                  fVar254 = auVar106._0_4_ * 0.5;
                  fVar255 = auVar108._0_4_ * 0.5;
                  fVar256 = auVar107._0_4_ * 0.5;
                  auVar240._0_4_ = fVar256 * (float)local_9a0._0_4_;
                  auVar240._4_4_ = fVar256 * (float)local_9a0._4_4_;
                  auVar240._8_4_ = fVar256 * fStack_998;
                  auVar240._12_4_ = fVar256 * fStack_994;
                  auVar221._4_4_ = fVar255;
                  auVar221._0_4_ = fVar255;
                  auVar221._8_4_ = fVar255;
                  auVar221._12_4_ = fVar255;
                  auVar106 = vfmadd132ps_fma(auVar221,auVar240,local_960._0_16_);
                  auVar196._4_4_ = fVar254;
                  auVar196._0_4_ = fVar254;
                  auVar196._8_4_ = fVar254;
                  auVar196._12_4_ = fVar254;
                  auVar106 = vfmadd132ps_fma(auVar196,auVar106,local_980._0_16_);
                  auVar298._4_4_ = fVar252;
                  auVar298._0_4_ = fVar252;
                  auVar298._8_4_ = fVar252;
                  auVar298._12_4_ = fVar252;
                  local_a80._0_16_ = vfmadd132ps_fma(auVar298,auVar106,local_940._0_16_);
                  local_a00._0_16_ = vdpps_avx(local_a80._0_16_,local_a80._0_16_,0x7f);
                  auVar62._12_4_ = 0;
                  auVar62._0_12_ = ZEXT812(0);
                  fVar252 = local_a00._0_4_;
                  auVar106 = vrsqrt14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar252));
                  fVar254 = auVar106._0_4_;
                  local_a20._0_16_ = vrcp14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar252));
                  auVar35._8_4_ = 0x80000000;
                  auVar35._0_8_ = 0x8000000080000000;
                  auVar35._12_4_ = 0x80000000;
                  auVar107 = vxorps_avx512vl(local_a00._0_16_,auVar35);
                  auVar106 = vfnmadd213ss_fma(local_a20._0_16_,local_a00._0_16_,
                                              SUB6416(ZEXT464(0x40000000),0));
                  local_a40._0_4_ = auVar106._0_4_;
                  local_aa0._0_4_ = auVar103._0_4_;
                  if (fVar252 < auVar107._0_4_) {
                    fVar255 = sqrtf(fVar252);
                    auVar103 = ZEXT416((uint)local_aa0._0_4_);
                    auVar106 = local_a80._0_16_;
                  }
                  else {
                    auVar106 = vsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
                    fVar255 = auVar106._0_4_;
                    auVar106 = local_a80._0_16_;
                  }
                  fVar252 = fVar254 * 1.5 + fVar252 * -0.5 * fVar254 * fVar254 * fVar254;
                  auVar176._0_4_ = auVar106._0_4_ * fVar252;
                  auVar176._4_4_ = auVar106._4_4_ * fVar252;
                  auVar176._8_4_ = auVar106._8_4_ * fVar252;
                  auVar176._12_4_ = auVar106._12_4_ * fVar252;
                  auVar107 = vdpps_avx(auVar24,auVar176,0x7f);
                  fVar257 = auVar103._0_4_;
                  fVar254 = auVar107._0_4_;
                  auVar177._0_4_ = fVar254 * fVar254;
                  auVar177._4_4_ = auVar107._4_4_ * auVar107._4_4_;
                  auVar177._8_4_ = auVar107._8_4_ * auVar107._8_4_;
                  auVar177._12_4_ = auVar107._12_4_ * auVar107._12_4_;
                  auVar108 = vsubps_avx512vl(auVar104,auVar177);
                  fVar256 = auVar108._0_4_;
                  auVar197._4_12_ = ZEXT812(0) << 0x20;
                  auVar197._0_4_ = fVar256;
                  auVar109 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
                  auVar110 = vmulss_avx512f(auVar108,ZEXT416(0xbf000000));
                  if (fVar256 < 0.0) {
                    local_8f0 = fVar252;
                    fStack_8ec = fVar252;
                    fStack_8e8 = fVar252;
                    fStack_8e4 = fVar252;
                    local_8e0 = auVar109;
                    fVar256 = sqrtf(fVar256);
                    auVar110 = ZEXT416(auVar110._0_4_);
                    auVar103 = ZEXT416((uint)local_aa0._0_4_);
                    auVar108 = local_8e0;
                    auVar106 = local_a80._0_16_;
                    fVar252 = local_8f0;
                    fVar258 = fStack_8ec;
                    fVar265 = fStack_8e8;
                    fVar266 = fStack_8e4;
                  }
                  else {
                    auVar108 = vsqrtss_avx(auVar108,auVar108);
                    fVar256 = auVar108._0_4_;
                    auVar108 = auVar109;
                    fVar258 = fVar252;
                    fVar265 = fVar252;
                    fVar266 = fVar252;
                  }
                  auVar295 = ZEXT1664(auVar24);
                  auVar304 = ZEXT3264(local_ac0);
                  auVar305 = ZEXT3264(local_ae0);
                  auVar306 = ZEXT3264(local_b00);
                  auVar307 = ZEXT3264(local_b20);
                  auVar308 = ZEXT3264(local_b40);
                  auVar309 = ZEXT3264(local_b60);
                  auVar190 = ZEXT3264(local_a60);
                  auVar198._0_4_ = (float)local_8a0._0_4_ * (float)local_9a0._0_4_;
                  auVar198._4_4_ = (float)local_8a0._0_4_ * (float)local_9a0._4_4_;
                  auVar198._8_4_ = (float)local_8a0._0_4_ * fStack_998;
                  auVar198._12_4_ = (float)local_8a0._0_4_ * fStack_994;
                  auVar222._4_4_ = local_880._0_4_;
                  auVar222._0_4_ = local_880._0_4_;
                  auVar222._8_4_ = local_880._0_4_;
                  auVar222._12_4_ = local_880._0_4_;
                  auVar31 = vfmadd132ps_fma(auVar222,auVar198,local_960._0_16_);
                  auVar199._4_4_ = local_860._0_4_;
                  auVar199._0_4_ = local_860._0_4_;
                  auVar199._8_4_ = local_860._0_4_;
                  auVar199._12_4_ = local_860._0_4_;
                  auVar31 = vfmadd132ps_fma(auVar199,auVar31,local_980._0_16_);
                  auVar105 = vfmadd213ss_fma(auVar105,SUB6416(ZEXT464(0xc0400000),0),
                                             ZEXT416(0x40000000));
                  uVar192 = auVar105._0_4_;
                  auVar223._4_4_ = uVar192;
                  auVar223._0_4_ = uVar192;
                  auVar223._8_4_ = uVar192;
                  auVar223._12_4_ = uVar192;
                  auVar105 = vfmadd132ps_fma(auVar223,auVar31,local_940._0_16_);
                  auVar200._0_4_ = auVar105._0_4_ * (float)local_a00._0_4_;
                  auVar200._4_4_ = auVar105._4_4_ * (float)local_a00._0_4_;
                  auVar200._8_4_ = auVar105._8_4_ * (float)local_a00._0_4_;
                  auVar200._12_4_ = auVar105._12_4_ * (float)local_a00._0_4_;
                  auVar105 = vdpps_avx(auVar106,auVar105,0x7f);
                  fVar267 = auVar105._0_4_;
                  auVar224._0_4_ = auVar106._0_4_ * fVar267;
                  auVar224._4_4_ = auVar106._4_4_ * fVar267;
                  auVar224._8_4_ = auVar106._8_4_ * fVar267;
                  auVar224._12_4_ = auVar106._12_4_ * fVar267;
                  auVar105 = vsubps_avx(auVar200,auVar224);
                  fVar267 = (float)local_a40._0_4_ * (float)local_a20._0_4_;
                  auVar31 = vmaxss_avx(ZEXT416((uint)fVar191),
                                       ZEXT416((uint)(local_7c0._0_4_ * fVar234 * 1.9073486e-06)));
                  auVar36._8_4_ = 0x80000000;
                  auVar36._0_8_ = 0x8000000080000000;
                  auVar36._12_4_ = 0x80000000;
                  auVar160._16_48_ = local_7c0._16_48_;
                  auVar111 = vxorps_avx512vl(auVar106,auVar36);
                  auVar201._0_4_ = fVar252 * auVar105._0_4_ * fVar267;
                  auVar201._4_4_ = fVar258 * auVar105._4_4_ * fVar267;
                  auVar201._8_4_ = fVar265 * auVar105._8_4_ * fVar267;
                  auVar201._12_4_ = fVar266 * auVar105._12_4_ * fVar267;
                  auVar297 = ZEXT1664(auVar176);
                  auVar105 = vdpps_avx(auVar111,auVar176,0x7f);
                  auVar32 = vfmadd213ss_fma(auVar103,ZEXT416((uint)fVar191),auVar31);
                  auVar103 = vdpps_avx(auVar24,auVar201,0x7f);
                  auVar32 = vfmadd213ss_fma(ZEXT416((uint)(fVar257 + 1.0)),
                                            ZEXT416((uint)(fVar191 / fVar255)),auVar32);
                  fVar252 = auVar105._0_4_ + auVar103._0_4_;
                  auVar105 = vdpps_avx(local_9d0,auVar176,0x7f);
                  auVar103 = vdpps_avx(auVar24,auVar111,0x7f);
                  auVar110 = vmulss_avx512f(auVar110,auVar108);
                  fVar255 = auVar109._0_4_ * 1.5 + auVar110._0_4_ * auVar108._0_4_ * auVar108._0_4_;
                  auVar108 = vdpps_avx(auVar24,local_9d0,0x7f);
                  auVar110 = vfnmadd231ss_fma(auVar103,auVar107,ZEXT416((uint)fVar252));
                  auVar108 = vfnmadd231ss_fma(auVar108,auVar107,auVar105);
                  auVar103 = vpermilps_avx(_local_840,0xff);
                  fVar256 = fVar256 - auVar103._0_4_;
                  auVar109 = vshufps_avx(auVar106,auVar106,0xff);
                  auVar103 = vfmsub213ss_fma(auVar110,ZEXT416((uint)fVar255),auVar109);
                  auVar282._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
                  auVar282._8_4_ = auVar103._8_4_ ^ 0x80000000;
                  auVar282._12_4_ = auVar103._12_4_ ^ 0x80000000;
                  auVar285 = ZEXT1664(auVar282);
                  auVar108 = ZEXT416((uint)(auVar108._0_4_ * fVar255));
                  auVar110 = vfmsub231ss_fma(ZEXT416((uint)(auVar105._0_4_ * auVar103._0_4_)),
                                             ZEXT416((uint)fVar252),auVar108);
                  auVar103 = vinsertps_avx(auVar282,auVar108,0x1c);
                  auVar272._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
                  auVar272._8_4_ = auVar105._8_4_ ^ 0x80000000;
                  auVar272._12_4_ = auVar105._12_4_ ^ 0x80000000;
                  auVar108 = vinsertps_avx(ZEXT416((uint)fVar252),auVar272,0x10);
                  auVar241._0_4_ = auVar110._0_4_;
                  auVar241._4_4_ = auVar241._0_4_;
                  auVar241._8_4_ = auVar241._0_4_;
                  auVar241._12_4_ = auVar241._0_4_;
                  auVar105 = vdivps_avx(auVar103,auVar241);
                  auVar103 = vdivps_avx(auVar108,auVar241);
                  auVar242._0_4_ = fVar254 * auVar105._0_4_ + fVar256 * auVar103._0_4_;
                  auVar242._4_4_ = fVar254 * auVar105._4_4_ + fVar256 * auVar103._4_4_;
                  auVar242._8_4_ = fVar254 * auVar105._8_4_ + fVar256 * auVar103._8_4_;
                  auVar242._12_4_ = fVar254 * auVar105._12_4_ + fVar256 * auVar103._12_4_;
                  auVar105 = vsubps_avx(local_7c0._0_16_,auVar242);
                  auVar159 = ZEXT1664(auVar105);
                  auVar37._8_4_ = 0x7fffffff;
                  auVar37._0_8_ = 0x7fffffff7fffffff;
                  auVar37._12_4_ = 0x7fffffff;
                  auVar103 = vandps_avx512vl(auVar107,auVar37);
                  auVar153 = local_7c0._32_32_;
                  if (auVar103._0_4_ < auVar32._0_4_) {
                    auVar103 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ + auVar31._0_4_)),
                                               local_900,ZEXT416(0x36000000));
                    auVar38._8_4_ = 0x7fffffff;
                    auVar38._0_8_ = 0x7fffffff7fffffff;
                    auVar38._12_4_ = 0x7fffffff;
                    auVar107 = vandps_avx512vl(ZEXT416((uint)fVar256),auVar38);
                    if (auVar107._0_4_ < auVar103._0_4_) {
                      fVar234 = auVar105._0_4_ + (float)local_910._0_4_;
                      if ((fVar234 < fVar170) ||
                         (fVar252 = *(float *)(ray + k * 4 + 0x200), fVar252 < fVar234)) break;
                      auVar105 = vmovshdup_avx(auVar105);
                      fVar254 = auVar105._0_4_;
                      if ((fVar254 < 0.0) || (1.0 < fVar254)) break;
                      auVar63._12_4_ = 0;
                      auVar63._0_12_ = ZEXT412(0);
                      auVar160._4_12_ = ZEXT412(0);
                      auVar160._0_4_ = fVar253;
                      auVar105 = vrsqrt14ss_avx512f(auVar63 << 0x20,auVar160._0_16_);
                      fVar253 = auVar105._0_4_;
                      auVar104 = vmulss_avx512f(auVar104,ZEXT416(0xbf000000));
                      pGVar4 = (context->scene->geometries).items[uVar87].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                      fVar253 = fVar253 * 1.5 + auVar104._0_4_ * fVar253 * fVar253 * fVar253;
                      auVar243._0_4_ = auVar24._0_4_ * fVar253;
                      auVar243._4_4_ = auVar24._4_4_ * fVar253;
                      auVar243._8_4_ = auVar24._8_4_ * fVar253;
                      auVar243._12_4_ = auVar24._12_4_ * fVar253;
                      auVar103 = vfmadd213ps_fma(auVar109,auVar243,auVar106);
                      auVar104 = vshufps_avx(auVar243,auVar243,0xc9);
                      auVar105 = vshufps_avx(auVar106,auVar106,0xc9);
                      auVar244._0_4_ = auVar243._0_4_ * auVar105._0_4_;
                      auVar244._4_4_ = auVar243._4_4_ * auVar105._4_4_;
                      auVar244._8_4_ = auVar243._8_4_ * auVar105._8_4_;
                      auVar244._12_4_ = auVar243._12_4_ * auVar105._12_4_;
                      auVar106 = vfmsub231ps_fma(auVar244,auVar106,auVar104);
                      auVar104 = vshufps_avx(auVar106,auVar106,0xc9);
                      auVar105 = vshufps_avx(auVar103,auVar103,0xc9);
                      auVar106 = vshufps_avx(auVar106,auVar106,0xd2);
                      auVar202._0_4_ = auVar103._0_4_ * auVar106._0_4_;
                      auVar202._4_4_ = auVar103._4_4_ * auVar106._4_4_;
                      auVar202._8_4_ = auVar103._8_4_ * auVar106._8_4_;
                      auVar202._12_4_ = auVar103._12_4_ * auVar106._12_4_;
                      auVar104 = vfmsub231ps_fma(auVar202,auVar104,auVar105);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar234;
                        uVar192 = vextractps_avx(auVar104,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar192;
                        uVar192 = vextractps_avx(auVar104,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar192;
                        *(int *)(ray + k * 4 + 0x380) = auVar104._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar254;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(uint *)(ray + k * 4 + 0x440) = uVar3;
                        *(uint *)(ray + k * 4 + 0x480) = uVar87;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                        break;
                      }
                      pRVar8 = context->user;
                      auVar215 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar215,auVar159);
                      auVar159 = vpermps_avx512f(auVar215,ZEXT1664(auVar104));
                      auVar215 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar215,ZEXT1664(auVar104));
                      local_380 = vbroadcastss_avx512f(auVar104);
                      local_400[0] = (RTCHitN)auVar159[0];
                      local_400[1] = (RTCHitN)auVar159[1];
                      local_400[2] = (RTCHitN)auVar159[2];
                      local_400[3] = (RTCHitN)auVar159[3];
                      local_400[4] = (RTCHitN)auVar159[4];
                      local_400[5] = (RTCHitN)auVar159[5];
                      local_400[6] = (RTCHitN)auVar159[6];
                      local_400[7] = (RTCHitN)auVar159[7];
                      local_400[8] = (RTCHitN)auVar159[8];
                      local_400[9] = (RTCHitN)auVar159[9];
                      local_400[10] = (RTCHitN)auVar159[10];
                      local_400[0xb] = (RTCHitN)auVar159[0xb];
                      local_400[0xc] = (RTCHitN)auVar159[0xc];
                      local_400[0xd] = (RTCHitN)auVar159[0xd];
                      local_400[0xe] = (RTCHitN)auVar159[0xe];
                      local_400[0xf] = (RTCHitN)auVar159[0xf];
                      local_400[0x10] = (RTCHitN)auVar159[0x10];
                      local_400[0x11] = (RTCHitN)auVar159[0x11];
                      local_400[0x12] = (RTCHitN)auVar159[0x12];
                      local_400[0x13] = (RTCHitN)auVar159[0x13];
                      local_400[0x14] = (RTCHitN)auVar159[0x14];
                      local_400[0x15] = (RTCHitN)auVar159[0x15];
                      local_400[0x16] = (RTCHitN)auVar159[0x16];
                      local_400[0x17] = (RTCHitN)auVar159[0x17];
                      local_400[0x18] = (RTCHitN)auVar159[0x18];
                      local_400[0x19] = (RTCHitN)auVar159[0x19];
                      local_400[0x1a] = (RTCHitN)auVar159[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar159[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar159[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar159[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar159[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar159[0x1f];
                      local_400[0x20] = (RTCHitN)auVar159[0x20];
                      local_400[0x21] = (RTCHitN)auVar159[0x21];
                      local_400[0x22] = (RTCHitN)auVar159[0x22];
                      local_400[0x23] = (RTCHitN)auVar159[0x23];
                      local_400[0x24] = (RTCHitN)auVar159[0x24];
                      local_400[0x25] = (RTCHitN)auVar159[0x25];
                      local_400[0x26] = (RTCHitN)auVar159[0x26];
                      local_400[0x27] = (RTCHitN)auVar159[0x27];
                      local_400[0x28] = (RTCHitN)auVar159[0x28];
                      local_400[0x29] = (RTCHitN)auVar159[0x29];
                      local_400[0x2a] = (RTCHitN)auVar159[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar159[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar159[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar159[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar159[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar159[0x2f];
                      local_400[0x30] = (RTCHitN)auVar159[0x30];
                      local_400[0x31] = (RTCHitN)auVar159[0x31];
                      local_400[0x32] = (RTCHitN)auVar159[0x32];
                      local_400[0x33] = (RTCHitN)auVar159[0x33];
                      local_400[0x34] = (RTCHitN)auVar159[0x34];
                      local_400[0x35] = (RTCHitN)auVar159[0x35];
                      local_400[0x36] = (RTCHitN)auVar159[0x36];
                      local_400[0x37] = (RTCHitN)auVar159[0x37];
                      local_400[0x38] = (RTCHitN)auVar159[0x38];
                      local_400[0x39] = (RTCHitN)auVar159[0x39];
                      local_400[0x3a] = (RTCHitN)auVar159[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar159[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar159[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar159[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar159[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar159[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar159 = vmovdqa64_avx512f(local_440);
                      local_280 = vmovdqa64_avx512f(auVar159);
                      auVar153 = vpcmpeqd_avx2(auVar159._0_32_,auVar159._0_32_);
                      local_a28[3] = auVar153;
                      local_a28[2] = auVar153;
                      local_a28[1] = auVar153;
                      *local_a28 = auVar153;
                      local_240 = vbroadcastss_avx512f(ZEXT416(pRVar8->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(pRVar8->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar234;
                      auVar159 = vmovdqa64_avx512f(local_4c0);
                      local_780 = vmovdqa64_avx512f(auVar159);
                      local_b90.valid = (int *)local_780;
                      local_b90.geometryUserPtr = pGVar4->userPtr;
                      local_b90.context = context->user;
                      local_b90.hit = local_400;
                      local_b90.N = 0x10;
                      local_b90.ray = (RTCRayN *)ray;
                      if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar285 = ZEXT1664(auVar282);
                        auVar295 = ZEXT1664(auVar24);
                        auVar297 = ZEXT1664(auVar176);
                        (*pGVar4->intersectionFilterN)(&local_b90);
                        auVar190 = ZEXT3264(local_a60);
                        auVar309 = ZEXT3264(local_b60);
                        auVar308 = ZEXT3264(local_b40);
                        auVar307 = ZEXT3264(local_b20);
                        auVar306 = ZEXT3264(local_b00);
                        auVar305 = ZEXT3264(local_ae0);
                        auVar304 = ZEXT3264(local_ac0);
                        auVar159 = vmovdqa64_avx512f(local_780);
                      }
                      auVar153 = auVar159._32_32_;
                      uVar25 = vptestmd_avx512f(auVar159,auVar159);
                      if ((short)uVar25 != 0) {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar285 = ZEXT1664(auVar285._0_16_);
                          auVar295 = ZEXT1664(auVar295._0_16_);
                          auVar297 = ZEXT1664(auVar297._0_16_);
                          (*p_Var9)(&local_b90);
                          auVar190 = ZEXT3264(local_a60);
                          auVar309 = ZEXT3264(local_b60);
                          auVar308 = ZEXT3264(local_b40);
                          auVar307 = ZEXT3264(local_b20);
                          auVar306 = ZEXT3264(local_b00);
                          auVar305 = ZEXT3264(local_ae0);
                          auVar304 = ZEXT3264(local_ac0);
                          auVar159 = vmovdqa64_avx512f(local_780);
                          auVar153 = auVar159._32_32_;
                        }
                        uVar95 = vptestmd_avx512f(auVar159,auVar159);
                        if ((short)uVar95 != 0) {
                          iVar66 = *(int *)(local_b90.hit + 4);
                          iVar67 = *(int *)(local_b90.hit + 8);
                          iVar68 = *(int *)(local_b90.hit + 0xc);
                          iVar69 = *(int *)(local_b90.hit + 0x10);
                          iVar70 = *(int *)(local_b90.hit + 0x14);
                          iVar71 = *(int *)(local_b90.hit + 0x18);
                          iVar72 = *(int *)(local_b90.hit + 0x1c);
                          iVar73 = *(int *)(local_b90.hit + 0x20);
                          iVar74 = *(int *)(local_b90.hit + 0x24);
                          iVar75 = *(int *)(local_b90.hit + 0x28);
                          iVar76 = *(int *)(local_b90.hit + 0x2c);
                          iVar77 = *(int *)(local_b90.hit + 0x30);
                          iVar78 = *(int *)(local_b90.hit + 0x34);
                          iVar79 = *(int *)(local_b90.hit + 0x38);
                          iVar80 = *(int *)(local_b90.hit + 0x3c);
                          bVar86 = (byte)uVar95;
                          bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar95 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar95 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar95 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar95 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar95 >> 7) & 1);
                          bVar85 = (byte)(uVar95 >> 8);
                          bVar17 = (bool)((byte)(uVar95 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar95 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar95 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar95 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar95 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar95 >> 0xe) & 1);
                          bVar23 = SUB81(uVar95 >> 0xf,0);
                          *(uint *)(local_b90.ray + 0x300) =
                               (uint)(bVar86 & 1) * *(int *)local_b90.hit |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_b90.ray + 0x300);
                          *(uint *)(local_b90.ray + 0x304) =
                               (uint)bVar10 * iVar66 |
                               (uint)!bVar10 * *(int *)(local_b90.ray + 0x304);
                          *(uint *)(local_b90.ray + 0x308) =
                               (uint)bVar11 * iVar67 |
                               (uint)!bVar11 * *(int *)(local_b90.ray + 0x308);
                          *(uint *)(local_b90.ray + 0x30c) =
                               (uint)bVar12 * iVar68 |
                               (uint)!bVar12 * *(int *)(local_b90.ray + 0x30c);
                          *(uint *)(local_b90.ray + 0x310) =
                               (uint)bVar13 * iVar69 |
                               (uint)!bVar13 * *(int *)(local_b90.ray + 0x310);
                          *(uint *)(local_b90.ray + 0x314) =
                               (uint)bVar14 * iVar70 |
                               (uint)!bVar14 * *(int *)(local_b90.ray + 0x314);
                          *(uint *)(local_b90.ray + 0x318) =
                               (uint)bVar15 * iVar71 |
                               (uint)!bVar15 * *(int *)(local_b90.ray + 0x318);
                          *(uint *)(local_b90.ray + 0x31c) =
                               (uint)bVar16 * iVar72 |
                               (uint)!bVar16 * *(int *)(local_b90.ray + 0x31c);
                          *(uint *)(local_b90.ray + 800) =
                               (uint)(bVar85 & 1) * iVar73 |
                               (uint)!(bool)(bVar85 & 1) * *(int *)(local_b90.ray + 800);
                          *(uint *)(local_b90.ray + 0x324) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_b90.ray + 0x324);
                          *(uint *)(local_b90.ray + 0x328) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_b90.ray + 0x328);
                          *(uint *)(local_b90.ray + 0x32c) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_b90.ray + 0x32c);
                          *(uint *)(local_b90.ray + 0x330) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_b90.ray + 0x330);
                          *(uint *)(local_b90.ray + 0x334) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_b90.ray + 0x334);
                          *(uint *)(local_b90.ray + 0x338) =
                               (uint)bVar22 * iVar79 |
                               (uint)!bVar22 * *(int *)(local_b90.ray + 0x338);
                          *(uint *)(local_b90.ray + 0x33c) =
                               (uint)bVar23 * iVar80 |
                               (uint)!bVar23 * *(int *)(local_b90.ray + 0x33c);
                          iVar66 = *(int *)(local_b90.hit + 0x44);
                          iVar67 = *(int *)(local_b90.hit + 0x48);
                          iVar68 = *(int *)(local_b90.hit + 0x4c);
                          iVar69 = *(int *)(local_b90.hit + 0x50);
                          iVar70 = *(int *)(local_b90.hit + 0x54);
                          iVar71 = *(int *)(local_b90.hit + 0x58);
                          iVar72 = *(int *)(local_b90.hit + 0x5c);
                          iVar73 = *(int *)(local_b90.hit + 0x60);
                          iVar74 = *(int *)(local_b90.hit + 100);
                          iVar75 = *(int *)(local_b90.hit + 0x68);
                          iVar76 = *(int *)(local_b90.hit + 0x6c);
                          iVar77 = *(int *)(local_b90.hit + 0x70);
                          iVar78 = *(int *)(local_b90.hit + 0x74);
                          iVar79 = *(int *)(local_b90.hit + 0x78);
                          iVar80 = *(int *)(local_b90.hit + 0x7c);
                          bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar95 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar95 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar95 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar95 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar95 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar95 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar95 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar95 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar95 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar95 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar95 >> 0xe) & 1);
                          bVar23 = SUB81(uVar95 >> 0xf,0);
                          *(uint *)(local_b90.ray + 0x340) =
                               (uint)(bVar86 & 1) * *(int *)(local_b90.hit + 0x40) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_b90.ray + 0x340);
                          *(uint *)(local_b90.ray + 0x344) =
                               (uint)bVar10 * iVar66 |
                               (uint)!bVar10 * *(int *)(local_b90.ray + 0x344);
                          *(uint *)(local_b90.ray + 0x348) =
                               (uint)bVar11 * iVar67 |
                               (uint)!bVar11 * *(int *)(local_b90.ray + 0x348);
                          *(uint *)(local_b90.ray + 0x34c) =
                               (uint)bVar12 * iVar68 |
                               (uint)!bVar12 * *(int *)(local_b90.ray + 0x34c);
                          *(uint *)(local_b90.ray + 0x350) =
                               (uint)bVar13 * iVar69 |
                               (uint)!bVar13 * *(int *)(local_b90.ray + 0x350);
                          *(uint *)(local_b90.ray + 0x354) =
                               (uint)bVar14 * iVar70 |
                               (uint)!bVar14 * *(int *)(local_b90.ray + 0x354);
                          *(uint *)(local_b90.ray + 0x358) =
                               (uint)bVar15 * iVar71 |
                               (uint)!bVar15 * *(int *)(local_b90.ray + 0x358);
                          *(uint *)(local_b90.ray + 0x35c) =
                               (uint)bVar16 * iVar72 |
                               (uint)!bVar16 * *(int *)(local_b90.ray + 0x35c);
                          *(uint *)(local_b90.ray + 0x360) =
                               (uint)(bVar85 & 1) * iVar73 |
                               (uint)!(bool)(bVar85 & 1) * *(int *)(local_b90.ray + 0x360);
                          *(uint *)(local_b90.ray + 0x364) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_b90.ray + 0x364);
                          *(uint *)(local_b90.ray + 0x368) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_b90.ray + 0x368);
                          *(uint *)(local_b90.ray + 0x36c) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_b90.ray + 0x36c);
                          *(uint *)(local_b90.ray + 0x370) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_b90.ray + 0x370);
                          *(uint *)(local_b90.ray + 0x374) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_b90.ray + 0x374);
                          *(uint *)(local_b90.ray + 0x378) =
                               (uint)bVar22 * iVar79 |
                               (uint)!bVar22 * *(int *)(local_b90.ray + 0x378);
                          *(uint *)(local_b90.ray + 0x37c) =
                               (uint)bVar23 * iVar80 |
                               (uint)!bVar23 * *(int *)(local_b90.ray + 0x37c);
                          iVar66 = *(int *)(local_b90.hit + 0x84);
                          iVar67 = *(int *)(local_b90.hit + 0x88);
                          iVar68 = *(int *)(local_b90.hit + 0x8c);
                          iVar69 = *(int *)(local_b90.hit + 0x90);
                          iVar70 = *(int *)(local_b90.hit + 0x94);
                          iVar71 = *(int *)(local_b90.hit + 0x98);
                          iVar72 = *(int *)(local_b90.hit + 0x9c);
                          iVar73 = *(int *)(local_b90.hit + 0xa0);
                          iVar74 = *(int *)(local_b90.hit + 0xa4);
                          iVar75 = *(int *)(local_b90.hit + 0xa8);
                          iVar76 = *(int *)(local_b90.hit + 0xac);
                          iVar77 = *(int *)(local_b90.hit + 0xb0);
                          iVar78 = *(int *)(local_b90.hit + 0xb4);
                          iVar79 = *(int *)(local_b90.hit + 0xb8);
                          iVar80 = *(int *)(local_b90.hit + 0xbc);
                          bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar95 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar95 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar95 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar95 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar95 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar95 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar95 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar95 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar95 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar95 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar95 >> 0xe) & 1);
                          bVar23 = SUB81(uVar95 >> 0xf,0);
                          *(uint *)(local_b90.ray + 0x380) =
                               (uint)(bVar86 & 1) * *(int *)(local_b90.hit + 0x80) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_b90.ray + 0x380);
                          *(uint *)(local_b90.ray + 900) =
                               (uint)bVar10 * iVar66 | (uint)!bVar10 * *(int *)(local_b90.ray + 900)
                          ;
                          *(uint *)(local_b90.ray + 0x388) =
                               (uint)bVar11 * iVar67 |
                               (uint)!bVar11 * *(int *)(local_b90.ray + 0x388);
                          *(uint *)(local_b90.ray + 0x38c) =
                               (uint)bVar12 * iVar68 |
                               (uint)!bVar12 * *(int *)(local_b90.ray + 0x38c);
                          *(uint *)(local_b90.ray + 0x390) =
                               (uint)bVar13 * iVar69 |
                               (uint)!bVar13 * *(int *)(local_b90.ray + 0x390);
                          *(uint *)(local_b90.ray + 0x394) =
                               (uint)bVar14 * iVar70 |
                               (uint)!bVar14 * *(int *)(local_b90.ray + 0x394);
                          *(uint *)(local_b90.ray + 0x398) =
                               (uint)bVar15 * iVar71 |
                               (uint)!bVar15 * *(int *)(local_b90.ray + 0x398);
                          *(uint *)(local_b90.ray + 0x39c) =
                               (uint)bVar16 * iVar72 |
                               (uint)!bVar16 * *(int *)(local_b90.ray + 0x39c);
                          *(uint *)(local_b90.ray + 0x3a0) =
                               (uint)(bVar85 & 1) * iVar73 |
                               (uint)!(bool)(bVar85 & 1) * *(int *)(local_b90.ray + 0x3a0);
                          *(uint *)(local_b90.ray + 0x3a4) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_b90.ray + 0x3a4);
                          *(uint *)(local_b90.ray + 0x3a8) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_b90.ray + 0x3a8);
                          *(uint *)(local_b90.ray + 0x3ac) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_b90.ray + 0x3ac);
                          *(uint *)(local_b90.ray + 0x3b0) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_b90.ray + 0x3b0);
                          *(uint *)(local_b90.ray + 0x3b4) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_b90.ray + 0x3b4);
                          *(uint *)(local_b90.ray + 0x3b8) =
                               (uint)bVar22 * iVar79 |
                               (uint)!bVar22 * *(int *)(local_b90.ray + 0x3b8);
                          *(uint *)(local_b90.ray + 0x3bc) =
                               (uint)bVar23 * iVar80 |
                               (uint)!bVar23 * *(int *)(local_b90.ray + 0x3bc);
                          iVar66 = *(int *)(local_b90.hit + 0xc4);
                          iVar67 = *(int *)(local_b90.hit + 200);
                          iVar68 = *(int *)(local_b90.hit + 0xcc);
                          iVar69 = *(int *)(local_b90.hit + 0xd0);
                          iVar70 = *(int *)(local_b90.hit + 0xd4);
                          iVar71 = *(int *)(local_b90.hit + 0xd8);
                          iVar72 = *(int *)(local_b90.hit + 0xdc);
                          iVar73 = *(int *)(local_b90.hit + 0xe0);
                          iVar74 = *(int *)(local_b90.hit + 0xe4);
                          iVar75 = *(int *)(local_b90.hit + 0xe8);
                          iVar76 = *(int *)(local_b90.hit + 0xec);
                          iVar77 = *(int *)(local_b90.hit + 0xf0);
                          iVar78 = *(int *)(local_b90.hit + 0xf4);
                          iVar79 = *(int *)(local_b90.hit + 0xf8);
                          iVar80 = *(int *)(local_b90.hit + 0xfc);
                          bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar95 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar95 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar95 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar95 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar95 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar95 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar95 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar95 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar95 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar95 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar95 >> 0xe) & 1);
                          bVar23 = SUB81(uVar95 >> 0xf,0);
                          *(uint *)(local_b90.ray + 0x3c0) =
                               (uint)(bVar86 & 1) * *(int *)(local_b90.hit + 0xc0) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_b90.ray + 0x3c0);
                          *(uint *)(local_b90.ray + 0x3c4) =
                               (uint)bVar10 * iVar66 |
                               (uint)!bVar10 * *(int *)(local_b90.ray + 0x3c4);
                          *(uint *)(local_b90.ray + 0x3c8) =
                               (uint)bVar11 * iVar67 |
                               (uint)!bVar11 * *(int *)(local_b90.ray + 0x3c8);
                          *(uint *)(local_b90.ray + 0x3cc) =
                               (uint)bVar12 * iVar68 |
                               (uint)!bVar12 * *(int *)(local_b90.ray + 0x3cc);
                          *(uint *)(local_b90.ray + 0x3d0) =
                               (uint)bVar13 * iVar69 |
                               (uint)!bVar13 * *(int *)(local_b90.ray + 0x3d0);
                          *(uint *)(local_b90.ray + 0x3d4) =
                               (uint)bVar14 * iVar70 |
                               (uint)!bVar14 * *(int *)(local_b90.ray + 0x3d4);
                          *(uint *)(local_b90.ray + 0x3d8) =
                               (uint)bVar15 * iVar71 |
                               (uint)!bVar15 * *(int *)(local_b90.ray + 0x3d8);
                          *(uint *)(local_b90.ray + 0x3dc) =
                               (uint)bVar16 * iVar72 |
                               (uint)!bVar16 * *(int *)(local_b90.ray + 0x3dc);
                          *(uint *)(local_b90.ray + 0x3e0) =
                               (uint)(bVar85 & 1) * iVar73 |
                               (uint)!(bool)(bVar85 & 1) * *(int *)(local_b90.ray + 0x3e0);
                          *(uint *)(local_b90.ray + 0x3e4) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_b90.ray + 0x3e4);
                          *(uint *)(local_b90.ray + 1000) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_b90.ray + 1000);
                          *(uint *)(local_b90.ray + 0x3ec) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_b90.ray + 0x3ec);
                          *(uint *)(local_b90.ray + 0x3f0) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_b90.ray + 0x3f0);
                          *(uint *)(local_b90.ray + 0x3f4) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_b90.ray + 0x3f4);
                          *(uint *)(local_b90.ray + 0x3f8) =
                               (uint)bVar22 * iVar79 |
                               (uint)!bVar22 * *(int *)(local_b90.ray + 0x3f8);
                          *(uint *)(local_b90.ray + 0x3fc) =
                               (uint)bVar23 * iVar80 |
                               (uint)!bVar23 * *(int *)(local_b90.ray + 0x3fc);
                          iVar66 = *(int *)(local_b90.hit + 0x104);
                          iVar67 = *(int *)(local_b90.hit + 0x108);
                          iVar68 = *(int *)(local_b90.hit + 0x10c);
                          iVar69 = *(int *)(local_b90.hit + 0x110);
                          iVar70 = *(int *)(local_b90.hit + 0x114);
                          iVar71 = *(int *)(local_b90.hit + 0x118);
                          iVar72 = *(int *)(local_b90.hit + 0x11c);
                          iVar73 = *(int *)(local_b90.hit + 0x120);
                          iVar74 = *(int *)(local_b90.hit + 0x124);
                          iVar75 = *(int *)(local_b90.hit + 0x128);
                          iVar76 = *(int *)(local_b90.hit + 300);
                          iVar77 = *(int *)(local_b90.hit + 0x130);
                          iVar78 = *(int *)(local_b90.hit + 0x134);
                          iVar79 = *(int *)(local_b90.hit + 0x138);
                          iVar80 = *(int *)(local_b90.hit + 0x13c);
                          bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar95 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar95 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar95 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar95 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar95 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar95 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar95 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar95 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar95 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar95 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar95 >> 0xe) & 1);
                          bVar23 = SUB81(uVar95 >> 0xf,0);
                          *(uint *)(local_b90.ray + 0x400) =
                               (uint)(bVar86 & 1) * *(int *)(local_b90.hit + 0x100) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_b90.ray + 0x400);
                          *(uint *)(local_b90.ray + 0x404) =
                               (uint)bVar10 * iVar66 |
                               (uint)!bVar10 * *(int *)(local_b90.ray + 0x404);
                          *(uint *)(local_b90.ray + 0x408) =
                               (uint)bVar11 * iVar67 |
                               (uint)!bVar11 * *(int *)(local_b90.ray + 0x408);
                          *(uint *)(local_b90.ray + 0x40c) =
                               (uint)bVar12 * iVar68 |
                               (uint)!bVar12 * *(int *)(local_b90.ray + 0x40c);
                          *(uint *)(local_b90.ray + 0x410) =
                               (uint)bVar13 * iVar69 |
                               (uint)!bVar13 * *(int *)(local_b90.ray + 0x410);
                          *(uint *)(local_b90.ray + 0x414) =
                               (uint)bVar14 * iVar70 |
                               (uint)!bVar14 * *(int *)(local_b90.ray + 0x414);
                          *(uint *)(local_b90.ray + 0x418) =
                               (uint)bVar15 * iVar71 |
                               (uint)!bVar15 * *(int *)(local_b90.ray + 0x418);
                          *(uint *)(local_b90.ray + 0x41c) =
                               (uint)bVar16 * iVar72 |
                               (uint)!bVar16 * *(int *)(local_b90.ray + 0x41c);
                          *(uint *)(local_b90.ray + 0x420) =
                               (uint)(bVar85 & 1) * iVar73 |
                               (uint)!(bool)(bVar85 & 1) * *(int *)(local_b90.ray + 0x420);
                          *(uint *)(local_b90.ray + 0x424) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_b90.ray + 0x424);
                          *(uint *)(local_b90.ray + 0x428) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_b90.ray + 0x428);
                          *(uint *)(local_b90.ray + 0x42c) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_b90.ray + 0x42c);
                          *(uint *)(local_b90.ray + 0x430) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_b90.ray + 0x430);
                          *(uint *)(local_b90.ray + 0x434) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_b90.ray + 0x434);
                          *(uint *)(local_b90.ray + 0x438) =
                               (uint)bVar22 * iVar79 |
                               (uint)!bVar22 * *(int *)(local_b90.ray + 0x438);
                          *(uint *)(local_b90.ray + 0x43c) =
                               (uint)bVar23 * iVar80 |
                               (uint)!bVar23 * *(int *)(local_b90.ray + 0x43c);
                          auVar159 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x140)
                                                      );
                          auVar159 = vmovdqu32_avx512f(auVar159);
                          *(undefined1 (*) [64])(local_b90.ray + 0x440) = auVar159;
                          auVar159 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x180)
                                                      );
                          auVar159 = vmovdqu32_avx512f(auVar159);
                          *(undefined1 (*) [64])(local_b90.ray + 0x480) = auVar159;
                          auVar215 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x1c0)
                                                      );
                          auVar159 = vmovdqa32_avx512f(auVar215);
                          *(undefined1 (*) [64])(local_b90.ray + 0x4c0) = auVar159;
                          auVar159 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x200)
                                                      );
                          bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
                          auVar60._4_56_ = auVar159._8_56_;
                          auVar60._0_4_ =
                               (uint)bVar10 * auVar159._4_4_ | (uint)!bVar10 * auVar215._4_4_;
                          auVar161._0_8_ = auVar60._0_8_ << 0x20;
                          bVar10 = (bool)((byte)(uVar95 >> 2) & 1);
                          auVar161._8_4_ =
                               (uint)bVar10 * auVar159._8_4_ | (uint)!bVar10 * auVar215._8_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
                          auVar161._12_4_ =
                               (uint)bVar10 * auVar159._12_4_ | (uint)!bVar10 * auVar215._12_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 4) & 1);
                          auVar161._16_4_ =
                               (uint)bVar10 * auVar159._16_4_ | (uint)!bVar10 * auVar215._16_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 5) & 1);
                          auVar161._20_4_ =
                               (uint)bVar10 * auVar159._20_4_ | (uint)!bVar10 * auVar215._20_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 6) & 1);
                          auVar161._24_4_ =
                               (uint)bVar10 * auVar159._24_4_ | (uint)!bVar10 * auVar215._24_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 7) & 1);
                          auVar161._28_4_ =
                               (uint)bVar10 * auVar159._28_4_ | (uint)!bVar10 * auVar215._28_4_;
                          auVar161._32_4_ =
                               (uint)(bVar85 & 1) * auVar159._32_4_ |
                               (uint)!(bool)(bVar85 & 1) * auVar215._32_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 9) & 1);
                          auVar161._36_4_ =
                               (uint)bVar10 * auVar159._36_4_ | (uint)!bVar10 * auVar215._36_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 10) & 1);
                          auVar161._40_4_ =
                               (uint)bVar10 * auVar159._40_4_ | (uint)!bVar10 * auVar215._40_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 0xb) & 1);
                          auVar161._44_4_ =
                               (uint)bVar10 * auVar159._44_4_ | (uint)!bVar10 * auVar215._44_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 0xc) & 1);
                          auVar161._48_4_ =
                               (uint)bVar10 * auVar159._48_4_ | (uint)!bVar10 * auVar215._48_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 0xd) & 1);
                          auVar161._52_4_ =
                               (uint)bVar10 * auVar159._52_4_ | (uint)!bVar10 * auVar215._52_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 0xe) & 1);
                          auVar161._56_4_ =
                               (uint)bVar10 * auVar159._56_4_ | (uint)!bVar10 * auVar215._56_4_;
                          bVar10 = SUB81(uVar95 >> 0xf,0);
                          auVar161._60_4_ =
                               (uint)bVar10 * auVar159._60_4_ | (uint)!bVar10 * auVar215._60_4_;
                          auVar153 = auVar161._32_32_;
                          auVar159 = vmovdqa32_avx512f(auVar159);
                          *(undefined1 (*) [64])(local_b90.ray + 0x500) = auVar159;
                          break;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar252;
                      break;
                    }
                  }
                  lVar94 = lVar94 + -1;
                } while (lVar94 != 0);
                uVar192 = *(undefined4 *)(ray + k * 4 + 0x200);
                auVar187._4_4_ = uVar192;
                auVar187._0_4_ = uVar192;
                auVar187._8_4_ = uVar192;
                auVar187._12_4_ = uVar192;
                auVar187._16_4_ = uVar192;
                auVar187._20_4_ = uVar192;
                auVar187._24_4_ = uVar192;
                auVar187._28_4_ = uVar192;
                auVar81._4_4_ = fStack_71c;
                auVar81._0_4_ = local_720;
                auVar81._8_4_ = fStack_718;
                auVar81._12_4_ = fStack_714;
                auVar81._16_4_ = fStack_710;
                auVar81._20_4_ = fStack_70c;
                auVar81._24_4_ = fStack_708;
                auVar81._28_4_ = fStack_704;
                uVar25 = vcmpps_avx512vl(auVar187,auVar81,0xd);
                bVar93 = ~('\x01' << ((byte)iVar29 & 0x1f)) & bVar93 & (byte)uVar25;
              } while (bVar93 != 0);
              auVar116 = local_680;
            }
            bVar88 = local_740[0] | ~bVar88;
            auVar211._0_4_ = (float)local_9c0._0_4_ + auVar116._0_4_;
            auVar211._4_4_ = (float)local_9c0._4_4_ + auVar116._4_4_;
            auVar211._8_4_ = fStack_9b8 + auVar116._8_4_;
            auVar211._12_4_ = fStack_9b4 + auVar116._12_4_;
            auVar211._16_4_ = fStack_9b0 + auVar116._16_4_;
            auVar211._20_4_ = fStack_9ac + auVar116._20_4_;
            auVar211._24_4_ = fStack_9a8 + auVar116._24_4_;
            auVar211._28_4_ = fStack_9a4 + auVar116._28_4_;
            uVar25 = vcmpps_avx512vl(auVar211,auVar187,2);
            bVar84 = (byte)uVar27 & bVar84 & (byte)uVar25;
            auVar212._8_4_ = 2;
            auVar212._0_8_ = 0x200000002;
            auVar212._12_4_ = 2;
            auVar212._16_4_ = 2;
            auVar212._20_4_ = 2;
            auVar212._24_4_ = 2;
            auVar212._28_4_ = 2;
            auVar46._8_4_ = 3;
            auVar46._0_8_ = 0x300000003;
            auVar46._12_4_ = 3;
            auVar46._16_4_ = 3;
            auVar46._20_4_ = 3;
            auVar46._24_4_ = 3;
            auVar46._28_4_ = 3;
            auVar116 = vpblendmd_avx512vl(auVar212,auVar46);
            auVar155._0_4_ = (uint)(bVar88 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar88 & 1) * 2;
            bVar10 = (bool)(bVar88 >> 1 & 1);
            auVar155._4_4_ = (uint)bVar10 * auVar116._4_4_ | (uint)!bVar10 * 2;
            bVar10 = (bool)(bVar88 >> 2 & 1);
            auVar155._8_4_ = (uint)bVar10 * auVar116._8_4_ | (uint)!bVar10 * 2;
            bVar10 = (bool)(bVar88 >> 3 & 1);
            auVar155._12_4_ = (uint)bVar10 * auVar116._12_4_ | (uint)!bVar10 * 2;
            bVar10 = (bool)(bVar88 >> 4 & 1);
            auVar155._16_4_ = (uint)bVar10 * auVar116._16_4_ | (uint)!bVar10 * 2;
            bVar10 = (bool)(bVar88 >> 5 & 1);
            auVar155._20_4_ = (uint)bVar10 * auVar116._20_4_ | (uint)!bVar10 * 2;
            bVar10 = (bool)(bVar88 >> 6 & 1);
            auVar155._24_4_ = (uint)bVar10 * auVar116._24_4_ | (uint)!bVar10 * 2;
            auVar155._28_4_ = (uint)(bVar88 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar88 >> 7) * 2
            ;
            auVar159._32_32_ = auVar153;
            auVar159._0_32_ = auVar155;
            uVar25 = vpcmpd_avx512vl(local_6e0,auVar155,5);
            bVar88 = (byte)uVar25 & bVar84;
            fVar191 = (float)local_9c0._0_4_;
            fVar234 = (float)local_9c0._4_4_;
            fVar252 = fStack_9b8;
            fVar253 = fStack_9b4;
            fVar254 = fStack_9b0;
            fVar255 = fStack_9ac;
            fVar256 = fStack_9a8;
            fVar257 = fStack_9a4;
            if (bVar88 != 0) {
              auVar105 = vminps_avx(local_940._0_16_,local_980._0_16_);
              auVar104 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
              auVar24 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar106 = vminps_avx(auVar105,auVar24);
              auVar105 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar24 = vmaxps_avx(auVar104,auVar105);
              auVar225._8_4_ = 0x7fffffff;
              auVar225._0_8_ = 0x7fffffff7fffffff;
              auVar225._12_4_ = 0x7fffffff;
              auVar104 = vandps_avx(auVar106,auVar225);
              auVar105 = vandps_avx(auVar24,auVar225);
              auVar104 = vmaxps_avx(auVar104,auVar105);
              auVar105 = vmovshdup_avx(auVar104);
              auVar105 = vmaxss_avx(auVar105,auVar104);
              auVar104 = vshufpd_avx(auVar104,auVar104,1);
              auVar104 = vmaxss_avx(auVar104,auVar105);
              fVar191 = auVar104._0_4_ * 1.9073486e-06;
              local_900 = vshufps_avx(auVar24,auVar24,0xff);
              local_720 = (float)local_9c0._0_4_ + local_6c0._0_4_;
              fStack_71c = (float)local_9c0._4_4_ + local_6c0._4_4_;
              fStack_718 = fStack_9b8 + local_6c0._8_4_;
              fStack_714 = fStack_9b4 + local_6c0._12_4_;
              fStack_710 = fStack_9b0 + local_6c0._16_4_;
              fStack_70c = fStack_9ac + local_6c0._20_4_;
              fStack_708 = fStack_9a8 + local_6c0._24_4_;
              fStack_704 = fStack_9a4 + local_6c0._28_4_;
              _local_8c0 = local_6c0;
              local_740 = auVar155;
              do {
                auVar188._8_4_ = 0x7f800000;
                auVar188._0_8_ = 0x7f8000007f800000;
                auVar188._12_4_ = 0x7f800000;
                auVar188._16_4_ = 0x7f800000;
                auVar188._20_4_ = 0x7f800000;
                auVar188._24_4_ = 0x7f800000;
                auVar188._28_4_ = 0x7f800000;
                auVar153 = vblendmps_avx512vl(auVar188,_local_8c0);
                auVar156._0_4_ =
                     (uint)(bVar88 & 1) * auVar153._0_4_ | (uint)!(bool)(bVar88 & 1) * 0x7f800000;
                bVar10 = (bool)(bVar88 >> 1 & 1);
                auVar156._4_4_ = (uint)bVar10 * auVar153._4_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(bVar88 >> 2 & 1);
                auVar156._8_4_ = (uint)bVar10 * auVar153._8_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(bVar88 >> 3 & 1);
                auVar156._12_4_ = (uint)bVar10 * auVar153._12_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(bVar88 >> 4 & 1);
                auVar156._16_4_ = (uint)bVar10 * auVar153._16_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(bVar88 >> 5 & 1);
                auVar156._20_4_ = (uint)bVar10 * auVar153._20_4_ | (uint)!bVar10 * 0x7f800000;
                auVar156._24_4_ =
                     (uint)(bVar88 >> 6) * auVar153._24_4_ | (uint)!(bool)(bVar88 >> 6) * 0x7f800000
                ;
                auVar156._28_4_ = 0x7f800000;
                auVar153 = vshufps_avx(auVar156,auVar156,0xb1);
                auVar153 = vminps_avx(auVar156,auVar153);
                auVar116 = vshufpd_avx(auVar153,auVar153,5);
                auVar153 = vminps_avx(auVar153,auVar116);
                auVar116 = vpermpd_avx2(auVar153,0x4e);
                auVar153 = vminps_avx(auVar153,auVar116);
                uVar25 = vcmpps_avx512vl(auVar156,auVar153,0);
                bVar86 = (byte)uVar25 & bVar88;
                bVar93 = bVar88;
                if (bVar86 != 0) {
                  bVar93 = bVar86;
                }
                iVar29 = 0;
                for (uVar97 = (uint)bVar93; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x80000000) {
                  iVar29 = iVar29 + 1;
                }
                uVar97 = *(uint *)(local_500 + (uint)(iVar29 << 2));
                uVar96 = *(uint *)(local_6a0 + (uint)(iVar29 << 2));
                fVar234 = auVar102._0_4_;
                if ((float)local_9e0._0_4_ < 0.0) {
                  fVar234 = sqrtf((float)local_9e0._0_4_);
                }
                auVar104 = vinsertps_avx(ZEXT416(uVar96),ZEXT416(uVar97),0x10);
                auVar215 = ZEXT1664(auVar104);
                lVar94 = 5;
                do {
                  uVar192 = auVar215._0_4_;
                  auVar178._4_4_ = uVar192;
                  auVar178._0_4_ = uVar192;
                  auVar178._8_4_ = uVar192;
                  auVar178._12_4_ = uVar192;
                  auVar104 = vfmadd132ps_fma(auVar178,ZEXT816(0) << 0x40,local_9d0);
                  auVar105 = vmovshdup_avx(auVar215._0_16_);
                  fVar258 = auVar105._0_4_;
                  fVar257 = 1.0 - fVar258;
                  fVar252 = fVar258 * fVar258;
                  auVar108 = SUB6416(ZEXT464(0x40400000),0);
                  auVar107 = SUB6416(ZEXT464(0xc0a00000),0);
                  auVar106 = vfmadd213ss_fma(auVar108,auVar105,auVar107);
                  auVar24 = vfmadd213ss_fma(auVar106,ZEXT416((uint)fVar252),
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar103 = vfmadd213ss_fma(auVar108,ZEXT416((uint)fVar257),auVar107);
                  auVar103 = vfmadd213ss_fma(auVar103,ZEXT416((uint)(fVar257 * fVar257)),
                                             SUB6416(ZEXT464(0x40000000),0));
                  fVar253 = fVar257 * fVar257 * -fVar258 * 0.5;
                  fVar254 = auVar24._0_4_ * 0.5;
                  fVar255 = auVar103._0_4_ * 0.5;
                  fVar256 = fVar258 * fVar258 * -fVar257 * 0.5;
                  auVar245._0_4_ = fVar256 * (float)local_9a0._0_4_;
                  auVar245._4_4_ = fVar256 * (float)local_9a0._4_4_;
                  auVar245._8_4_ = fVar256 * fStack_998;
                  auVar245._12_4_ = fVar256 * fStack_994;
                  auVar263._4_4_ = fVar255;
                  auVar263._0_4_ = fVar255;
                  auVar263._8_4_ = fVar255;
                  auVar263._12_4_ = fVar255;
                  auVar24 = vfmadd132ps_fma(auVar263,auVar245,local_960._0_16_);
                  auVar226._4_4_ = fVar254;
                  auVar226._0_4_ = fVar254;
                  auVar226._8_4_ = fVar254;
                  auVar226._12_4_ = fVar254;
                  auVar24 = vfmadd132ps_fma(auVar226,auVar24,local_980._0_16_);
                  auVar246._4_4_ = fVar253;
                  auVar246._0_4_ = fVar253;
                  auVar246._8_4_ = fVar253;
                  auVar246._12_4_ = fVar253;
                  auVar24 = vfmadd132ps_fma(auVar246,auVar24,local_940._0_16_);
                  auVar103 = vfmadd231ss_fma(auVar107,auVar105,ZEXT416(0x41100000));
                  local_860._0_16_ = auVar103;
                  auVar103 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar105,
                                             ZEXT416(0x40800000));
                  local_880._0_16_ = auVar103;
                  auVar103 = vfmadd213ss_fma(auVar108,auVar105,ZEXT416(0xbf800000));
                  local_8a0._0_16_ = auVar103;
                  _local_840 = auVar24;
                  auVar24 = vsubps_avx(auVar104,auVar24);
                  auVar104 = vdpps_avx(auVar24,auVar24,0x7f);
                  fVar253 = auVar104._0_4_;
                  local_7c0 = auVar215;
                  if (fVar253 < 0.0) {
                    local_a80._0_4_ = auVar106._0_4_;
                    local_aa0._0_16_ = ZEXT416((uint)fVar257);
                    local_a00._0_4_ = fVar252;
                    local_a20._0_4_ = fVar257 * -2.0;
                    auVar297._0_4_ = sqrtf(fVar253);
                    auVar297._4_60_ = extraout_var_00;
                    auVar106 = ZEXT416((uint)local_a80._0_4_);
                    auVar103 = auVar297._0_16_;
                    auVar107 = local_aa0._0_16_;
                  }
                  else {
                    auVar103 = vsqrtss_avx(auVar104,auVar104);
                    local_a20._0_4_ = fVar257 * -2.0;
                    local_a00._0_4_ = fVar252;
                    auVar107 = ZEXT416((uint)fVar257);
                  }
                  fVar252 = auVar107._0_4_;
                  auVar109 = vfnmadd231ss_fma(ZEXT416((uint)(fVar258 * (fVar252 + fVar252))),
                                              auVar107,auVar107);
                  auVar106 = vfmadd213ss_fma(auVar106,ZEXT416((uint)(fVar258 + fVar258)),
                                             ZEXT416((uint)(fVar258 * fVar258 * 3.0)));
                  auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar105,
                                             SUB6416(ZEXT464(0x40000000),0));
                  auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * fVar252 * -3.0)),
                                             ZEXT416((uint)(fVar252 + fVar252)),auVar107);
                  auVar107 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar105,
                                             ZEXT416((uint)local_a00._0_4_));
                  fVar252 = auVar109._0_4_ * 0.5;
                  fVar254 = auVar106._0_4_ * 0.5;
                  fVar255 = auVar108._0_4_ * 0.5;
                  fVar256 = auVar107._0_4_ * 0.5;
                  auVar247._0_4_ = fVar256 * (float)local_9a0._0_4_;
                  auVar247._4_4_ = fVar256 * (float)local_9a0._4_4_;
                  auVar247._8_4_ = fVar256 * fStack_998;
                  auVar247._12_4_ = fVar256 * fStack_994;
                  auVar227._4_4_ = fVar255;
                  auVar227._0_4_ = fVar255;
                  auVar227._8_4_ = fVar255;
                  auVar227._12_4_ = fVar255;
                  auVar106 = vfmadd132ps_fma(auVar227,auVar247,local_960._0_16_);
                  auVar203._4_4_ = fVar254;
                  auVar203._0_4_ = fVar254;
                  auVar203._8_4_ = fVar254;
                  auVar203._12_4_ = fVar254;
                  auVar106 = vfmadd132ps_fma(auVar203,auVar106,local_980._0_16_);
                  auVar299._4_4_ = fVar252;
                  auVar299._0_4_ = fVar252;
                  auVar299._8_4_ = fVar252;
                  auVar299._12_4_ = fVar252;
                  local_a80._0_16_ = vfmadd132ps_fma(auVar299,auVar106,local_940._0_16_);
                  local_a00._0_16_ = vdpps_avx(local_a80._0_16_,local_a80._0_16_,0x7f);
                  auVar64._12_4_ = 0;
                  auVar64._0_12_ = ZEXT812(0);
                  fVar252 = local_a00._0_4_;
                  auVar106 = vrsqrt14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar252));
                  fVar254 = auVar106._0_4_;
                  local_a20._0_16_ = vrcp14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar252));
                  auVar39._8_4_ = 0x80000000;
                  auVar39._0_8_ = 0x8000000080000000;
                  auVar39._12_4_ = 0x80000000;
                  auVar107 = vxorps_avx512vl(local_a00._0_16_,auVar39);
                  auVar106 = vfnmadd213ss_fma(local_a20._0_16_,local_a00._0_16_,
                                              SUB6416(ZEXT464(0x40000000),0));
                  local_a40._0_4_ = auVar106._0_4_;
                  local_aa0._0_4_ = auVar103._0_4_;
                  if (fVar252 < auVar107._0_4_) {
                    fVar255 = sqrtf(fVar252);
                    auVar103 = ZEXT416((uint)local_aa0._0_4_);
                    auVar106 = local_a80._0_16_;
                  }
                  else {
                    auVar106 = vsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
                    fVar255 = auVar106._0_4_;
                    auVar106 = local_a80._0_16_;
                  }
                  fVar252 = fVar254 * 1.5 + fVar252 * -0.5 * fVar254 * fVar254 * fVar254;
                  auVar179._0_4_ = auVar106._0_4_ * fVar252;
                  auVar179._4_4_ = auVar106._4_4_ * fVar252;
                  auVar179._8_4_ = auVar106._8_4_ * fVar252;
                  auVar179._12_4_ = auVar106._12_4_ * fVar252;
                  auVar107 = vdpps_avx(auVar24,auVar179,0x7f);
                  fVar257 = auVar103._0_4_;
                  fVar254 = auVar107._0_4_;
                  auVar180._0_4_ = fVar254 * fVar254;
                  auVar180._4_4_ = auVar107._4_4_ * auVar107._4_4_;
                  auVar180._8_4_ = auVar107._8_4_ * auVar107._8_4_;
                  auVar180._12_4_ = auVar107._12_4_ * auVar107._12_4_;
                  auVar108 = vsubps_avx512vl(auVar104,auVar180);
                  fVar256 = auVar108._0_4_;
                  auVar204._4_12_ = ZEXT812(0) << 0x20;
                  auVar204._0_4_ = fVar256;
                  auVar109 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar204);
                  auVar110 = vmulss_avx512f(auVar108,ZEXT416(0xbf000000));
                  if (fVar256 < 0.0) {
                    local_8f0 = fVar252;
                    fStack_8ec = fVar252;
                    fStack_8e8 = fVar252;
                    fStack_8e4 = fVar252;
                    local_8e0 = auVar109;
                    fVar256 = sqrtf(fVar256);
                    auVar110 = ZEXT416(auVar110._0_4_);
                    auVar103 = ZEXT416((uint)local_aa0._0_4_);
                    auVar108 = local_8e0;
                    auVar106 = local_a80._0_16_;
                    fVar252 = local_8f0;
                    fVar258 = fStack_8ec;
                    fVar265 = fStack_8e8;
                    fVar266 = fStack_8e4;
                  }
                  else {
                    auVar108 = vsqrtss_avx(auVar108,auVar108);
                    fVar256 = auVar108._0_4_;
                    auVar108 = auVar109;
                    fVar258 = fVar252;
                    fVar265 = fVar252;
                    fVar266 = fVar252;
                  }
                  auVar295 = ZEXT1664(auVar24);
                  auVar304 = ZEXT3264(local_ac0);
                  auVar305 = ZEXT3264(local_ae0);
                  auVar306 = ZEXT3264(local_b00);
                  auVar307 = ZEXT3264(local_b20);
                  auVar308 = ZEXT3264(local_b40);
                  auVar309 = ZEXT3264(local_b60);
                  auVar190 = ZEXT3264(local_a60);
                  auVar205._0_4_ = (float)local_8a0._0_4_ * (float)local_9a0._0_4_;
                  auVar205._4_4_ = (float)local_8a0._0_4_ * (float)local_9a0._4_4_;
                  auVar205._8_4_ = (float)local_8a0._0_4_ * fStack_998;
                  auVar205._12_4_ = (float)local_8a0._0_4_ * fStack_994;
                  auVar228._4_4_ = local_880._0_4_;
                  auVar228._0_4_ = local_880._0_4_;
                  auVar228._8_4_ = local_880._0_4_;
                  auVar228._12_4_ = local_880._0_4_;
                  auVar31 = vfmadd132ps_fma(auVar228,auVar205,local_960._0_16_);
                  auVar206._4_4_ = local_860._0_4_;
                  auVar206._0_4_ = local_860._0_4_;
                  auVar206._8_4_ = local_860._0_4_;
                  auVar206._12_4_ = local_860._0_4_;
                  auVar31 = vfmadd132ps_fma(auVar206,auVar31,local_980._0_16_);
                  auVar105 = vfmadd213ss_fma(auVar105,SUB6416(ZEXT464(0xc0400000),0),
                                             ZEXT416(0x40000000));
                  uVar192 = auVar105._0_4_;
                  auVar229._4_4_ = uVar192;
                  auVar229._0_4_ = uVar192;
                  auVar229._8_4_ = uVar192;
                  auVar229._12_4_ = uVar192;
                  auVar105 = vfmadd132ps_fma(auVar229,auVar31,local_940._0_16_);
                  auVar207._0_4_ = auVar105._0_4_ * (float)local_a00._0_4_;
                  auVar207._4_4_ = auVar105._4_4_ * (float)local_a00._0_4_;
                  auVar207._8_4_ = auVar105._8_4_ * (float)local_a00._0_4_;
                  auVar207._12_4_ = auVar105._12_4_ * (float)local_a00._0_4_;
                  auVar105 = vdpps_avx(auVar106,auVar105,0x7f);
                  fVar267 = auVar105._0_4_;
                  auVar230._0_4_ = auVar106._0_4_ * fVar267;
                  auVar230._4_4_ = auVar106._4_4_ * fVar267;
                  auVar230._8_4_ = auVar106._8_4_ * fVar267;
                  auVar230._12_4_ = auVar106._12_4_ * fVar267;
                  auVar105 = vsubps_avx(auVar207,auVar230);
                  fVar267 = (float)local_a40._0_4_ * (float)local_a20._0_4_;
                  auVar31 = vmaxss_avx(ZEXT416((uint)fVar191),
                                       ZEXT416((uint)(local_7c0._0_4_ * fVar234 * 1.9073486e-06)));
                  auVar40._8_4_ = 0x80000000;
                  auVar40._0_8_ = 0x8000000080000000;
                  auVar40._12_4_ = 0x80000000;
                  auVar159._16_48_ = local_7c0._16_48_;
                  auVar111 = vxorps_avx512vl(auVar106,auVar40);
                  auVar208._0_4_ = fVar252 * auVar105._0_4_ * fVar267;
                  auVar208._4_4_ = fVar258 * auVar105._4_4_ * fVar267;
                  auVar208._8_4_ = fVar265 * auVar105._8_4_ * fVar267;
                  auVar208._12_4_ = fVar266 * auVar105._12_4_ * fVar267;
                  auVar297 = ZEXT1664(auVar179);
                  auVar105 = vdpps_avx(auVar111,auVar179,0x7f);
                  auVar32 = vfmadd213ss_fma(auVar103,ZEXT416((uint)fVar191),auVar31);
                  auVar103 = vdpps_avx(auVar24,auVar208,0x7f);
                  auVar32 = vfmadd213ss_fma(ZEXT416((uint)(fVar257 + 1.0)),
                                            ZEXT416((uint)(fVar191 / fVar255)),auVar32);
                  fVar252 = auVar105._0_4_ + auVar103._0_4_;
                  auVar105 = vdpps_avx(local_9d0,auVar179,0x7f);
                  auVar103 = vdpps_avx(auVar24,auVar111,0x7f);
                  auVar110 = vmulss_avx512f(auVar110,auVar108);
                  fVar255 = auVar109._0_4_ * 1.5 + auVar110._0_4_ * auVar108._0_4_ * auVar108._0_4_;
                  auVar108 = vdpps_avx(auVar24,local_9d0,0x7f);
                  auVar110 = vfnmadd231ss_fma(auVar103,auVar107,ZEXT416((uint)fVar252));
                  auVar108 = vfnmadd231ss_fma(auVar108,auVar107,auVar105);
                  auVar103 = vpermilps_avx(_local_840,0xff);
                  fVar256 = fVar256 - auVar103._0_4_;
                  auVar109 = vshufps_avx(auVar106,auVar106,0xff);
                  auVar103 = vfmsub213ss_fma(auVar110,ZEXT416((uint)fVar255),auVar109);
                  auVar283._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
                  auVar283._8_4_ = auVar103._8_4_ ^ 0x80000000;
                  auVar283._12_4_ = auVar103._12_4_ ^ 0x80000000;
                  auVar285 = ZEXT1664(auVar283);
                  auVar108 = ZEXT416((uint)(auVar108._0_4_ * fVar255));
                  auVar110 = vfmsub231ss_fma(ZEXT416((uint)(auVar105._0_4_ * auVar103._0_4_)),
                                             ZEXT416((uint)fVar252),auVar108);
                  auVar103 = vinsertps_avx(auVar283,auVar108,0x1c);
                  auVar273._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
                  auVar273._8_4_ = auVar105._8_4_ ^ 0x80000000;
                  auVar273._12_4_ = auVar105._12_4_ ^ 0x80000000;
                  auVar108 = vinsertps_avx(ZEXT416((uint)fVar252),auVar273,0x10);
                  auVar248._0_4_ = auVar110._0_4_;
                  auVar248._4_4_ = auVar248._0_4_;
                  auVar248._8_4_ = auVar248._0_4_;
                  auVar248._12_4_ = auVar248._0_4_;
                  auVar105 = vdivps_avx(auVar103,auVar248);
                  auVar103 = vdivps_avx(auVar108,auVar248);
                  auVar249._0_4_ = fVar254 * auVar105._0_4_ + fVar256 * auVar103._0_4_;
                  auVar249._4_4_ = fVar254 * auVar105._4_4_ + fVar256 * auVar103._4_4_;
                  auVar249._8_4_ = fVar254 * auVar105._8_4_ + fVar256 * auVar103._8_4_;
                  auVar249._12_4_ = fVar254 * auVar105._12_4_ + fVar256 * auVar103._12_4_;
                  auVar105 = vsubps_avx(local_7c0._0_16_,auVar249);
                  auVar215 = ZEXT1664(auVar105);
                  auVar41._8_4_ = 0x7fffffff;
                  auVar41._0_8_ = 0x7fffffff7fffffff;
                  auVar41._12_4_ = 0x7fffffff;
                  auVar159._0_16_ = vandps_avx512vl(auVar107,auVar41);
                  if (auVar159._0_4_ < auVar32._0_4_) {
                    auVar103 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ + auVar31._0_4_)),
                                               local_900,ZEXT416(0x36000000));
                    auVar42._8_4_ = 0x7fffffff;
                    auVar42._0_8_ = 0x7fffffff7fffffff;
                    auVar42._12_4_ = 0x7fffffff;
                    auVar159._0_16_ = vandps_avx512vl(ZEXT416((uint)fVar256),auVar42);
                    if (auVar159._0_4_ < auVar103._0_4_) {
                      fVar234 = auVar105._0_4_ + (float)local_910._0_4_;
                      if ((fVar234 < fVar170) ||
                         (fVar252 = *(float *)(ray + k * 4 + 0x200), fVar252 < fVar234)) break;
                      auVar105 = vmovshdup_avx(auVar105);
                      fVar254 = auVar105._0_4_;
                      if ((fVar254 < 0.0) || (1.0 < fVar254)) break;
                      auVar65._12_4_ = 0;
                      auVar65._0_12_ = ZEXT412(0);
                      auVar162._16_48_ = auVar159._16_48_;
                      auVar162._4_12_ = ZEXT412(0);
                      auVar162._0_4_ = fVar253;
                      auVar105 = vrsqrt14ss_avx512f(auVar65 << 0x20,auVar162._0_16_);
                      fVar253 = auVar105._0_4_;
                      auVar159._0_16_ = vmulss_avx512f(auVar104,ZEXT416(0xbf000000));
                      pGVar4 = (context->scene->geometries).items[uVar87].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                      fVar253 = fVar253 * 1.5 + auVar159._0_4_ * fVar253 * fVar253 * fVar253;
                      auVar250._0_4_ = auVar24._0_4_ * fVar253;
                      auVar250._4_4_ = auVar24._4_4_ * fVar253;
                      auVar250._8_4_ = auVar24._8_4_ * fVar253;
                      auVar250._12_4_ = auVar24._12_4_ * fVar253;
                      auVar103 = vfmadd213ps_fma(auVar109,auVar250,auVar106);
                      auVar104 = vshufps_avx(auVar250,auVar250,0xc9);
                      auVar105 = vshufps_avx(auVar106,auVar106,0xc9);
                      auVar251._0_4_ = auVar250._0_4_ * auVar105._0_4_;
                      auVar251._4_4_ = auVar250._4_4_ * auVar105._4_4_;
                      auVar251._8_4_ = auVar250._8_4_ * auVar105._8_4_;
                      auVar251._12_4_ = auVar250._12_4_ * auVar105._12_4_;
                      auVar106 = vfmsub231ps_fma(auVar251,auVar106,auVar104);
                      auVar104 = vshufps_avx(auVar106,auVar106,0xc9);
                      auVar105 = vshufps_avx(auVar103,auVar103,0xc9);
                      auVar106 = vshufps_avx(auVar106,auVar106,0xd2);
                      auVar209._0_4_ = auVar103._0_4_ * auVar106._0_4_;
                      auVar209._4_4_ = auVar103._4_4_ * auVar106._4_4_;
                      auVar209._8_4_ = auVar103._8_4_ * auVar106._8_4_;
                      auVar209._12_4_ = auVar103._12_4_ * auVar106._12_4_;
                      auVar104 = vfmsub231ps_fma(auVar209,auVar104,auVar105);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar234;
                        uVar192 = vextractps_avx(auVar104,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar192;
                        uVar192 = vextractps_avx(auVar104,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar192;
                        *(int *)(ray + k * 4 + 0x380) = auVar104._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar254;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(uint *)(ray + k * 4 + 0x440) = uVar3;
                        *(uint *)(ray + k * 4 + 0x480) = uVar87;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                        break;
                      }
                      pRVar8 = context->user;
                      auVar159 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar159,auVar215);
                      auVar159 = vpermps_avx512f(auVar159,ZEXT1664(auVar104));
                      auVar215 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar215,ZEXT1664(auVar104));
                      local_380 = vbroadcastss_avx512f(auVar104);
                      local_400[0] = (RTCHitN)auVar159[0];
                      local_400[1] = (RTCHitN)auVar159[1];
                      local_400[2] = (RTCHitN)auVar159[2];
                      local_400[3] = (RTCHitN)auVar159[3];
                      local_400[4] = (RTCHitN)auVar159[4];
                      local_400[5] = (RTCHitN)auVar159[5];
                      local_400[6] = (RTCHitN)auVar159[6];
                      local_400[7] = (RTCHitN)auVar159[7];
                      local_400[8] = (RTCHitN)auVar159[8];
                      local_400[9] = (RTCHitN)auVar159[9];
                      local_400[10] = (RTCHitN)auVar159[10];
                      local_400[0xb] = (RTCHitN)auVar159[0xb];
                      local_400[0xc] = (RTCHitN)auVar159[0xc];
                      local_400[0xd] = (RTCHitN)auVar159[0xd];
                      local_400[0xe] = (RTCHitN)auVar159[0xe];
                      local_400[0xf] = (RTCHitN)auVar159[0xf];
                      local_400[0x10] = (RTCHitN)auVar159[0x10];
                      local_400[0x11] = (RTCHitN)auVar159[0x11];
                      local_400[0x12] = (RTCHitN)auVar159[0x12];
                      local_400[0x13] = (RTCHitN)auVar159[0x13];
                      local_400[0x14] = (RTCHitN)auVar159[0x14];
                      local_400[0x15] = (RTCHitN)auVar159[0x15];
                      local_400[0x16] = (RTCHitN)auVar159[0x16];
                      local_400[0x17] = (RTCHitN)auVar159[0x17];
                      local_400[0x18] = (RTCHitN)auVar159[0x18];
                      local_400[0x19] = (RTCHitN)auVar159[0x19];
                      local_400[0x1a] = (RTCHitN)auVar159[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar159[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar159[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar159[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar159[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar159[0x1f];
                      local_400[0x20] = (RTCHitN)auVar159[0x20];
                      local_400[0x21] = (RTCHitN)auVar159[0x21];
                      local_400[0x22] = (RTCHitN)auVar159[0x22];
                      local_400[0x23] = (RTCHitN)auVar159[0x23];
                      local_400[0x24] = (RTCHitN)auVar159[0x24];
                      local_400[0x25] = (RTCHitN)auVar159[0x25];
                      local_400[0x26] = (RTCHitN)auVar159[0x26];
                      local_400[0x27] = (RTCHitN)auVar159[0x27];
                      local_400[0x28] = (RTCHitN)auVar159[0x28];
                      local_400[0x29] = (RTCHitN)auVar159[0x29];
                      local_400[0x2a] = (RTCHitN)auVar159[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar159[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar159[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar159[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar159[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar159[0x2f];
                      local_400[0x30] = (RTCHitN)auVar159[0x30];
                      local_400[0x31] = (RTCHitN)auVar159[0x31];
                      local_400[0x32] = (RTCHitN)auVar159[0x32];
                      local_400[0x33] = (RTCHitN)auVar159[0x33];
                      local_400[0x34] = (RTCHitN)auVar159[0x34];
                      local_400[0x35] = (RTCHitN)auVar159[0x35];
                      local_400[0x36] = (RTCHitN)auVar159[0x36];
                      local_400[0x37] = (RTCHitN)auVar159[0x37];
                      local_400[0x38] = (RTCHitN)auVar159[0x38];
                      local_400[0x39] = (RTCHitN)auVar159[0x39];
                      local_400[0x3a] = (RTCHitN)auVar159[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar159[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar159[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar159[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar159[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar159[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar159 = vmovdqa64_avx512f(local_440);
                      local_280 = vmovdqa64_avx512f(auVar159);
                      auVar153 = vpcmpeqd_avx2(auVar159._0_32_,auVar159._0_32_);
                      local_a28[3] = auVar153;
                      local_a28[2] = auVar153;
                      local_a28[1] = auVar153;
                      *local_a28 = auVar153;
                      local_240 = vbroadcastss_avx512f(ZEXT416(pRVar8->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(pRVar8->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar234;
                      auVar159 = vmovdqa64_avx512f(local_4c0);
                      local_780 = vmovdqa64_avx512f(auVar159);
                      local_b90.valid = (int *)local_780;
                      local_b90.geometryUserPtr = pGVar4->userPtr;
                      local_b90.context = context->user;
                      local_b90.hit = local_400;
                      local_b90.N = 0x10;
                      local_b90.ray = (RTCRayN *)ray;
                      if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar285 = ZEXT1664(auVar283);
                        auVar295 = ZEXT1664(auVar24);
                        auVar297 = ZEXT1664(auVar179);
                        (*pGVar4->intersectionFilterN)(&local_b90);
                        auVar190 = ZEXT3264(local_a60);
                        auVar309 = ZEXT3264(local_b60);
                        auVar308 = ZEXT3264(local_b40);
                        auVar307 = ZEXT3264(local_b20);
                        auVar306 = ZEXT3264(local_b00);
                        auVar305 = ZEXT3264(local_ae0);
                        auVar304 = ZEXT3264(local_ac0);
                        auVar159 = vmovdqa64_avx512f(local_780);
                      }
                      uVar25 = vptestmd_avx512f(auVar159,auVar159);
                      if ((short)uVar25 != 0) {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar285 = ZEXT1664(auVar285._0_16_);
                          auVar295 = ZEXT1664(auVar295._0_16_);
                          auVar297 = ZEXT1664(auVar297._0_16_);
                          (*p_Var9)(&local_b90);
                          auVar190 = ZEXT3264(local_a60);
                          auVar309 = ZEXT3264(local_b60);
                          auVar308 = ZEXT3264(local_b40);
                          auVar307 = ZEXT3264(local_b20);
                          auVar306 = ZEXT3264(local_b00);
                          auVar305 = ZEXT3264(local_ae0);
                          auVar304 = ZEXT3264(local_ac0);
                          auVar159 = vmovdqa64_avx512f(local_780);
                        }
                        uVar95 = vptestmd_avx512f(auVar159,auVar159);
                        if ((short)uVar95 != 0) {
                          iVar66 = *(int *)(local_b90.hit + 4);
                          iVar67 = *(int *)(local_b90.hit + 8);
                          iVar68 = *(int *)(local_b90.hit + 0xc);
                          iVar69 = *(int *)(local_b90.hit + 0x10);
                          iVar70 = *(int *)(local_b90.hit + 0x14);
                          iVar71 = *(int *)(local_b90.hit + 0x18);
                          iVar72 = *(int *)(local_b90.hit + 0x1c);
                          iVar73 = *(int *)(local_b90.hit + 0x20);
                          iVar74 = *(int *)(local_b90.hit + 0x24);
                          iVar75 = *(int *)(local_b90.hit + 0x28);
                          iVar76 = *(int *)(local_b90.hit + 0x2c);
                          iVar77 = *(int *)(local_b90.hit + 0x30);
                          iVar78 = *(int *)(local_b90.hit + 0x34);
                          iVar79 = *(int *)(local_b90.hit + 0x38);
                          iVar80 = *(int *)(local_b90.hit + 0x3c);
                          bVar93 = (byte)uVar95;
                          bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar95 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar95 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar95 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar95 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar95 >> 7) & 1);
                          bVar86 = (byte)(uVar95 >> 8);
                          bVar17 = (bool)((byte)(uVar95 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar95 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar95 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar95 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar95 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar95 >> 0xe) & 1);
                          bVar23 = SUB81(uVar95 >> 0xf,0);
                          *(uint *)(local_b90.ray + 0x300) =
                               (uint)(bVar93 & 1) * *(int *)local_b90.hit |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x300);
                          *(uint *)(local_b90.ray + 0x304) =
                               (uint)bVar10 * iVar66 |
                               (uint)!bVar10 * *(int *)(local_b90.ray + 0x304);
                          *(uint *)(local_b90.ray + 0x308) =
                               (uint)bVar11 * iVar67 |
                               (uint)!bVar11 * *(int *)(local_b90.ray + 0x308);
                          *(uint *)(local_b90.ray + 0x30c) =
                               (uint)bVar12 * iVar68 |
                               (uint)!bVar12 * *(int *)(local_b90.ray + 0x30c);
                          *(uint *)(local_b90.ray + 0x310) =
                               (uint)bVar13 * iVar69 |
                               (uint)!bVar13 * *(int *)(local_b90.ray + 0x310);
                          *(uint *)(local_b90.ray + 0x314) =
                               (uint)bVar14 * iVar70 |
                               (uint)!bVar14 * *(int *)(local_b90.ray + 0x314);
                          *(uint *)(local_b90.ray + 0x318) =
                               (uint)bVar15 * iVar71 |
                               (uint)!bVar15 * *(int *)(local_b90.ray + 0x318);
                          *(uint *)(local_b90.ray + 0x31c) =
                               (uint)bVar16 * iVar72 |
                               (uint)!bVar16 * *(int *)(local_b90.ray + 0x31c);
                          *(uint *)(local_b90.ray + 800) =
                               (uint)(bVar86 & 1) * iVar73 |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_b90.ray + 800);
                          *(uint *)(local_b90.ray + 0x324) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_b90.ray + 0x324);
                          *(uint *)(local_b90.ray + 0x328) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_b90.ray + 0x328);
                          *(uint *)(local_b90.ray + 0x32c) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_b90.ray + 0x32c);
                          *(uint *)(local_b90.ray + 0x330) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_b90.ray + 0x330);
                          *(uint *)(local_b90.ray + 0x334) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_b90.ray + 0x334);
                          *(uint *)(local_b90.ray + 0x338) =
                               (uint)bVar22 * iVar79 |
                               (uint)!bVar22 * *(int *)(local_b90.ray + 0x338);
                          *(uint *)(local_b90.ray + 0x33c) =
                               (uint)bVar23 * iVar80 |
                               (uint)!bVar23 * *(int *)(local_b90.ray + 0x33c);
                          iVar66 = *(int *)(local_b90.hit + 0x44);
                          iVar67 = *(int *)(local_b90.hit + 0x48);
                          iVar68 = *(int *)(local_b90.hit + 0x4c);
                          iVar69 = *(int *)(local_b90.hit + 0x50);
                          iVar70 = *(int *)(local_b90.hit + 0x54);
                          iVar71 = *(int *)(local_b90.hit + 0x58);
                          iVar72 = *(int *)(local_b90.hit + 0x5c);
                          iVar73 = *(int *)(local_b90.hit + 0x60);
                          iVar74 = *(int *)(local_b90.hit + 100);
                          iVar75 = *(int *)(local_b90.hit + 0x68);
                          iVar76 = *(int *)(local_b90.hit + 0x6c);
                          iVar77 = *(int *)(local_b90.hit + 0x70);
                          iVar78 = *(int *)(local_b90.hit + 0x74);
                          iVar79 = *(int *)(local_b90.hit + 0x78);
                          iVar80 = *(int *)(local_b90.hit + 0x7c);
                          bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar95 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar95 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar95 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar95 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar95 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar95 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar95 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar95 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar95 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar95 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar95 >> 0xe) & 1);
                          bVar23 = SUB81(uVar95 >> 0xf,0);
                          *(uint *)(local_b90.ray + 0x340) =
                               (uint)(bVar93 & 1) * *(int *)(local_b90.hit + 0x40) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x340);
                          *(uint *)(local_b90.ray + 0x344) =
                               (uint)bVar10 * iVar66 |
                               (uint)!bVar10 * *(int *)(local_b90.ray + 0x344);
                          *(uint *)(local_b90.ray + 0x348) =
                               (uint)bVar11 * iVar67 |
                               (uint)!bVar11 * *(int *)(local_b90.ray + 0x348);
                          *(uint *)(local_b90.ray + 0x34c) =
                               (uint)bVar12 * iVar68 |
                               (uint)!bVar12 * *(int *)(local_b90.ray + 0x34c);
                          *(uint *)(local_b90.ray + 0x350) =
                               (uint)bVar13 * iVar69 |
                               (uint)!bVar13 * *(int *)(local_b90.ray + 0x350);
                          *(uint *)(local_b90.ray + 0x354) =
                               (uint)bVar14 * iVar70 |
                               (uint)!bVar14 * *(int *)(local_b90.ray + 0x354);
                          *(uint *)(local_b90.ray + 0x358) =
                               (uint)bVar15 * iVar71 |
                               (uint)!bVar15 * *(int *)(local_b90.ray + 0x358);
                          *(uint *)(local_b90.ray + 0x35c) =
                               (uint)bVar16 * iVar72 |
                               (uint)!bVar16 * *(int *)(local_b90.ray + 0x35c);
                          *(uint *)(local_b90.ray + 0x360) =
                               (uint)(bVar86 & 1) * iVar73 |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_b90.ray + 0x360);
                          *(uint *)(local_b90.ray + 0x364) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_b90.ray + 0x364);
                          *(uint *)(local_b90.ray + 0x368) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_b90.ray + 0x368);
                          *(uint *)(local_b90.ray + 0x36c) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_b90.ray + 0x36c);
                          *(uint *)(local_b90.ray + 0x370) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_b90.ray + 0x370);
                          *(uint *)(local_b90.ray + 0x374) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_b90.ray + 0x374);
                          *(uint *)(local_b90.ray + 0x378) =
                               (uint)bVar22 * iVar79 |
                               (uint)!bVar22 * *(int *)(local_b90.ray + 0x378);
                          *(uint *)(local_b90.ray + 0x37c) =
                               (uint)bVar23 * iVar80 |
                               (uint)!bVar23 * *(int *)(local_b90.ray + 0x37c);
                          iVar66 = *(int *)(local_b90.hit + 0x84);
                          iVar67 = *(int *)(local_b90.hit + 0x88);
                          iVar68 = *(int *)(local_b90.hit + 0x8c);
                          iVar69 = *(int *)(local_b90.hit + 0x90);
                          iVar70 = *(int *)(local_b90.hit + 0x94);
                          iVar71 = *(int *)(local_b90.hit + 0x98);
                          iVar72 = *(int *)(local_b90.hit + 0x9c);
                          iVar73 = *(int *)(local_b90.hit + 0xa0);
                          iVar74 = *(int *)(local_b90.hit + 0xa4);
                          iVar75 = *(int *)(local_b90.hit + 0xa8);
                          iVar76 = *(int *)(local_b90.hit + 0xac);
                          iVar77 = *(int *)(local_b90.hit + 0xb0);
                          iVar78 = *(int *)(local_b90.hit + 0xb4);
                          iVar79 = *(int *)(local_b90.hit + 0xb8);
                          iVar80 = *(int *)(local_b90.hit + 0xbc);
                          bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar95 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar95 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar95 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar95 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar95 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar95 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar95 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar95 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar95 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar95 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar95 >> 0xe) & 1);
                          bVar23 = SUB81(uVar95 >> 0xf,0);
                          *(uint *)(local_b90.ray + 0x380) =
                               (uint)(bVar93 & 1) * *(int *)(local_b90.hit + 0x80) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x380);
                          *(uint *)(local_b90.ray + 900) =
                               (uint)bVar10 * iVar66 | (uint)!bVar10 * *(int *)(local_b90.ray + 900)
                          ;
                          *(uint *)(local_b90.ray + 0x388) =
                               (uint)bVar11 * iVar67 |
                               (uint)!bVar11 * *(int *)(local_b90.ray + 0x388);
                          *(uint *)(local_b90.ray + 0x38c) =
                               (uint)bVar12 * iVar68 |
                               (uint)!bVar12 * *(int *)(local_b90.ray + 0x38c);
                          *(uint *)(local_b90.ray + 0x390) =
                               (uint)bVar13 * iVar69 |
                               (uint)!bVar13 * *(int *)(local_b90.ray + 0x390);
                          *(uint *)(local_b90.ray + 0x394) =
                               (uint)bVar14 * iVar70 |
                               (uint)!bVar14 * *(int *)(local_b90.ray + 0x394);
                          *(uint *)(local_b90.ray + 0x398) =
                               (uint)bVar15 * iVar71 |
                               (uint)!bVar15 * *(int *)(local_b90.ray + 0x398);
                          *(uint *)(local_b90.ray + 0x39c) =
                               (uint)bVar16 * iVar72 |
                               (uint)!bVar16 * *(int *)(local_b90.ray + 0x39c);
                          *(uint *)(local_b90.ray + 0x3a0) =
                               (uint)(bVar86 & 1) * iVar73 |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_b90.ray + 0x3a0);
                          *(uint *)(local_b90.ray + 0x3a4) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_b90.ray + 0x3a4);
                          *(uint *)(local_b90.ray + 0x3a8) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_b90.ray + 0x3a8);
                          *(uint *)(local_b90.ray + 0x3ac) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_b90.ray + 0x3ac);
                          *(uint *)(local_b90.ray + 0x3b0) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_b90.ray + 0x3b0);
                          *(uint *)(local_b90.ray + 0x3b4) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_b90.ray + 0x3b4);
                          *(uint *)(local_b90.ray + 0x3b8) =
                               (uint)bVar22 * iVar79 |
                               (uint)!bVar22 * *(int *)(local_b90.ray + 0x3b8);
                          *(uint *)(local_b90.ray + 0x3bc) =
                               (uint)bVar23 * iVar80 |
                               (uint)!bVar23 * *(int *)(local_b90.ray + 0x3bc);
                          iVar66 = *(int *)(local_b90.hit + 0xc4);
                          iVar67 = *(int *)(local_b90.hit + 200);
                          iVar68 = *(int *)(local_b90.hit + 0xcc);
                          iVar69 = *(int *)(local_b90.hit + 0xd0);
                          iVar70 = *(int *)(local_b90.hit + 0xd4);
                          iVar71 = *(int *)(local_b90.hit + 0xd8);
                          iVar72 = *(int *)(local_b90.hit + 0xdc);
                          iVar73 = *(int *)(local_b90.hit + 0xe0);
                          iVar74 = *(int *)(local_b90.hit + 0xe4);
                          iVar75 = *(int *)(local_b90.hit + 0xe8);
                          iVar76 = *(int *)(local_b90.hit + 0xec);
                          iVar77 = *(int *)(local_b90.hit + 0xf0);
                          iVar78 = *(int *)(local_b90.hit + 0xf4);
                          iVar79 = *(int *)(local_b90.hit + 0xf8);
                          iVar80 = *(int *)(local_b90.hit + 0xfc);
                          bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar95 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar95 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar95 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar95 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar95 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar95 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar95 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar95 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar95 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar95 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar95 >> 0xe) & 1);
                          bVar23 = SUB81(uVar95 >> 0xf,0);
                          *(uint *)(local_b90.ray + 0x3c0) =
                               (uint)(bVar93 & 1) * *(int *)(local_b90.hit + 0xc0) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x3c0);
                          *(uint *)(local_b90.ray + 0x3c4) =
                               (uint)bVar10 * iVar66 |
                               (uint)!bVar10 * *(int *)(local_b90.ray + 0x3c4);
                          *(uint *)(local_b90.ray + 0x3c8) =
                               (uint)bVar11 * iVar67 |
                               (uint)!bVar11 * *(int *)(local_b90.ray + 0x3c8);
                          *(uint *)(local_b90.ray + 0x3cc) =
                               (uint)bVar12 * iVar68 |
                               (uint)!bVar12 * *(int *)(local_b90.ray + 0x3cc);
                          *(uint *)(local_b90.ray + 0x3d0) =
                               (uint)bVar13 * iVar69 |
                               (uint)!bVar13 * *(int *)(local_b90.ray + 0x3d0);
                          *(uint *)(local_b90.ray + 0x3d4) =
                               (uint)bVar14 * iVar70 |
                               (uint)!bVar14 * *(int *)(local_b90.ray + 0x3d4);
                          *(uint *)(local_b90.ray + 0x3d8) =
                               (uint)bVar15 * iVar71 |
                               (uint)!bVar15 * *(int *)(local_b90.ray + 0x3d8);
                          *(uint *)(local_b90.ray + 0x3dc) =
                               (uint)bVar16 * iVar72 |
                               (uint)!bVar16 * *(int *)(local_b90.ray + 0x3dc);
                          *(uint *)(local_b90.ray + 0x3e0) =
                               (uint)(bVar86 & 1) * iVar73 |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_b90.ray + 0x3e0);
                          *(uint *)(local_b90.ray + 0x3e4) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_b90.ray + 0x3e4);
                          *(uint *)(local_b90.ray + 1000) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_b90.ray + 1000);
                          *(uint *)(local_b90.ray + 0x3ec) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_b90.ray + 0x3ec);
                          *(uint *)(local_b90.ray + 0x3f0) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_b90.ray + 0x3f0);
                          *(uint *)(local_b90.ray + 0x3f4) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_b90.ray + 0x3f4);
                          *(uint *)(local_b90.ray + 0x3f8) =
                               (uint)bVar22 * iVar79 |
                               (uint)!bVar22 * *(int *)(local_b90.ray + 0x3f8);
                          *(uint *)(local_b90.ray + 0x3fc) =
                               (uint)bVar23 * iVar80 |
                               (uint)!bVar23 * *(int *)(local_b90.ray + 0x3fc);
                          iVar66 = *(int *)(local_b90.hit + 0x104);
                          iVar67 = *(int *)(local_b90.hit + 0x108);
                          iVar68 = *(int *)(local_b90.hit + 0x10c);
                          iVar69 = *(int *)(local_b90.hit + 0x110);
                          iVar70 = *(int *)(local_b90.hit + 0x114);
                          iVar71 = *(int *)(local_b90.hit + 0x118);
                          iVar72 = *(int *)(local_b90.hit + 0x11c);
                          iVar73 = *(int *)(local_b90.hit + 0x120);
                          iVar74 = *(int *)(local_b90.hit + 0x124);
                          iVar75 = *(int *)(local_b90.hit + 0x128);
                          iVar76 = *(int *)(local_b90.hit + 300);
                          iVar77 = *(int *)(local_b90.hit + 0x130);
                          iVar78 = *(int *)(local_b90.hit + 0x134);
                          iVar79 = *(int *)(local_b90.hit + 0x138);
                          iVar80 = *(int *)(local_b90.hit + 0x13c);
                          bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar95 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar95 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar95 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar95 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar95 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar95 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar95 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar95 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar95 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar95 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar95 >> 0xe) & 1);
                          bVar23 = SUB81(uVar95 >> 0xf,0);
                          *(uint *)(local_b90.ray + 0x400) =
                               (uint)(bVar93 & 1) * *(int *)(local_b90.hit + 0x100) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_b90.ray + 0x400);
                          *(uint *)(local_b90.ray + 0x404) =
                               (uint)bVar10 * iVar66 |
                               (uint)!bVar10 * *(int *)(local_b90.ray + 0x404);
                          *(uint *)(local_b90.ray + 0x408) =
                               (uint)bVar11 * iVar67 |
                               (uint)!bVar11 * *(int *)(local_b90.ray + 0x408);
                          *(uint *)(local_b90.ray + 0x40c) =
                               (uint)bVar12 * iVar68 |
                               (uint)!bVar12 * *(int *)(local_b90.ray + 0x40c);
                          *(uint *)(local_b90.ray + 0x410) =
                               (uint)bVar13 * iVar69 |
                               (uint)!bVar13 * *(int *)(local_b90.ray + 0x410);
                          *(uint *)(local_b90.ray + 0x414) =
                               (uint)bVar14 * iVar70 |
                               (uint)!bVar14 * *(int *)(local_b90.ray + 0x414);
                          *(uint *)(local_b90.ray + 0x418) =
                               (uint)bVar15 * iVar71 |
                               (uint)!bVar15 * *(int *)(local_b90.ray + 0x418);
                          *(uint *)(local_b90.ray + 0x41c) =
                               (uint)bVar16 * iVar72 |
                               (uint)!bVar16 * *(int *)(local_b90.ray + 0x41c);
                          *(uint *)(local_b90.ray + 0x420) =
                               (uint)(bVar86 & 1) * iVar73 |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_b90.ray + 0x420);
                          *(uint *)(local_b90.ray + 0x424) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_b90.ray + 0x424);
                          *(uint *)(local_b90.ray + 0x428) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_b90.ray + 0x428);
                          *(uint *)(local_b90.ray + 0x42c) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_b90.ray + 0x42c);
                          *(uint *)(local_b90.ray + 0x430) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_b90.ray + 0x430);
                          *(uint *)(local_b90.ray + 0x434) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_b90.ray + 0x434);
                          *(uint *)(local_b90.ray + 0x438) =
                               (uint)bVar22 * iVar79 |
                               (uint)!bVar22 * *(int *)(local_b90.ray + 0x438);
                          *(uint *)(local_b90.ray + 0x43c) =
                               (uint)bVar23 * iVar80 |
                               (uint)!bVar23 * *(int *)(local_b90.ray + 0x43c);
                          auVar159 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x140)
                                                      );
                          auVar159 = vmovdqu32_avx512f(auVar159);
                          *(undefined1 (*) [64])(local_b90.ray + 0x440) = auVar159;
                          auVar159 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x180)
                                                      );
                          auVar159 = vmovdqu32_avx512f(auVar159);
                          *(undefined1 (*) [64])(local_b90.ray + 0x480) = auVar159;
                          auVar215 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x1c0)
                                                      );
                          auVar159 = vmovdqa32_avx512f(auVar215);
                          *(undefined1 (*) [64])(local_b90.ray + 0x4c0) = auVar159;
                          auVar289 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x200)
                                                      );
                          bVar10 = (bool)((byte)(uVar95 >> 1) & 1);
                          auVar61._4_56_ = auVar289._8_56_;
                          auVar61._0_4_ =
                               (uint)bVar10 * auVar289._4_4_ | (uint)!bVar10 * auVar215._4_4_;
                          auVar159._0_8_ = auVar61._0_8_ << 0x20;
                          bVar10 = (bool)((byte)(uVar95 >> 2) & 1);
                          auVar159._8_4_ =
                               (uint)bVar10 * auVar289._8_4_ | (uint)!bVar10 * auVar215._8_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
                          auVar159._12_4_ =
                               (uint)bVar10 * auVar289._12_4_ | (uint)!bVar10 * auVar215._12_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 4) & 1);
                          auVar159._16_4_ =
                               (uint)bVar10 * auVar289._16_4_ | (uint)!bVar10 * auVar215._16_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 5) & 1);
                          auVar159._20_4_ =
                               (uint)bVar10 * auVar289._20_4_ | (uint)!bVar10 * auVar215._20_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 6) & 1);
                          auVar159._24_4_ =
                               (uint)bVar10 * auVar289._24_4_ | (uint)!bVar10 * auVar215._24_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 7) & 1);
                          auVar159._28_4_ =
                               (uint)bVar10 * auVar289._28_4_ | (uint)!bVar10 * auVar215._28_4_;
                          auVar159._32_4_ =
                               (uint)(bVar86 & 1) * auVar289._32_4_ |
                               (uint)!(bool)(bVar86 & 1) * auVar215._32_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 9) & 1);
                          auVar159._36_4_ =
                               (uint)bVar10 * auVar289._36_4_ | (uint)!bVar10 * auVar215._36_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 10) & 1);
                          auVar159._40_4_ =
                               (uint)bVar10 * auVar289._40_4_ | (uint)!bVar10 * auVar215._40_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 0xb) & 1);
                          auVar159._44_4_ =
                               (uint)bVar10 * auVar289._44_4_ | (uint)!bVar10 * auVar215._44_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 0xc) & 1);
                          auVar159._48_4_ =
                               (uint)bVar10 * auVar289._48_4_ | (uint)!bVar10 * auVar215._48_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 0xd) & 1);
                          auVar159._52_4_ =
                               (uint)bVar10 * auVar289._52_4_ | (uint)!bVar10 * auVar215._52_4_;
                          bVar10 = (bool)((byte)(uVar95 >> 0xe) & 1);
                          auVar159._56_4_ =
                               (uint)bVar10 * auVar289._56_4_ | (uint)!bVar10 * auVar215._56_4_;
                          bVar10 = SUB81(uVar95 >> 0xf,0);
                          auVar159._60_4_ =
                               (uint)bVar10 * auVar289._60_4_ | (uint)!bVar10 * auVar215._60_4_;
                          auVar215 = vmovdqa32_avx512f(auVar289);
                          *(undefined1 (*) [64])(local_b90.ray + 0x500) = auVar215;
                          break;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar252;
                      break;
                    }
                  }
                  lVar94 = lVar94 + -1;
                } while (lVar94 != 0);
                uVar192 = *(undefined4 *)(ray + k * 4 + 0x200);
                auVar187._4_4_ = uVar192;
                auVar187._0_4_ = uVar192;
                auVar187._8_4_ = uVar192;
                auVar187._12_4_ = uVar192;
                auVar187._16_4_ = uVar192;
                auVar187._20_4_ = uVar192;
                auVar187._24_4_ = uVar192;
                auVar187._28_4_ = uVar192;
                auVar82._4_4_ = fStack_71c;
                auVar82._0_4_ = local_720;
                auVar82._8_4_ = fStack_718;
                auVar82._12_4_ = fStack_714;
                auVar82._16_4_ = fStack_710;
                auVar82._20_4_ = fStack_70c;
                auVar82._24_4_ = fStack_708;
                auVar82._28_4_ = fStack_704;
                uVar25 = vcmpps_avx512vl(auVar187,auVar82,0xd);
                bVar88 = ~('\x01' << ((byte)iVar29 & 0x1f)) & bVar88 & (byte)uVar25;
              } while (bVar88 != 0);
              auVar155 = local_740;
              fVar191 = (float)local_9c0._0_4_;
              fVar234 = (float)local_9c0._4_4_;
              fVar252 = fStack_9b8;
              fVar253 = fStack_9b4;
              fVar254 = fStack_9b0;
              fVar255 = fStack_9ac;
              fVar256 = fStack_9a8;
              fVar257 = fStack_9a4;
            }
            uVar27 = vpcmpgtd_avx512vl(auVar155,local_6e0);
            uVar28 = vpcmpd_avx512vl(local_6e0,local_660,1);
            auVar231._0_4_ = fVar191 + (float)local_540._0_4_;
            auVar231._4_4_ = fVar234 + (float)local_540._4_4_;
            auVar231._8_4_ = fVar252 + fStack_538;
            auVar231._12_4_ = fVar253 + fStack_534;
            auVar231._16_4_ = fVar254 + fStack_530;
            auVar231._20_4_ = fVar255 + fStack_52c;
            auVar231._24_4_ = fVar256 + fStack_528;
            auVar231._28_4_ = fVar257 + fStack_524;
            uVar25 = vcmpps_avx512vl(auVar231,auVar187,2);
            bVar89 = bVar89 & (byte)uVar28 & (byte)uVar25;
            auVar232._0_4_ = fVar191 + local_6c0._0_4_;
            auVar232._4_4_ = fVar234 + local_6c0._4_4_;
            auVar232._8_4_ = fVar252 + local_6c0._8_4_;
            auVar232._12_4_ = fVar253 + local_6c0._12_4_;
            auVar232._16_4_ = fVar254 + local_6c0._16_4_;
            auVar232._20_4_ = fVar255 + local_6c0._20_4_;
            auVar232._24_4_ = fVar256 + local_6c0._24_4_;
            auVar232._28_4_ = fVar257 + local_6c0._28_4_;
            uVar25 = vcmpps_avx512vl(auVar232,auVar187,2);
            bVar84 = bVar84 & (byte)uVar27 & (byte)uVar25 | bVar89;
            auVar289 = ZEXT3264(CONCAT428(0x80000000,
                                          CONCAT424(0x80000000,
                                                    CONCAT420(0x80000000,
                                                              CONCAT416(0x80000000,
                                                                        CONCAT412(0x80000000,
                                                                                  CONCAT48(
                                                  0x80000000,0x8000000080000000)))))));
            if (bVar84 != 0) {
              abStack_1a0[uVar90 * 0x60] = bVar84;
              auVar157._0_4_ =
                   (uint)(bVar89 & 1) * local_540._0_4_ |
                   (uint)!(bool)(bVar89 & 1) * (int)local_6c0._0_4_;
              bVar10 = (bool)(bVar89 >> 1 & 1);
              auVar157._4_4_ = (uint)bVar10 * local_540._4_4_ | (uint)!bVar10 * (int)local_6c0._4_4_
              ;
              bVar10 = (bool)(bVar89 >> 2 & 1);
              auVar157._8_4_ = (uint)bVar10 * (int)fStack_538 | (uint)!bVar10 * (int)local_6c0._8_4_
              ;
              bVar10 = (bool)(bVar89 >> 3 & 1);
              auVar157._12_4_ =
                   (uint)bVar10 * (int)fStack_534 | (uint)!bVar10 * (int)local_6c0._12_4_;
              bVar10 = (bool)(bVar89 >> 4 & 1);
              auVar157._16_4_ =
                   (uint)bVar10 * (int)fStack_530 | (uint)!bVar10 * (int)local_6c0._16_4_;
              bVar10 = (bool)(bVar89 >> 5 & 1);
              auVar157._20_4_ =
                   (uint)bVar10 * (int)fStack_52c | (uint)!bVar10 * (int)local_6c0._20_4_;
              auVar157._24_4_ =
                   (uint)(bVar89 >> 6) * (int)fStack_528 |
                   (uint)!(bool)(bVar89 >> 6) * (int)local_6c0._24_4_;
              auVar157._28_4_ = local_6c0._28_4_;
              auVar159._0_32_ = auVar157;
              *(undefined1 (*) [32])(auStack_180 + uVar90 * 0x60) = auVar157;
              uVar95 = vmovlps_avx(local_6f0);
              (&uStack_160)[uVar90 * 0xc] = uVar95;
              aiStack_158[uVar90 * 0x18] = iVar91 + 1;
              uVar90 = (ulong)((int)uVar90 + 1);
            }
          }
          goto LAB_01c1e0a1;
        }
      }
      auVar289 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar304 = ZEXT3264(local_ac0);
      auVar305 = ZEXT3264(local_ae0);
      auVar306 = ZEXT3264(local_b00);
      auVar307 = ZEXT3264(local_b20);
      auVar308 = ZEXT3264(local_b40);
      auVar309 = ZEXT3264(local_b60);
      auVar159._32_32_ = auVar153;
      auVar159._0_32_ = local_a60;
      auVar190 = ZEXT3264(local_a60);
    }
LAB_01c1e0a1:
    do {
      uVar97 = (uint)uVar90;
      uVar90 = (ulong)(uVar97 - 1);
      if (uVar97 == 0) {
        uVar192 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar43._4_4_ = uVar192;
        auVar43._0_4_ = uVar192;
        auVar43._8_4_ = uVar192;
        auVar43._12_4_ = uVar192;
        uVar25 = vcmpps_avx512vl(local_700,auVar43,2);
        uVar87 = (uint)uVar25 & (uint)local_8c8 - 1 & (uint)local_8c8;
        local_8c8 = (ulong)uVar87;
        if (uVar87 == 0) {
          return;
        }
        goto LAB_01c1b606;
      }
      lVar94 = uVar90 * 0x60;
      auVar116 = *(undefined1 (*) [32])(auStack_180 + lVar94);
      auVar213._0_4_ = fVar191 + auVar116._0_4_;
      auVar213._4_4_ = fVar234 + auVar116._4_4_;
      auVar213._8_4_ = fVar252 + auVar116._8_4_;
      auVar213._12_4_ = fVar253 + auVar116._12_4_;
      auVar213._16_4_ = fVar254 + auVar116._16_4_;
      auVar213._20_4_ = fVar255 + auVar116._20_4_;
      auVar213._24_4_ = fVar256 + auVar116._24_4_;
      auVar213._28_4_ = fVar257 + auVar116._28_4_;
      uVar192 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar47._4_4_ = uVar192;
      auVar47._0_4_ = uVar192;
      auVar47._8_4_ = uVar192;
      auVar47._12_4_ = uVar192;
      auVar47._16_4_ = uVar192;
      auVar47._20_4_ = uVar192;
      auVar47._24_4_ = uVar192;
      auVar47._28_4_ = uVar192;
      uVar25 = vcmpps_avx512vl(auVar213,auVar47,2);
      uVar96 = (uint)uVar25 & (uint)abStack_1a0[lVar94];
    } while (uVar96 == 0);
    uVar95 = (&uStack_160)[uVar90 * 0xc];
    auVar210._8_8_ = 0;
    auVar210._0_8_ = uVar95;
    auVar233._8_4_ = 0x7f800000;
    auVar233._0_8_ = 0x7f8000007f800000;
    auVar233._12_4_ = 0x7f800000;
    auVar233._16_4_ = 0x7f800000;
    auVar233._20_4_ = 0x7f800000;
    auVar233._24_4_ = 0x7f800000;
    auVar233._28_4_ = 0x7f800000;
    auVar153 = auVar159._32_32_;
    auVar117 = vblendmps_avx512vl(auVar233,auVar116);
    bVar84 = (byte)uVar96;
    auVar158._0_4_ =
         (uint)(bVar84 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar84 & 1) * (int)auVar116._0_4_;
    bVar10 = (bool)((byte)(uVar96 >> 1) & 1);
    auVar158._4_4_ = (uint)bVar10 * auVar117._4_4_ | (uint)!bVar10 * (int)auVar116._4_4_;
    bVar10 = (bool)((byte)(uVar96 >> 2) & 1);
    auVar158._8_4_ = (uint)bVar10 * auVar117._8_4_ | (uint)!bVar10 * (int)auVar116._8_4_;
    bVar10 = (bool)((byte)(uVar96 >> 3) & 1);
    auVar158._12_4_ = (uint)bVar10 * auVar117._12_4_ | (uint)!bVar10 * (int)auVar116._12_4_;
    bVar10 = (bool)((byte)(uVar96 >> 4) & 1);
    auVar158._16_4_ = (uint)bVar10 * auVar117._16_4_ | (uint)!bVar10 * (int)auVar116._16_4_;
    bVar10 = (bool)((byte)(uVar96 >> 5) & 1);
    auVar158._20_4_ = (uint)bVar10 * auVar117._20_4_ | (uint)!bVar10 * (int)auVar116._20_4_;
    bVar10 = (bool)((byte)(uVar96 >> 6) & 1);
    auVar158._24_4_ = (uint)bVar10 * auVar117._24_4_ | (uint)!bVar10 * (int)auVar116._24_4_;
    auVar158._28_4_ =
         (uVar96 >> 7) * auVar117._28_4_ | (uint)!SUB41(uVar96 >> 7,0) * (int)auVar116._28_4_;
    auVar116 = vshufps_avx(auVar158,auVar158,0xb1);
    auVar116 = vminps_avx(auVar158,auVar116);
    auVar117 = vshufpd_avx(auVar116,auVar116,5);
    auVar116 = vminps_avx(auVar116,auVar117);
    auVar117 = vpermpd_avx2(auVar116,0x4e);
    auVar116 = vminps_avx(auVar116,auVar117);
    uVar25 = vcmpps_avx512vl(auVar158,auVar116,0);
    bVar88 = (byte)uVar25 & bVar84;
    if (bVar88 != 0) {
      uVar96 = (uint)bVar88;
    }
    uVar163 = 0;
    for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
      uVar163 = uVar163 + 1;
    }
    iVar91 = aiStack_158[uVar90 * 0x18];
    bVar84 = ~('\x01' << ((byte)uVar163 & 0x1f)) & bVar84;
    abStack_1a0[lVar94] = bVar84;
    if (bVar84 == 0) {
      uVar97 = uVar97 - 1;
    }
    uVar192 = (undefined4)uVar95;
    auVar189._4_4_ = uVar192;
    auVar189._0_4_ = uVar192;
    auVar189._8_4_ = uVar192;
    auVar189._12_4_ = uVar192;
    auVar189._16_4_ = uVar192;
    auVar189._20_4_ = uVar192;
    auVar189._24_4_ = uVar192;
    auVar189._28_4_ = uVar192;
    auVar104 = vmovshdup_avx(auVar210);
    auVar104 = vsubps_avx(auVar104,auVar210);
    auVar214._0_4_ = auVar104._0_4_;
    auVar214._4_4_ = auVar214._0_4_;
    auVar214._8_4_ = auVar214._0_4_;
    auVar214._12_4_ = auVar214._0_4_;
    auVar214._16_4_ = auVar214._0_4_;
    auVar214._20_4_ = auVar214._0_4_;
    auVar214._24_4_ = auVar214._0_4_;
    auVar214._28_4_ = auVar214._0_4_;
    auVar104 = vfmadd132ps_fma(auVar214,auVar189,_DAT_01faff20);
    auVar116 = ZEXT1632(auVar104);
    local_400[0] = (RTCHitN)auVar116[0];
    local_400[1] = (RTCHitN)auVar116[1];
    local_400[2] = (RTCHitN)auVar116[2];
    local_400[3] = (RTCHitN)auVar116[3];
    local_400[4] = (RTCHitN)auVar116[4];
    local_400[5] = (RTCHitN)auVar116[5];
    local_400[6] = (RTCHitN)auVar116[6];
    local_400[7] = (RTCHitN)auVar116[7];
    local_400[8] = (RTCHitN)auVar116[8];
    local_400[9] = (RTCHitN)auVar116[9];
    local_400[10] = (RTCHitN)auVar116[10];
    local_400[0xb] = (RTCHitN)auVar116[0xb];
    local_400[0xc] = (RTCHitN)auVar116[0xc];
    local_400[0xd] = (RTCHitN)auVar116[0xd];
    local_400[0xe] = (RTCHitN)auVar116[0xe];
    local_400[0xf] = (RTCHitN)auVar116[0xf];
    local_400[0x10] = (RTCHitN)auVar116[0x10];
    local_400[0x11] = (RTCHitN)auVar116[0x11];
    local_400[0x12] = (RTCHitN)auVar116[0x12];
    local_400[0x13] = (RTCHitN)auVar116[0x13];
    local_400[0x14] = (RTCHitN)auVar116[0x14];
    local_400[0x15] = (RTCHitN)auVar116[0x15];
    local_400[0x16] = (RTCHitN)auVar116[0x16];
    local_400[0x17] = (RTCHitN)auVar116[0x17];
    local_400[0x18] = (RTCHitN)auVar116[0x18];
    local_400[0x19] = (RTCHitN)auVar116[0x19];
    local_400[0x1a] = (RTCHitN)auVar116[0x1a];
    local_400[0x1b] = (RTCHitN)auVar116[0x1b];
    local_400[0x1c] = (RTCHitN)auVar116[0x1c];
    local_400[0x1d] = (RTCHitN)auVar116[0x1d];
    local_400[0x1e] = (RTCHitN)auVar116[0x1e];
    local_400[0x1f] = (RTCHitN)auVar116[0x1f];
    auVar215 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar163 * 4));
    uVar90 = (ulong)uVar97;
    auVar116 = auVar190._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }